

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [12];
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  undefined4 uVar50;
  undefined1 auVar51 [32];
  int iVar52;
  size_t sVar53;
  size_t sVar54;
  int *piVar55;
  _func_int **pp_Var56;
  Layer *pLVar57;
  undefined1 auVar58 [32];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined8 uVar253;
  ulong uVar254;
  undefined8 uVar255;
  undefined8 uVar256;
  ulong uVar257;
  ulong uVar258;
  undefined8 uVar259;
  undefined8 uVar260;
  undefined8 uVar261;
  Allocator *pAVar262;
  undefined1 auVar263 [12];
  undefined1 auVar264 [12];
  undefined1 auVar265 [12];
  undefined1 auVar266 [12];
  undefined1 auVar267 [12];
  undefined1 auVar268 [12];
  undefined1 auVar269 [12];
  undefined1 auVar270 [12];
  int iVar271;
  int iVar272;
  int iVar273;
  int iVar274;
  uint _elempack;
  ulong uVar275;
  ulong uVar276;
  ulong uVar277;
  int iVar278;
  void *pvVar279;
  float *pfVar280;
  _func_int *p_Var281;
  float *pfVar282;
  int i_1;
  uint uVar283;
  int iVar284;
  int iVar285;
  long lVar286;
  void *pvVar287;
  long lVar288;
  int iVar289;
  long lVar290;
  long lVar291;
  int i_2;
  int iVar292;
  long lVar293;
  ulong uVar294;
  uint _elempack_00;
  long lVar295;
  ulong uVar296;
  undefined1 (*pauVar297) [16];
  undefined1 (*pauVar298) [16];
  undefined1 (*pauVar299) [32];
  float *pfVar300;
  void *pvVar301;
  void *pvVar302;
  long lVar303;
  float *pfVar304;
  int j_1;
  long lVar305;
  long lVar306;
  float *pfVar307;
  long lVar308;
  float *pfVar309;
  bool bVar310;
  float fVar311;
  undefined8 uVar312;
  float fVar322;
  float fVar323;
  undefined8 uVar324;
  float fVar321;
  float fVar325;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar320 [64];
  float fVar333;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar355;
  undefined1 auVar348 [32];
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar357;
  undefined1 in_ZMM1 [64];
  float fVar358;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar374;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  float fVar375;
  float fVar376;
  undefined1 auVar369 [32];
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar372;
  float fVar373;
  float fVar380;
  float fVar381;
  undefined1 in_ZMM2 [64];
  float fVar382;
  float fVar383;
  float fVar399;
  float fVar401;
  float fVar403;
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar402;
  undefined1 auVar393 [32];
  float fVar407;
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar408;
  undefined1 auVar396 [32];
  float fVar409;
  undefined1 auVar397 [32];
  float fVar398;
  float fVar400;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar410;
  undefined1 in_ZMM3 [64];
  float fVar411;
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  undefined1 in_ZMM4 [64];
  undefined1 auVar431 [16];
  float in_register_0000135c;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  undefined1 auVar432 [64];
  undefined1 auVar438 [16];
  float in_register_0000139c;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar456;
  float fVar457;
  float fVar459;
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  float fVar455;
  float fVar458;
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float fVar465;
  float fVar466;
  float fVar467;
  float fVar468;
  float fVar469;
  undefined1 in_ZMM7 [64];
  undefined1 auVar470 [16];
  float in_register_0000141c;
  float fVar471;
  float fVar472;
  float fVar473;
  float fVar474;
  float fVar475;
  float fVar476;
  float fVar477;
  float fVar478;
  float fVar479;
  float fVar480;
  float fVar481;
  float fVar482;
  float fVar483;
  float fVar484;
  float fVar485;
  float fVar486;
  undefined1 in_ZMM9 [64];
  float fVar487;
  float fVar488;
  float fVar489;
  float fVar490;
  undefined8 uVar491;
  float in_register_0000149c;
  float fVar493;
  undefined8 uVar492;
  float fVar494;
  float fVar495;
  float fVar496;
  float fVar497;
  float in_register_000014dc;
  float fVar498;
  float fVar499;
  float fVar500;
  float in_register_0000151c;
  float fVar501;
  float fVar502;
  float fVar503;
  float in_register_0000155c;
  float fVar504;
  float fVar505;
  float fVar506;
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  float in_register_0000159c;
  float fVar509;
  float fVar510;
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  float fVar515;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  int local_340;
  undefined4 local_338;
  undefined4 uStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  float local_320;
  size_t local_318;
  undefined8 local_308;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float fStack_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  long local_298;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  float fStack_270;
  float fStack_26c;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 local_258;
  float fStack_250;
  float fStack_24c;
  Option opt_p;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  vector<int,_std::allocator<int>_> _space_ofs;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  p_Var281 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var281) != 0)) {
    iVar273 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar273;
  }
  local_2f8 = (float)bottom_blob->c;
  fStack_2f4 = 0.0;
  uVar296 = bottom_blob->elemsize;
  iVar273 = bottom_blob->elempack;
  iVar284 = *(int *)(&this->field_0xd4 + (long)p_Var281);
  iVar292 = *(int *)(&this->field_0xdc + (long)p_Var281);
  iVar278 = *(int *)(&this->field_0xd8 + (long)p_Var281);
  iVar285 = *(int *)(&this->field_0xe0 + (long)p_Var281);
  local_318 = 0;
  fVar428 = 0.0;
  local_358 = 0.0;
  fStack_354 = 0.0;
  uStack_350 = 0;
  uStack_34c = 0;
  local_348 = 0;
  uStack_344 = 0;
  local_340 = 0;
  local_338 = 0;
  uStack_334 = 0;
  iStack_330 = 0;
  iStack_32c = 0;
  local_328 = 0;
  iStack_324 = 0;
  local_320 = 0.0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]),bottom_blob,(Mat *)&local_358,opt);
  iVar271 = iStack_32c;
  iVar289 = -100;
  local_278 = CONCAT44(local_278._4_4_,(float)local_278);
  local_308 = CONCAT44(local_308._4_4_,(float)local_308);
  local_258 = CONCAT44(local_258._4_4_,(float)local_258);
  if ((CONCAT44(fStack_354,local_358) == 0) ||
     (local_278 = CONCAT44(local_278._4_4_,(float)local_278),
     local_308 = CONCAT44(local_308._4_4_,(float)local_308),
     local_258 = CONCAT44(local_258._4_4_,(float)local_258), (long)(int)local_320 * local_318 == 0))
  goto LAB_003a6670;
  p_Var281 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar284 = (~((iVar284 + -1) * iVar292) + iStack_32c) /
            *(int *)(&this->field_0xe4 + (long)p_Var281);
  local_398 = (float)((~((iVar278 + -1) * iVar285) + local_328) /
                     *(int *)(&this->field_0xe8 + (long)p_Var281));
  uVar283 = *(uint *)(&this->field_0xd0 + (long)p_Var281);
  if (opt->use_packing_layout == true) {
    uVar294 = (ulong)((uVar283 & 3) == 0) * 3 + 1;
    if ((uVar283 & 7) == 0) {
      uVar294 = 8;
    }
  }
  else {
    uVar294 = 1;
  }
  _elempack_00 = (uint)uVar294;
  local_278 = (uVar296 / (ulong)(long)iVar273) * uVar294;
  local_2d8 = CONCAT44(local_2d8._4_4_,iVar284 + 1);
  local_2b8._0_4_ = (int)local_398 + 1;
  Mat::create(top_blob,iVar284 + 1,(int)local_398 + 1,(int)uVar283 / (int)_elempack_00,local_278,
              _elempack_00,opt->blob_allocator);
  sVar54 = local_318;
  iVar272 = iStack_324;
  iVar285 = local_328;
  iVar278 = iStack_32c;
  iVar292 = local_340;
  pvVar301 = top_blob->data;
  if ((pvVar301 == (void *)0x0) || (sVar53 = top_blob->cstep, (long)top_blob->c * sVar53 == 0))
  goto LAB_003a6670;
  iVar274 = iVar273 * (int)local_2f8;
  p_Var281 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar289 = *(int *)(&this->field_0xd0 + (long)p_Var281);
  iVar52 = *(int *)(&this->field_0x108 + (long)p_Var281);
  if ((iVar274 == iVar52) && (iVar274 == iVar289)) {
    iVar289 = iVar274;
    if (iVar273 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var281) != 3) ||
         (*(int *)(&this->field_0xd8 + (long)p_Var281) != 3)) goto LAB_003a459b;
      if ((*(int *)(&this->field_0xdc + (long)p_Var281) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var281) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var281) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var281) == 1)))) {
        local_2b8 = (undefined1  [8])(long)iStack_32c;
        iVar273 = top_blob->w;
        iVar284 = top_blob->h;
        pvVar279 = (this->weight_data_tm).data;
        local_2d8 = sVar53 * top_blob->elemsize;
        local_278 = *(ulong *)(&this->field_0x1b0 + (long)p_Var281);
        lVar290 = (long)iVar273;
        local_258 = (long)local_2b8 * 2;
        local_308 = (long)local_2b8 * 3;
        uVar296 = 0;
        local_2f8 = local_320;
        if ((int)local_320 < 1) {
          local_2f8 = 0.0;
        }
        fStack_2f4 = 0.0;
        lVar305 = (long)(iStack_32c + 2) * 4;
        for (; uVar296 != (uint)local_2f8; uVar296 = uVar296 + 1) {
          if (local_278 == 0) {
            fVar428 = 0.0;
          }
          else {
            fVar428 = *(float *)(local_278 + uVar296 * 4);
          }
          pvVar287 = (void *)(local_2d8 * uVar296 + (long)pvVar301);
          lVar308 = uVar296 * 0x24;
          lVar295 = CONCAT44(uStack_344,local_348) * local_318 * uVar296 +
                    CONCAT44(fStack_354,local_358);
          lVar306 = lVar295 + (long)local_2b8 * 4;
          lVar286 = lVar295 + (long)local_2b8 * 8;
          lVar303 = lVar295 + (long)local_2b8 * 0xc;
          pvVar302 = pvVar287;
          for (uVar283 = 0; (int)(uVar283 | 1) < iVar284; uVar283 = uVar283 + 2) {
            lVar291 = 0;
            for (iVar292 = iVar273; 0 < iVar292; iVar292 = iVar292 + -1) {
              auVar334._8_8_ = 0;
              auVar334._0_8_ = *(ulong *)(lVar295 + 4 + lVar291);
              auVar447 = vmovlhps_avx(ZEXT416(*(uint *)(lVar295 + lVar291)),auVar334);
              auVar447 = vshufps_avx(auVar447,auVar334,0xd8);
              auVar334 = vinsertps_avx(auVar447,ZEXT416((uint)*(float *)(lVar306 + lVar291)),0x30);
              auVar384._8_8_ = 0;
              auVar384._0_8_ = *(ulong *)(lVar306 + 4 + lVar291);
              auVar447 = vinsertps_avx(auVar384,ZEXT416(*(uint *)(lVar286 + lVar291)),0x20);
              auVar447 = vinsertps_avx(auVar447,ZEXT416(*(uint *)(lVar286 + 4 + lVar291)),0x30);
              pfVar300 = (float *)((long)pvVar279 + lVar308 + 0x10);
              fVar322 = *(float *)((long)pvVar279 + lVar308 + 0x20);
              auVar431._0_4_ = *pfVar300 * auVar447._0_4_;
              auVar431._4_4_ = pfVar300[1] * auVar447._4_4_;
              auVar431._8_4_ = pfVar300[2] * auVar447._8_4_;
              auVar431._12_4_ = pfVar300[3] * auVar447._12_4_;
              auVar508 = vhaddps_avx(auVar431,auVar431);
              auVar447 = *(undefined1 (*) [16])((long)pvVar279 + lVar308);
              auVar508 = vhaddps_avx(auVar508,auVar508);
              auVar359._0_4_ = auVar447._0_4_ * auVar334._0_4_;
              auVar359._4_4_ = auVar447._4_4_ * auVar334._4_4_;
              auVar359._8_4_ = auVar447._8_4_ * auVar334._8_4_;
              auVar359._12_4_ = auVar447._12_4_ * auVar334._12_4_;
              auVar334 = vhaddps_avx(auVar359,auVar359);
              auVar334 = vhaddps_avx(auVar334,auVar334);
              auVar359 = vmovlhps_avx(auVar447,auVar384);
              auVar359 = vshufps_avx(auVar359,auVar384,0xd8);
              auVar384 = vinsertps_avx(auVar359,ZEXT416(*(uint *)(lVar286 + lVar291)),0x30);
              auVar412._8_8_ = 0;
              auVar412._0_8_ = *(ulong *)(lVar286 + 4 + lVar291);
              auVar359 = vmovhps_avx(auVar412,*(undefined8 *)(lVar303 + lVar291));
              fVar323 = *(float *)(lVar303 + 8 + lVar291);
              auVar413._0_4_ = auVar359._0_4_ * *pfVar300;
              auVar413._4_4_ = auVar359._4_4_ * pfVar300[1];
              auVar413._8_4_ = auVar359._8_4_ * pfVar300[2];
              auVar413._12_4_ = auVar359._12_4_ * pfVar300[3];
              auVar359 = vhaddps_avx(auVar413,auVar413);
              auVar359 = vhaddps_avx(auVar359,auVar359);
              auVar335._0_4_ = auVar384._0_4_ * *(float *)(lVar306 + lVar291);
              auVar335._4_4_ = auVar384._4_4_ * auVar447._4_4_;
              auVar335._8_4_ = auVar384._8_4_ * auVar447._8_4_;
              auVar335._12_4_ = auVar384._12_4_ * auVar447._12_4_;
              auVar447 = vhaddps_avx(auVar335,auVar335);
              auVar447 = vhaddps_avx(auVar447,auVar447);
              *(float *)((long)pvVar287 + lVar291) =
                   auVar508._0_4_ +
                   fVar322 * *(float *)(lVar286 + 8 + lVar291) + auVar334._0_4_ + fVar428;
              *(float *)((long)pvVar302 + lVar291 + lVar290 * 4) =
                   auVar359._0_4_ + fVar322 * fVar323 + auVar447._0_4_ + fVar428;
              lVar291 = lVar291 + 4;
            }
            lVar295 = lVar295 + lVar305 + lVar291;
            lVar306 = lVar306 + lVar305 + lVar291;
            lVar286 = lVar286 + lVar305 + lVar291;
            lVar303 = lVar303 + lVar305 + lVar291;
            pvVar287 = (void *)((long)pvVar287 + lVar291 + lVar290 * 4);
            pvVar302 = (void *)((long)pvVar302 + lVar291 + lVar290 * 4);
          }
          for (; (int)uVar283 < iVar284; uVar283 = uVar283 + 1) {
            lVar303 = 0;
            for (iVar292 = iVar273; 0 < iVar292; iVar292 = iVar292 + -1) {
              auVar336._8_8_ = 0;
              auVar336._0_8_ = *(ulong *)(lVar295 + lVar303);
              auVar447 = vinsertps_avx(auVar336,ZEXT416(*(uint *)(lVar295 + 8 + lVar303)),0x20);
              auVar447 = vinsertps_avx(auVar447,ZEXT416(*(uint *)(lVar306 + lVar303)),0x30);
              auVar369._16_8_ = *(undefined8 *)(lVar306 + 4 + lVar303);
              auVar369._0_16_ = auVar447;
              auVar369._24_8_ = 0;
              auVar345._16_8_ = *(undefined8 *)(lVar286 + lVar303);
              auVar345._0_16_ = auVar447;
              auVar345._24_8_ = 0;
              auVar346 = vshufpd_avx(auVar369,auVar345,2);
              pfVar300 = (float *)((long)pvVar279 + lVar308);
              auVar337._0_4_ = auVar346._0_4_ * *pfVar300;
              auVar337._4_4_ = auVar346._4_4_ * pfVar300[1];
              auVar337._8_4_ = auVar346._8_4_ * pfVar300[2];
              auVar337._12_4_ = auVar346._12_4_ * pfVar300[3];
              auVar58._16_4_ = auVar346._16_4_ * pfVar300[4];
              auVar58._0_16_ = auVar337;
              auVar58._20_4_ = auVar346._20_4_ * pfVar300[5];
              auVar58._24_4_ = auVar346._24_4_ * pfVar300[6];
              auVar58._28_4_ = auVar346._28_4_;
              auVar447 = vhaddps_avx(auVar58._16_16_,auVar337);
              auVar447 = vhaddps_avx(auVar447,auVar447);
              auVar447 = vhaddps_avx(auVar447,auVar447);
              *(float *)((long)pvVar287 + lVar303) =
                   *(float *)((long)pvVar279 + lVar308 + 0x20) * *(float *)(lVar286 + 8 + lVar303) +
                   fVar428 + auVar447._0_4_;
              lVar303 = lVar303 + 4;
            }
            lVar295 = lVar295 + lVar303 + 8;
            lVar306 = lVar306 + lVar303 + 8;
            lVar286 = lVar286 + lVar303 + 8;
            pvVar287 = (void *)((long)pvVar287 + lVar303);
          }
        }
      }
      else {
        if ((((*(int *)(&this->field_0xdc + (long)p_Var281) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var281) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var281) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var281) != 2)) goto LAB_003a459b;
        lVar305 = (long)iStack_32c;
        iVar273 = top_blob->w;
        pvVar279 = (this->weight_data_tm).data;
        lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
        sVar54 = top_blob->elemsize;
        local_2f8 = local_358;
        fStack_2f4 = fStack_354;
        local_2d8 = CONCAT44(uStack_344,local_348) * local_318;
        local_2b8 = (undefined1  [8])(lVar305 * 2);
        uVar294 = 0;
        uVar296 = (ulong)(uint)top_blob->h;
        if (top_blob->h < 1) {
          uVar296 = uVar294;
        }
        uVar276 = (ulong)(uint)local_320;
        if ((int)local_320 < 1) {
          uVar276 = uVar294;
        }
        lVar306 = (long)((iStack_32c - iVar273) * 2) * 4;
        for (; uVar294 != uVar276; uVar294 = uVar294 + 1) {
          if (lVar290 == 0) {
            fVar428 = 0.0;
          }
          else {
            fVar428 = *(float *)(lVar290 + uVar294 * 4);
          }
          pfVar300 = (float *)(sVar53 * sVar54 * uVar294 + (long)pvVar301);
          lVar308 = local_2d8 * uVar294 + CONCAT44(fStack_354,local_358);
          lVar286 = lVar308 + lVar305 * 4;
          lVar303 = lVar308 + lVar305 * 8;
          for (iVar284 = 0; iVar284 != (int)uVar296; iVar284 = iVar284 + 1) {
            lVar295 = 0;
            for (iVar292 = iVar273; 0 < iVar292; iVar292 = iVar292 + -1) {
              auVar447._8_8_ = 0;
              auVar447._0_8_ = *(ulong *)(lVar308 + lVar295);
              auVar447 = vinsertps_avx(auVar447,ZEXT416(*(uint *)(lVar308 + 8 + lVar295)),0x20);
              auVar447 = vinsertps_avx(auVar447,ZEXT416(*(uint *)(lVar286 + lVar295)),0x30);
              auVar370._16_8_ = *(undefined8 *)(lVar286 + 4 + lVar295);
              auVar370._0_16_ = auVar447;
              auVar370._24_8_ = 0;
              auVar346._16_8_ = *(undefined8 *)(lVar303 + lVar295);
              auVar346._0_16_ = auVar447;
              auVar346._24_8_ = 0;
              auVar346 = vshufpd_avx(auVar370,auVar346,2);
              pfVar304 = (float *)((long)pvVar279 + uVar294 * 0x24);
              auVar508._0_4_ = auVar346._0_4_ * *pfVar304;
              auVar508._4_4_ = auVar346._4_4_ * pfVar304[1];
              auVar508._8_4_ = auVar346._8_4_ * pfVar304[2];
              auVar508._12_4_ = auVar346._12_4_ * pfVar304[3];
              auVar51._16_4_ = auVar346._16_4_ * pfVar304[4];
              auVar51._0_16_ = auVar508;
              auVar51._20_4_ = auVar346._20_4_ * pfVar304[5];
              auVar51._24_4_ = auVar346._24_4_ * pfVar304[6];
              auVar51._28_4_ = auVar346._28_4_;
              auVar447 = vhaddps_avx(auVar51._16_16_,auVar508);
              auVar447 = vhaddps_avx(auVar447,auVar447);
              auVar447 = vhaddps_avx(auVar447,auVar447);
              *pfVar300 = *(float *)((long)pvVar279 + uVar294 * 0x24 + 0x20) *
                          *(float *)(lVar303 + 8 + lVar295) + fVar428 + auVar447._0_4_;
              pfVar300 = pfVar300 + 1;
              lVar295 = lVar295 + 8;
            }
            lVar308 = lVar308 + lVar306 + lVar295;
            lVar286 = lVar286 + lVar306 + lVar295;
            lVar303 = lVar303 + lVar306 + lVar295;
          }
        }
      }
LAB_003a66c5:
      pLVar57 = this->activation;
      if (pLVar57 != (Layer *)0x0) {
        (*pLVar57->_vptr_Layer[9])(pLVar57,top_blob,opt);
      }
    }
    else {
      if (iVar273 == 4) {
        iVar273 = *(int *)(&this->field_0xd4 + (long)p_Var281);
        iVar292 = *(int *)(&this->field_0xd8 + (long)p_Var281);
        if (iVar273 == 5) {
          if (iVar292 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var281) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var281) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var281) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var281) == 1)))) {
              fVar428 = (float)top_blob->w;
              iVar273 = top_blob->h;
              local_2d8 = *(ulong *)(&this->field_0x1b0 + (long)p_Var281);
              uVar296 = 0;
              fVar322 = fVar428;
              if ((int)fVar428 < 1) {
                fVar322 = 0.0;
              }
              local_2f8 = local_320;
              if ((int)local_320 < 1) {
                local_2f8 = 0.0;
              }
              fStack_2f4 = 0.0;
              lVar290 = (long)((int)fVar428 * 4) * 4;
              lVar305 = (long)(iStack_32c * 4 + 0x10) * 4;
              for (; local_258 = CONCAT44(local_258._4_4_,(float)local_258),
                  local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar296 != (uint)local_2f8
                  ; uVar296 = uVar296 + 1) {
                if (local_2d8 == 0) {
                  fVar428 = 0.0;
                  fVar323 = 0.0;
                  fVar326 = 0.0;
                  fVar327 = 0.0;
                }
                else {
                  pfVar300 = (float *)(local_2d8 + uVar296 * 0x10);
                  fVar428 = *pfVar300;
                  fVar323 = pfVar300[1];
                  fVar326 = pfVar300[2];
                  fVar327 = pfVar300[3];
                }
                pvVar302 = (void *)(top_blob->cstep * uVar296 * top_blob->elemsize +
                                   (long)top_blob->data);
                pvVar301 = (this->weight_data_tm).data;
                lVar295 = (long)(this->weight_data_tm).w * uVar296 * (this->weight_data_tm).elemsize
                ;
                pvVar279 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar302);
                lVar288 = local_318 * uVar296 * CONCAT44(uStack_344,local_348) +
                          CONCAT44(fStack_354,local_358);
                lVar308 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
                lVar306 = lVar288 + lVar308;
                lVar286 = lVar288 + lVar308 * 2;
                lVar291 = lVar308 * 3 + lVar288;
                lVar303 = lVar288 + lVar308 * 4;
                lVar308 = lVar308 * 5 + lVar288;
                for (uVar283 = 0; (int)(uVar283 | 1) < iVar273; uVar283 = uVar283 + 2) {
                  lVar293 = 0;
                  fVar328 = fVar322;
                  while (bVar310 = fVar328 != 0.0, fVar328 = (float)((int)fVar328 - 1), bVar310) {
                    pfVar300 = (float *)((long)pvVar301 + lVar295);
                    pfVar282 = (float *)((long)pvVar301 + lVar295 + 0x10);
                    pfVar280 = (float *)((long)pvVar301 + lVar295 + 0x20);
                    pfVar2 = (float *)((long)pvVar301 + lVar295 + 0x30);
                    pfVar304 = (float *)(lVar288 + lVar293);
                    pfVar3 = (float *)((long)pvVar301 + lVar295 + 0x40);
                    pfVar4 = (float *)(lVar288 + 0x10 + lVar293);
                    pfVar5 = (float *)(lVar288 + 0x20 + lVar293);
                    pfVar13 = (float *)(lVar288 + 0x30 + lVar293);
                    pfVar14 = (float *)(lVar288 + 0x40 + lVar293);
                    pfVar307 = (float *)(lVar306 + lVar293);
                    pfVar15 = (float *)(lVar306 + 0x10 + lVar293);
                    pfVar16 = (float *)(lVar306 + 0x20 + lVar293);
                    pfVar17 = (float *)(lVar306 + 0x30 + lVar293);
                    pfVar18 = (float *)(lVar306 + 0x40 + lVar293);
                    pfVar19 = (float *)((long)pvVar301 + lVar295 + 0x50);
                    pfVar20 = (float *)((long)pvVar301 + lVar295 + 0x60);
                    pfVar47 = (float *)((long)pvVar301 + lVar295 + 0x70);
                    pfVar28 = (float *)((long)pvVar301 + lVar295 + 0x80);
                    pfVar29 = (float *)((long)pvVar301 + lVar295 + 0x90);
                    pfVar26 = (float *)(lVar286 + lVar293);
                    pfVar48 = (float *)(lVar286 + 0x10 + lVar293);
                    pfVar49 = (float *)(lVar286 + 0x20 + lVar293);
                    pfVar7 = (float *)(lVar286 + 0x30 + lVar293);
                    pfVar8 = (float *)(lVar286 + 0x40 + lVar293);
                    pfVar30 = (float *)((long)pvVar301 + lVar295 + 0xa0);
                    pfVar31 = (float *)((long)pvVar301 + lVar295 + 0xb0);
                    pfVar32 = (float *)((long)pvVar301 + lVar295 + 0xc0);
                    pfVar33 = (float *)((long)pvVar301 + lVar295 + 0xd0);
                    pfVar34 = (float *)((long)pvVar301 + lVar295 + 0xe0);
                    pfVar27 = (float *)(lVar291 + lVar293);
                    pfVar11 = (float *)(lVar291 + 0x10 + lVar293);
                    pfVar12 = (float *)(lVar291 + 0x20 + lVar293);
                    pfVar21 = (float *)(lVar291 + 0x30 + lVar293);
                    pfVar22 = (float *)(lVar291 + 0x40 + lVar293);
                    pfVar35 = (float *)((long)pvVar301 + lVar295 + 0xf0);
                    pfVar36 = (float *)((long)pvVar301 + lVar295 + 0x100);
                    pfVar37 = (float *)((long)pvVar301 + lVar295 + 0x110);
                    pfVar38 = (float *)((long)pvVar301 + lVar295 + 0x120);
                    pfVar39 = (float *)((long)pvVar301 + lVar295 + 0x130);
                    pfVar309 = (float *)(lVar303 + lVar293);
                    pfVar23 = (float *)(lVar303 + 0x10 + lVar293);
                    auVar447 = *(undefined1 (*) [16])(lVar303 + 0x20 + lVar293);
                    pfVar24 = (float *)(lVar303 + 0x30 + lVar293);
                    pfVar25 = (float *)(lVar303 + 0x40 + lVar293);
                    pfVar40 = (float *)((long)pvVar301 + lVar295 + 0x140);
                    pfVar41 = (float *)((long)pvVar301 + lVar295 + 0x150);
                    pfVar42 = (float *)((long)pvVar301 + lVar295 + 0x160);
                    pfVar43 = (float *)((long)pvVar301 + lVar295 + 0x170);
                    pfVar44 = (float *)((long)pvVar301 + lVar295 + 0x180);
                    auVar338._0_4_ =
                         *pfVar300 * *pfVar304 + fVar428 + *pfVar280 * *pfVar5 + *pfVar282 * *pfVar4
                         + *pfVar307 * *pfVar19 + *pfVar3 * *pfVar14 + *pfVar2 * *pfVar13 +
                         *pfVar29 * *pfVar18 +
                         *pfVar28 * *pfVar17 + *pfVar16 * *pfVar47 + *pfVar15 * *pfVar20 +
                         *pfVar30 * *pfVar26 + *pfVar48 * *pfVar31 + *pfVar49 * *pfVar32 +
                         *pfVar33 * *pfVar7 + *pfVar34 * *pfVar8 +
                         *pfVar35 * *pfVar27 + *pfVar36 * *pfVar11 + *pfVar12 * *pfVar37 +
                         *pfVar38 * *pfVar21 + *pfVar39 * *pfVar22 + *pfVar40 * *pfVar309 +
                         *pfVar23 * *pfVar41 + *pfVar42 * auVar447._0_4_ + *pfVar43 * *pfVar24 +
                         *pfVar44 * *pfVar25;
                    auVar338._4_4_ =
                         pfVar300[1] * pfVar304[1] + fVar323 +
                         pfVar280[1] * pfVar5[1] + pfVar282[1] * pfVar4[1] +
                         pfVar307[1] * pfVar19[1] + pfVar3[1] * pfVar14[1] + pfVar2[1] * pfVar13[1]
                         + pfVar29[1] * pfVar18[1] +
                           pfVar28[1] * pfVar17[1] +
                           pfVar16[1] * pfVar47[1] + pfVar15[1] * pfVar20[1] +
                         pfVar30[1] * pfVar26[1] + pfVar48[1] * pfVar31[1] + pfVar49[1] * pfVar32[1]
                         + pfVar33[1] * pfVar7[1] + pfVar34[1] * pfVar8[1] +
                         pfVar35[1] * pfVar27[1] + pfVar36[1] * pfVar11[1] + pfVar12[1] * pfVar37[1]
                         + pfVar38[1] * pfVar21[1] + pfVar39[1] * pfVar22[1] +
                         pfVar40[1] * pfVar309[1] +
                         pfVar23[1] * pfVar41[1] + pfVar42[1] * auVar447._4_4_ +
                         pfVar43[1] * pfVar24[1] + pfVar44[1] * pfVar25[1];
                    auVar338._8_4_ =
                         pfVar300[2] * pfVar304[2] + fVar326 +
                         pfVar280[2] * pfVar5[2] + pfVar282[2] * pfVar4[2] +
                         pfVar307[2] * pfVar19[2] + pfVar3[2] * pfVar14[2] + pfVar2[2] * pfVar13[2]
                         + pfVar29[2] * pfVar18[2] +
                           pfVar28[2] * pfVar17[2] +
                           pfVar16[2] * pfVar47[2] + pfVar15[2] * pfVar20[2] +
                         pfVar30[2] * pfVar26[2] + pfVar48[2] * pfVar31[2] + pfVar49[2] * pfVar32[2]
                         + pfVar33[2] * pfVar7[2] + pfVar34[2] * pfVar8[2] +
                         pfVar35[2] * pfVar27[2] + pfVar36[2] * pfVar11[2] + pfVar12[2] * pfVar37[2]
                         + pfVar38[2] * pfVar21[2] + pfVar39[2] * pfVar22[2] +
                         pfVar40[2] * pfVar309[2] +
                         pfVar23[2] * pfVar41[2] + pfVar42[2] * auVar447._8_4_ +
                         pfVar43[2] * pfVar24[2] + pfVar44[2] * pfVar25[2];
                    auVar338._12_4_ =
                         pfVar300[3] * pfVar304[3] + fVar327 +
                         pfVar280[3] * pfVar5[3] + pfVar282[3] * pfVar4[3] +
                         pfVar307[3] * pfVar19[3] + pfVar3[3] * pfVar14[3] + pfVar2[3] * pfVar13[3]
                         + pfVar29[3] * pfVar18[3] +
                           pfVar28[3] * pfVar17[3] +
                           pfVar16[3] * pfVar47[3] + pfVar15[3] * pfVar20[3] +
                         pfVar30[3] * pfVar26[3] + pfVar48[3] * pfVar31[3] + pfVar49[3] * pfVar32[3]
                         + pfVar33[3] * pfVar7[3] + pfVar34[3] * pfVar8[3] +
                         pfVar35[3] * pfVar27[3] + pfVar36[3] * pfVar11[3] + pfVar12[3] * pfVar37[3]
                         + pfVar38[3] * pfVar21[3] + pfVar39[3] * pfVar22[3] +
                         pfVar40[3] * pfVar309[3] +
                         pfVar23[3] * pfVar41[3] + pfVar42[3] * auVar447._12_4_ +
                         pfVar43[3] * pfVar24[3] + pfVar44[3] * pfVar25[3];
                    pfVar304 = (float *)(lVar308 + lVar293);
                    pfVar4 = (float *)(lVar308 + 0x10 + lVar293);
                    pfVar5 = (float *)(lVar308 + 0x20 + lVar293);
                    pfVar13 = (float *)(lVar308 + 0x30 + lVar293);
                    pfVar14 = (float *)(lVar308 + 0x40 + lVar293);
                    auVar360._0_4_ =
                         *pfVar307 * *pfVar300 + fVar428 +
                         *pfVar15 * *pfVar282 + *pfVar16 * *pfVar280 +
                         *pfVar17 * *pfVar2 + *pfVar18 * *pfVar3 + *pfVar26 * *pfVar19 +
                         *pfVar48 * *pfVar20 + *pfVar49 * *pfVar47 + *pfVar7 * *pfVar28 +
                         *pfVar8 * *pfVar29 +
                         *pfVar27 * *pfVar30 + *pfVar11 * *pfVar31 + *pfVar12 * *pfVar32 +
                         *pfVar21 * *pfVar33 + *pfVar22 * *pfVar34 +
                         *pfVar309 * *pfVar35 + *pfVar23 * *pfVar36 + auVar447._0_4_ * *pfVar37 +
                         *pfVar24 * *pfVar38 + *pfVar25 * *pfVar39 + *pfVar40 * *pfVar304 +
                         *pfVar41 * *pfVar4 + *pfVar42 * *pfVar5 + *pfVar43 * *pfVar13 +
                         *pfVar44 * *pfVar14;
                    auVar360._4_4_ =
                         pfVar307[1] * pfVar300[1] + fVar323 +
                         pfVar15[1] * pfVar282[1] + pfVar16[1] * pfVar280[1] +
                         pfVar17[1] * pfVar2[1] + pfVar18[1] * pfVar3[1] + pfVar26[1] * pfVar19[1] +
                         pfVar48[1] * pfVar20[1] + pfVar49[1] * pfVar47[1] + pfVar7[1] * pfVar28[1]
                         + pfVar8[1] * pfVar29[1] +
                         pfVar27[1] * pfVar30[1] + pfVar11[1] * pfVar31[1] + pfVar12[1] * pfVar32[1]
                         + pfVar21[1] * pfVar33[1] + pfVar22[1] * pfVar34[1] +
                         pfVar309[1] * pfVar35[1] + pfVar23[1] * pfVar36[1] +
                         auVar447._4_4_ * pfVar37[1] + pfVar24[1] * pfVar38[1] +
                         pfVar25[1] * pfVar39[1] + pfVar40[1] * pfVar304[1] +
                         pfVar41[1] * pfVar4[1] + pfVar42[1] * pfVar5[1] + pfVar43[1] * pfVar13[1] +
                         pfVar44[1] * pfVar14[1];
                    auVar360._8_4_ =
                         pfVar307[2] * pfVar300[2] + fVar326 +
                         pfVar15[2] * pfVar282[2] + pfVar16[2] * pfVar280[2] +
                         pfVar17[2] * pfVar2[2] + pfVar18[2] * pfVar3[2] + pfVar26[2] * pfVar19[2] +
                         pfVar48[2] * pfVar20[2] + pfVar49[2] * pfVar47[2] + pfVar7[2] * pfVar28[2]
                         + pfVar8[2] * pfVar29[2] +
                         pfVar27[2] * pfVar30[2] + pfVar11[2] * pfVar31[2] + pfVar12[2] * pfVar32[2]
                         + pfVar21[2] * pfVar33[2] + pfVar22[2] * pfVar34[2] +
                         pfVar309[2] * pfVar35[2] + pfVar23[2] * pfVar36[2] +
                         auVar447._8_4_ * pfVar37[2] + pfVar24[2] * pfVar38[2] +
                         pfVar25[2] * pfVar39[2] + pfVar40[2] * pfVar304[2] +
                         pfVar41[2] * pfVar4[2] + pfVar42[2] * pfVar5[2] + pfVar43[2] * pfVar13[2] +
                         pfVar44[2] * pfVar14[2];
                    auVar360._12_4_ =
                         pfVar307[3] * pfVar300[3] + fVar327 +
                         pfVar15[3] * pfVar282[3] + pfVar16[3] * pfVar280[3] +
                         pfVar17[3] * pfVar2[3] + pfVar18[3] * pfVar3[3] + pfVar26[3] * pfVar19[3] +
                         pfVar48[3] * pfVar20[3] + pfVar49[3] * pfVar47[3] + pfVar7[3] * pfVar28[3]
                         + pfVar8[3] * pfVar29[3] +
                         pfVar27[3] * pfVar30[3] + pfVar11[3] * pfVar31[3] + pfVar12[3] * pfVar32[3]
                         + pfVar21[3] * pfVar33[3] + pfVar22[3] * pfVar34[3] +
                         pfVar309[3] * pfVar35[3] + pfVar23[3] * pfVar36[3] +
                         auVar447._12_4_ * pfVar37[3] + pfVar24[3] * pfVar38[3] +
                         pfVar25[3] * pfVar39[3] + pfVar40[3] * pfVar304[3] +
                         pfVar41[3] * pfVar4[3] + pfVar42[3] * pfVar5[3] + pfVar43[3] * pfVar13[3] +
                         pfVar44[3] * pfVar14[3];
                    *(undefined1 (*) [16])((long)pvVar302 + lVar293) = auVar338;
                    *(undefined1 (*) [16])((long)pvVar279 + lVar293) = auVar360;
                    lVar293 = lVar293 + 0x10;
                  }
                  lVar288 = lVar288 + lVar305 + lVar293;
                  lVar306 = lVar306 + lVar305 + lVar293;
                  lVar286 = lVar286 + lVar305 + lVar293;
                  lVar291 = lVar291 + lVar305 + lVar293;
                  lVar303 = lVar303 + lVar305 + lVar293;
                  lVar308 = lVar308 + lVar305 + lVar293;
                  pvVar302 = (void *)((long)pvVar302 + lVar293 + lVar290);
                  pvVar279 = (void *)((long)pvVar279 + lVar293 + lVar290);
                }
                for (; (int)uVar283 < iVar273; uVar283 = uVar283 + 1) {
                  lVar308 = 0;
                  fVar328 = fVar322;
                  while (bVar310 = fVar328 != 0.0, fVar328 = (float)((int)fVar328 - 1), bVar310) {
                    pfVar300 = (float *)((long)pvVar301 + lVar295);
                    pfVar282 = (float *)((long)pvVar301 + lVar295 + 0x10);
                    pfVar280 = (float *)((long)pvVar301 + lVar295 + 0x20);
                    pfVar2 = (float *)((long)pvVar301 + lVar295 + 0x30);
                    pfVar304 = (float *)(lVar288 + lVar308);
                    pfVar3 = (float *)((long)pvVar301 + lVar295 + 0x40);
                    pfVar4 = (float *)(lVar288 + 0x10 + lVar308);
                    pfVar5 = (float *)(lVar288 + 0x20 + lVar308);
                    pfVar13 = (float *)(lVar288 + 0x30 + lVar308);
                    pfVar14 = (float *)(lVar288 + 0x40 + lVar308);
                    pfVar15 = (float *)((long)pvVar301 + lVar295 + 0x50);
                    pfVar16 = (float *)((long)pvVar301 + lVar295 + 0x60);
                    pfVar17 = (float *)((long)pvVar301 + lVar295 + 0x70);
                    pfVar29 = (float *)((long)pvVar301 + lVar295 + 0x80);
                    pfVar30 = (float *)((long)pvVar301 + lVar295 + 0x90);
                    pfVar307 = (float *)(lVar306 + lVar308);
                    pfVar18 = (float *)(lVar306 + 0x10 + lVar308);
                    pfVar19 = (float *)(lVar306 + 0x20 + lVar308);
                    pfVar20 = (float *)(lVar306 + 0x30 + lVar308);
                    pfVar47 = (float *)(lVar306 + 0x40 + lVar308);
                    pfVar31 = (float *)((long)pvVar301 + lVar295 + 0xa0);
                    pfVar32 = (float *)((long)pvVar301 + lVar295 + 0xb0);
                    pfVar33 = (float *)((long)pvVar301 + lVar295 + 0xc0);
                    pfVar34 = (float *)((long)pvVar301 + lVar295 + 0xd0);
                    pfVar27 = (float *)(lVar286 + lVar308);
                    pfVar35 = (float *)((long)pvVar301 + lVar295 + 0xe0);
                    pfVar48 = (float *)(lVar286 + 0x10 + lVar308);
                    pfVar49 = (float *)(lVar286 + 0x20 + lVar308);
                    pfVar7 = (float *)(lVar286 + 0x30 + lVar308);
                    pfVar8 = (float *)(lVar286 + 0x40 + lVar308);
                    pfVar36 = (float *)((long)pvVar301 + lVar295 + 0xf0);
                    pfVar37 = (float *)((long)pvVar301 + lVar295 + 0x100);
                    pfVar38 = (float *)((long)pvVar301 + lVar295 + 0x110);
                    pfVar39 = (float *)((long)pvVar301 + lVar295 + 0x120);
                    pfVar28 = (float *)(lVar291 + lVar308);
                    pfVar40 = (float *)((long)pvVar301 + lVar295 + 0x130);
                    pfVar11 = (float *)(lVar291 + 0x10 + lVar308);
                    pfVar12 = (float *)(lVar291 + 0x20 + lVar308);
                    pfVar21 = (float *)(lVar291 + 0x30 + lVar308);
                    pfVar22 = (float *)(lVar291 + 0x40 + lVar308);
                    pfVar41 = (float *)((long)pvVar301 + lVar295 + 0x140);
                    pfVar42 = (float *)((long)pvVar301 + lVar295 + 0x150);
                    pfVar43 = (float *)((long)pvVar301 + lVar295 + 0x160);
                    pfVar44 = (float *)((long)pvVar301 + lVar295 + 0x170);
                    auVar447 = *(undefined1 (*) [16])((long)pvVar301 + lVar295 + 0x180);
                    pfVar309 = (float *)(lVar303 + lVar308);
                    pfVar23 = (float *)(lVar303 + 0x10 + lVar308);
                    pfVar24 = (float *)(lVar303 + 0x20 + lVar308);
                    pfVar25 = (float *)(lVar303 + 0x30 + lVar308);
                    pfVar26 = (float *)(lVar303 + 0x40 + lVar308);
                    auVar339._0_4_ =
                         *pfVar300 * *pfVar304 + fVar428 + *pfVar282 * *pfVar4 + *pfVar280 * *pfVar5
                         + *pfVar2 * *pfVar13 + *pfVar3 * *pfVar14 + *pfVar15 * *pfVar307 +
                         *pfVar16 * *pfVar18 + *pfVar17 * *pfVar19 + *pfVar29 * *pfVar20 +
                         *pfVar30 * *pfVar47 +
                         *pfVar31 * *pfVar27 + *pfVar32 * *pfVar48 + *pfVar33 * *pfVar49 +
                         *pfVar34 * *pfVar7 + *pfVar35 * *pfVar8 +
                         *pfVar36 * *pfVar28 + *pfVar37 * *pfVar11 + *pfVar38 * *pfVar12 +
                         *pfVar39 * *pfVar21 + *pfVar40 * *pfVar22 + *pfVar41 * *pfVar309 +
                         *pfVar42 * *pfVar23 + *pfVar43 * *pfVar24 + *pfVar44 * *pfVar25 +
                         auVar447._0_4_ * *pfVar26;
                    auVar339._4_4_ =
                         pfVar300[1] * pfVar304[1] + fVar323 +
                         pfVar282[1] * pfVar4[1] + pfVar280[1] * pfVar5[1] +
                         pfVar2[1] * pfVar13[1] + pfVar3[1] * pfVar14[1] + pfVar15[1] * pfVar307[1]
                         + pfVar16[1] * pfVar18[1] + pfVar17[1] * pfVar19[1] +
                           pfVar29[1] * pfVar20[1] + pfVar30[1] * pfVar47[1] +
                         pfVar31[1] * pfVar27[1] + pfVar32[1] * pfVar48[1] + pfVar33[1] * pfVar49[1]
                         + pfVar34[1] * pfVar7[1] + pfVar35[1] * pfVar8[1] +
                         pfVar36[1] * pfVar28[1] + pfVar37[1] * pfVar11[1] + pfVar38[1] * pfVar12[1]
                         + pfVar39[1] * pfVar21[1] + pfVar40[1] * pfVar22[1] +
                         pfVar41[1] * pfVar309[1] +
                         pfVar42[1] * pfVar23[1] + pfVar43[1] * pfVar24[1] + pfVar44[1] * pfVar25[1]
                         + auVar447._4_4_ * pfVar26[1];
                    auVar339._8_4_ =
                         pfVar300[2] * pfVar304[2] + fVar326 +
                         pfVar282[2] * pfVar4[2] + pfVar280[2] * pfVar5[2] +
                         pfVar2[2] * pfVar13[2] + pfVar3[2] * pfVar14[2] + pfVar15[2] * pfVar307[2]
                         + pfVar16[2] * pfVar18[2] + pfVar17[2] * pfVar19[2] +
                           pfVar29[2] * pfVar20[2] + pfVar30[2] * pfVar47[2] +
                         pfVar31[2] * pfVar27[2] + pfVar32[2] * pfVar48[2] + pfVar33[2] * pfVar49[2]
                         + pfVar34[2] * pfVar7[2] + pfVar35[2] * pfVar8[2] +
                         pfVar36[2] * pfVar28[2] + pfVar37[2] * pfVar11[2] + pfVar38[2] * pfVar12[2]
                         + pfVar39[2] * pfVar21[2] + pfVar40[2] * pfVar22[2] +
                         pfVar41[2] * pfVar309[2] +
                         pfVar42[2] * pfVar23[2] + pfVar43[2] * pfVar24[2] + pfVar44[2] * pfVar25[2]
                         + auVar447._8_4_ * pfVar26[2];
                    auVar339._12_4_ =
                         pfVar300[3] * pfVar304[3] + fVar327 +
                         pfVar282[3] * pfVar4[3] + pfVar280[3] * pfVar5[3] +
                         pfVar2[3] * pfVar13[3] + pfVar3[3] * pfVar14[3] + pfVar15[3] * pfVar307[3]
                         + pfVar16[3] * pfVar18[3] + pfVar17[3] * pfVar19[3] +
                           pfVar29[3] * pfVar20[3] + pfVar30[3] * pfVar47[3] +
                         pfVar31[3] * pfVar27[3] + pfVar32[3] * pfVar48[3] + pfVar33[3] * pfVar49[3]
                         + pfVar34[3] * pfVar7[3] + pfVar35[3] * pfVar8[3] +
                         pfVar36[3] * pfVar28[3] + pfVar37[3] * pfVar11[3] + pfVar38[3] * pfVar12[3]
                         + pfVar39[3] * pfVar21[3] + pfVar40[3] * pfVar22[3] +
                         pfVar41[3] * pfVar309[3] +
                         pfVar42[3] * pfVar23[3] + pfVar43[3] * pfVar24[3] + pfVar44[3] * pfVar25[3]
                         + auVar447._12_4_ * pfVar26[3];
                    *(undefined1 (*) [16])((long)pvVar302 + lVar308) = auVar339;
                    lVar308 = lVar308 + 0x10;
                  }
                  lVar288 = lVar288 + lVar308 + 0x40;
                  lVar306 = lVar306 + 0x40 + lVar308;
                  lVar286 = lVar286 + lVar308 + 0x40;
                  lVar291 = lVar291 + lVar308 + 0x40;
                  lVar303 = lVar303 + lVar308 + 0x40;
                  pvVar302 = (void *)((long)pvVar302 + lVar308);
                }
              }
            }
            else {
              iVar292 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var281) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var281) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var281) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var281) != 2)) goto LAB_003a53bc;
              iVar273 = top_blob->w;
              iVar284 = iStack_32c - iVar273;
              lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
              uVar296 = 0;
              if (iVar273 < 1) {
                iVar273 = 0;
              }
              uVar294 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar294 = uVar296;
              }
              uVar276 = (ulong)(uint)local_320;
              if ((int)local_320 < 1) {
                uVar276 = uVar296;
              }
              lVar305 = (long)(iVar284 * 8) * 4;
              for (; local_258 = CONCAT44(local_258._4_4_,(float)local_258),
                  local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar296 != uVar276;
                  uVar296 = uVar296 + 1) {
                if (lVar290 == 0) {
                  fVar428 = 0.0;
                  fVar322 = 0.0;
                  fVar323 = 0.0;
                  fVar326 = 0.0;
                }
                else {
                  pfVar300 = (float *)(lVar290 + uVar296 * 0x10);
                  fVar428 = *pfVar300;
                  fVar322 = pfVar300[1];
                  fVar323 = pfVar300[2];
                  fVar326 = pfVar300[3];
                }
                pauVar298 = (undefined1 (*) [16])
                            (top_blob->cstep * uVar296 * top_blob->elemsize + (long)top_blob->data);
                pvVar301 = (this->weight_data_tm).data;
                lVar295 = (long)(this->weight_data_tm).w * uVar296 * (this->weight_data_tm).elemsize
                ;
                lVar308 = local_318 * uVar296 * CONCAT44(uStack_344,local_348) +
                          CONCAT44(fStack_354,local_358);
                lVar303 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
                lVar306 = lVar308 + lVar303;
                lVar286 = lVar308 + lVar303 * 2;
                lVar291 = lVar303 * 3 + lVar308;
                lVar303 = lVar308 + lVar303 * 4;
                for (iVar284 = 0; iVar284 != (int)uVar294; iVar284 = iVar284 + 1) {
                  lVar288 = 0;
                  iVar292 = iVar273;
                  while (bVar310 = iVar292 != 0, iVar292 = iVar292 + -1, bVar310) {
                    pfVar300 = (float *)((long)pvVar301 + lVar295);
                    pfVar282 = (float *)((long)pvVar301 + lVar295 + 0x10);
                    pfVar280 = (float *)((long)pvVar301 + lVar295 + 0x20);
                    pfVar2 = (float *)((long)pvVar301 + lVar295 + 0x30);
                    pfVar3 = (float *)((long)pvVar301 + lVar295 + 0x40);
                    pfVar304 = (float *)(lVar308 + lVar288);
                    pfVar4 = (float *)(lVar308 + 0x10 + lVar288);
                    pfVar5 = (float *)(lVar308 + 0x20 + lVar288);
                    pfVar13 = (float *)(lVar308 + 0x30 + lVar288);
                    pfVar14 = (float *)(lVar308 + 0x40 + lVar288);
                    pfVar15 = (float *)((long)pvVar301 + lVar295 + 0x50);
                    pfVar16 = (float *)((long)pvVar301 + lVar295 + 0x60);
                    pfVar17 = (float *)((long)pvVar301 + lVar295 + 0x70);
                    pfVar29 = (float *)((long)pvVar301 + lVar295 + 0x80);
                    pfVar30 = (float *)((long)pvVar301 + lVar295 + 0x90);
                    pfVar307 = (float *)(lVar306 + lVar288);
                    pfVar18 = (float *)(lVar306 + 0x10 + lVar288);
                    pfVar19 = (float *)(lVar306 + 0x20 + lVar288);
                    pfVar20 = (float *)(lVar306 + 0x30 + lVar288);
                    pfVar47 = (float *)(lVar306 + 0x40 + lVar288);
                    pfVar31 = (float *)((long)pvVar301 + lVar295 + 0xa0);
                    pfVar32 = (float *)((long)pvVar301 + lVar295 + 0xb0);
                    pfVar33 = (float *)((long)pvVar301 + lVar295 + 0xc0);
                    pfVar34 = (float *)((long)pvVar301 + lVar295 + 0xd0);
                    pfVar35 = (float *)((long)pvVar301 + lVar295 + 0xe0);
                    pfVar309 = (float *)(lVar286 + lVar288);
                    pfVar48 = (float *)(lVar286 + 0x10 + lVar288);
                    pfVar49 = (float *)(lVar286 + 0x20 + lVar288);
                    pfVar7 = (float *)(lVar286 + 0x30 + lVar288);
                    pfVar8 = (float *)(lVar286 + 0x40 + lVar288);
                    pfVar36 = (float *)((long)pvVar301 + lVar295 + 0xf0);
                    pfVar37 = (float *)((long)pvVar301 + lVar295 + 0x100);
                    pfVar38 = (float *)((long)pvVar301 + lVar295 + 0x110);
                    pfVar39 = (float *)((long)pvVar301 + lVar295 + 0x120);
                    pfVar40 = (float *)((long)pvVar301 + lVar295 + 0x130);
                    pfVar27 = (float *)(lVar291 + lVar288);
                    pfVar11 = (float *)(lVar291 + 0x10 + lVar288);
                    pfVar12 = (float *)(lVar291 + 0x20 + lVar288);
                    pfVar21 = (float *)(lVar291 + 0x30 + lVar288);
                    pfVar22 = (float *)(lVar291 + 0x40 + lVar288);
                    pfVar41 = (float *)((long)pvVar301 + lVar295 + 0x140);
                    pfVar42 = (float *)((long)pvVar301 + lVar295 + 0x150);
                    pfVar43 = (float *)((long)pvVar301 + lVar295 + 0x160);
                    pfVar44 = (float *)((long)pvVar301 + lVar295 + 0x170);
                    auVar447 = *(undefined1 (*) [16])((long)pvVar301 + lVar295 + 0x180);
                    pfVar28 = (float *)(lVar303 + lVar288);
                    pfVar23 = (float *)(lVar303 + 0x10 + lVar288);
                    pfVar24 = (float *)(lVar303 + 0x20 + lVar288);
                    pfVar25 = (float *)(lVar303 + 0x30 + lVar288);
                    pfVar26 = (float *)(lVar303 + 0x40 + lVar288);
                    auVar340._0_4_ =
                         *pfVar300 * *pfVar304 + fVar428 + *pfVar282 * *pfVar4 + *pfVar280 * *pfVar5
                         + *pfVar2 * *pfVar13 + *pfVar3 * *pfVar14 + *pfVar15 * *pfVar307 +
                         *pfVar16 * *pfVar18 + *pfVar17 * *pfVar19 + *pfVar29 * *pfVar20 +
                         *pfVar30 * *pfVar47 +
                         *pfVar31 * *pfVar309 + *pfVar32 * *pfVar48 + *pfVar33 * *pfVar49 +
                         *pfVar34 * *pfVar7 + *pfVar35 * *pfVar8 +
                         *pfVar36 * *pfVar27 + *pfVar37 * *pfVar11 + *pfVar38 * *pfVar12 +
                         *pfVar39 * *pfVar21 + *pfVar40 * *pfVar22 + *pfVar41 * *pfVar28 +
                         *pfVar42 * *pfVar23 + *pfVar43 * *pfVar24 + *pfVar44 * *pfVar25 +
                         auVar447._0_4_ * *pfVar26;
                    auVar340._4_4_ =
                         pfVar300[1] * pfVar304[1] + fVar322 +
                         pfVar282[1] * pfVar4[1] + pfVar280[1] * pfVar5[1] +
                         pfVar2[1] * pfVar13[1] + pfVar3[1] * pfVar14[1] + pfVar15[1] * pfVar307[1]
                         + pfVar16[1] * pfVar18[1] + pfVar17[1] * pfVar19[1] +
                           pfVar29[1] * pfVar20[1] + pfVar30[1] * pfVar47[1] +
                         pfVar31[1] * pfVar309[1] + pfVar32[1] * pfVar48[1] +
                         pfVar33[1] * pfVar49[1] + pfVar34[1] * pfVar7[1] + pfVar35[1] * pfVar8[1] +
                         pfVar36[1] * pfVar27[1] + pfVar37[1] * pfVar11[1] + pfVar38[1] * pfVar12[1]
                         + pfVar39[1] * pfVar21[1] + pfVar40[1] * pfVar22[1] +
                         pfVar41[1] * pfVar28[1] +
                         pfVar42[1] * pfVar23[1] + pfVar43[1] * pfVar24[1] + pfVar44[1] * pfVar25[1]
                         + auVar447._4_4_ * pfVar26[1];
                    auVar340._8_4_ =
                         pfVar300[2] * pfVar304[2] + fVar323 +
                         pfVar282[2] * pfVar4[2] + pfVar280[2] * pfVar5[2] +
                         pfVar2[2] * pfVar13[2] + pfVar3[2] * pfVar14[2] + pfVar15[2] * pfVar307[2]
                         + pfVar16[2] * pfVar18[2] + pfVar17[2] * pfVar19[2] +
                           pfVar29[2] * pfVar20[2] + pfVar30[2] * pfVar47[2] +
                         pfVar31[2] * pfVar309[2] + pfVar32[2] * pfVar48[2] +
                         pfVar33[2] * pfVar49[2] + pfVar34[2] * pfVar7[2] + pfVar35[2] * pfVar8[2] +
                         pfVar36[2] * pfVar27[2] + pfVar37[2] * pfVar11[2] + pfVar38[2] * pfVar12[2]
                         + pfVar39[2] * pfVar21[2] + pfVar40[2] * pfVar22[2] +
                         pfVar41[2] * pfVar28[2] +
                         pfVar42[2] * pfVar23[2] + pfVar43[2] * pfVar24[2] + pfVar44[2] * pfVar25[2]
                         + auVar447._8_4_ * pfVar26[2];
                    auVar340._12_4_ =
                         pfVar300[3] * pfVar304[3] + fVar326 +
                         pfVar282[3] * pfVar4[3] + pfVar280[3] * pfVar5[3] +
                         pfVar2[3] * pfVar13[3] + pfVar3[3] * pfVar14[3] + pfVar15[3] * pfVar307[3]
                         + pfVar16[3] * pfVar18[3] + pfVar17[3] * pfVar19[3] +
                           pfVar29[3] * pfVar20[3] + pfVar30[3] * pfVar47[3] +
                         pfVar31[3] * pfVar309[3] + pfVar32[3] * pfVar48[3] +
                         pfVar33[3] * pfVar49[3] + pfVar34[3] * pfVar7[3] + pfVar35[3] * pfVar8[3] +
                         pfVar36[3] * pfVar27[3] + pfVar37[3] * pfVar11[3] + pfVar38[3] * pfVar12[3]
                         + pfVar39[3] * pfVar21[3] + pfVar40[3] * pfVar22[3] +
                         pfVar41[3] * pfVar28[3] +
                         pfVar42[3] * pfVar23[3] + pfVar43[3] * pfVar24[3] + pfVar44[3] * pfVar25[3]
                         + auVar447._12_4_ * pfVar26[3];
                    *pauVar298 = auVar340;
                    pauVar298 = pauVar298 + 1;
                    lVar288 = lVar288 + 0x20;
                  }
                  lVar308 = lVar308 + lVar305 + lVar288;
                  lVar306 = lVar306 + lVar305 + lVar288;
                  lVar286 = lVar286 + lVar305 + lVar288;
                  lVar291 = lVar291 + lVar305 + lVar288;
                  lVar303 = lVar303 + lVar305 + lVar288;
                }
              }
            }
            goto LAB_003a66c5;
          }
        }
        else if ((iVar273 == 3) && (iVar292 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var281) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var281) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var281) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var281) == 1)) {
            iVar273 = top_blob->w;
            lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
            uVar294 = 0;
            uVar296 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar296 = uVar294;
            }
            uVar276 = (ulong)(uint)local_320;
            if ((int)local_320 < 1) {
              uVar276 = uVar294;
            }
            while( true ) {
              local_258 = CONCAT44(local_258._4_4_,(float)local_258);
              local_308 = CONCAT44(local_308._4_4_,(float)local_308);
              if (uVar294 == uVar276) break;
              if (lVar290 == 0) {
                uVar312 = 0;
                uVar324 = 0;
              }
              else {
                puVar1 = (undefined8 *)(lVar290 + uVar294 * 0x10);
                uVar312 = *puVar1;
                uVar324 = puVar1[1];
              }
              pauVar297 = (undefined1 (*) [16])
                          (top_blob->cstep * uVar294 * top_blob->elemsize + (long)top_blob->data);
              pvVar301 = (this->weight_data_tm).data;
              lVar305 = (long)(this->weight_data_tm).w * uVar294 * (this->weight_data_tm).elemsize;
              pfVar307 = (float *)(local_318 * uVar294 * CONCAT44(uStack_344,local_348) +
                                  CONCAT44(fStack_354,local_358));
              lVar306 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
              uVar491 = *(undefined8 *)((long)pvVar301 + lVar305);
              uVar492 = ((undefined8 *)((long)pvVar301 + lVar305))[1];
              local_398 = (float)uVar491;
              fStack_394 = (float)((ulong)uVar491 >> 0x20);
              fStack_390 = (float)uVar492;
              fStack_38c = (float)((ulong)uVar492 >> 0x20);
              puVar1 = (undefined8 *)((long)pvVar301 + lVar305 + 0x10);
              uVar491 = *puVar1;
              uVar492 = puVar1[1];
              puVar10 = (ulong *)((long)pvVar301 + lVar305 + 0x20);
              uVar277 = *puVar10;
              uVar275 = puVar10[1];
              pauVar6 = (undefined1 (*) [12])((long)pvVar301 + lVar305 + 0x30);
              auVar266 = *pauVar6;
              auVar265 = *pauVar6;
              local_2f8 = (float)*(undefined8 *)*pauVar6;
              fStack_2f4 = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
              fStack_2f0 = (float)*(undefined8 *)(*pauVar6 + 8);
              fStack_2ec = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
              pauVar298 = (undefined1 (*) [16])((long)pvVar301 + lVar305 + 0x40);
              uVar253 = *(undefined8 *)*pauVar298;
              auVar508 = *pauVar298;
              pauVar6 = (undefined1 (*) [12])((long)pvVar301 + lVar305 + 0x50);
              uVar254 = *(ulong *)*pauVar6;
              auVar267 = *pauVar6;
              auVar264 = *pauVar6;
              local_278._0_4_ = (float)uVar254;
              local_278._4_4_ = (float)(uVar254 >> 0x20);
              fStack_270 = (float)*(undefined8 *)(*pauVar6 + 8);
              fStack_26c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
              pauVar6 = (undefined1 (*) [12])((long)pvVar301 + lVar305 + 0x60);
              auVar268 = *pauVar6;
              local_258._0_4_ = (float)*(undefined8 *)*pauVar6;
              local_258._4_4_ = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
              fStack_250 = (float)*(undefined8 *)(*pauVar6 + 8);
              fStack_24c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
              pauVar6 = (undefined1 (*) [12])((long)pvVar301 + lVar305 + 0x70);
              auVar269 = *pauVar6;
              local_178 = (float)*(undefined8 *)*pauVar6;
              fStack_174 = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
              fStack_170 = (float)*(undefined8 *)(*pauVar6 + 8);
              fStack_16c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
              auVar447 = *(undefined1 (*) [16])((long)pvVar301 + lVar305 + 0x80);
              pfVar300 = (float *)(lVar306 + (long)pfVar307);
              pfVar304 = (float *)(lVar306 * 2 + (long)pfVar307);
              for (iVar284 = 0; iVar284 != (int)uVar296; iVar284 = iVar284 + 1) {
                pfVar309 = pfVar307 + 8;
                pfVar282 = pfVar300 + 8;
                pfVar280 = pfVar304 + 8;
                lVar305 = 0;
                iVar292 = 0;
                while( true ) {
                  local_378 = (float)uVar491;
                  fStack_370 = (float)uVar492;
                  local_2d8._0_4_ = (float)uVar277;
                  uStack_2d0._0_4_ = (float)uVar275;
                  local_2b8._0_4_ = auVar508._0_4_;
                  uVar50 = local_2b8._0_4_;
                  local_2b8._4_4_ = auVar508._4_4_;
                  fStack_2b0 = auVar508._8_4_;
                  fStack_2ac = auVar508._12_4_;
                  local_1f8 = auVar447._0_4_;
                  fStack_1f0 = auVar447._8_4_;
                  fStack_1ec = auVar447._12_4_;
                  fStack_374 = (float)((ulong)uVar491 >> 0x20);
                  fStack_36c = (float)((ulong)uVar492 >> 0x20);
                  local_2d8._4_4_ = (float)(uVar277 >> 0x20);
                  uStack_2d0._4_4_ = (float)(uVar275 >> 0x20);
                  fStack_1f4 = auVar447._4_4_;
                  local_3c8 = (float)uVar312;
                  fStack_3c4 = (float)((ulong)uVar312 >> 0x20);
                  fStack_3c0 = (float)uVar324;
                  fStack_3bc = (float)((ulong)uVar324 >> 0x20);
                  if (iVar273 <= iVar292 + 7) break;
                  pfVar4 = (float *)((long)pfVar307 + lVar305);
                  fVar428 = pfVar4[1];
                  fVar322 = pfVar4[2];
                  fVar323 = pfVar4[3];
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x10);
                  fVar326 = *pfVar2;
                  fVar327 = pfVar2[1];
                  fVar328 = pfVar2[2];
                  fVar329 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x20);
                  fVar332 = *pfVar2;
                  fVar358 = pfVar2[1];
                  fVar372 = pfVar2[2];
                  fVar373 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x30);
                  fVar374 = *pfVar2;
                  fVar59 = pfVar2[1];
                  fVar60 = pfVar2[2];
                  fVar61 = pfVar2[3];
                  pfVar5 = (float *)((long)pfVar300 + lVar305);
                  fVar62 = pfVar5[1];
                  fVar311 = pfVar5[2];
                  fVar321 = pfVar5[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x10);
                  fVar63 = *pfVar2;
                  fVar64 = pfVar2[1];
                  fVar65 = pfVar2[2];
                  fVar66 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x20);
                  fVar67 = *pfVar2;
                  fVar506 = pfVar2[1];
                  fVar510 = pfVar2[2];
                  fVar515 = pfVar2[3];
                  puVar1 = (undefined8 *)((long)pfVar300 + lVar305 + 0x30);
                  uVar255 = *puVar1;
                  uVar256 = puVar1[1];
                  local_2b8._0_4_ = (undefined4)uVar253;
                  pfVar2 = (float *)((long)pfVar304 + lVar305);
                  fVar68 = pfVar2[1];
                  fVar69 = pfVar2[2];
                  fVar70 = pfVar2[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x10);
                  fVar71 = *pfVar3;
                  fVar72 = pfVar3[1];
                  fVar73 = pfVar3[2];
                  fVar74 = pfVar3[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x20);
                  fVar494 = *pfVar3;
                  fVar495 = pfVar3[1];
                  fVar496 = pfVar3[2];
                  fVar497 = pfVar3[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x30);
                  fVar325 = *pfVar3;
                  fVar487 = pfVar3[1];
                  fVar488 = pfVar3[2];
                  fVar489 = pfVar3[3];
                  pfVar3 = (float *)((long)*pauVar297 + lVar305);
                  *pfVar3 = local_398 * *pfVar4 + local_3c8 +
                            fVar326 * local_378 + fVar332 * (float)local_2d8 +
                            fVar67 * (float)local_278 +
                            fVar63 * (float)local_2b8._0_4_ + local_2f8 * *pfVar5 +
                            local_1f8 * fVar494 + (float)local_258 * *pfVar2 + fVar71 * local_178;
                  pfVar3[1] = fStack_394 * fVar428 + fStack_3c4 +
                              fVar327 * fStack_374 + fVar358 * local_2d8._4_4_ +
                              fVar506 * local_278._4_4_ +
                              fVar64 * (float)local_2b8._4_4_ + fStack_2f4 * fVar62 +
                              fStack_1f4 * fVar495 + local_258._4_4_ * fVar68 + fVar72 * fStack_174;
                  pfVar3[2] = fStack_390 * fVar322 + fStack_3c0 +
                              fVar328 * fStack_370 + fVar372 * (float)uStack_2d0 +
                              fVar510 * fStack_270 + fVar65 * fStack_2b0 + fStack_2f0 * fVar311 +
                              fStack_1f0 * fVar496 + fStack_250 * fVar69 + fVar73 * fStack_170;
                  pfVar3[3] = fStack_38c * fVar323 + fStack_3bc +
                              fVar329 * fStack_36c + fVar373 * uStack_2d0._4_4_ +
                              fVar515 * fStack_26c + fVar66 * fStack_2ac + fStack_2ec * fVar321 +
                              fStack_1ec * fVar497 + fStack_24c * fVar70 + fVar74 * fStack_16c;
                  local_288._0_4_ = (float)uVar255;
                  local_288._4_4_ = (float)((ulong)uVar255 >> 0x20);
                  uStack_280._0_4_ = (float)uVar256;
                  uStack_280._4_4_ = (float)((ulong)uVar256 >> 0x20);
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x40);
                  fVar428 = *pfVar2;
                  fVar322 = pfVar2[1];
                  fVar323 = pfVar2[2];
                  fVar62 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x40);
                  fVar311 = *pfVar2;
                  fVar321 = pfVar2[1];
                  fVar68 = pfVar2[2];
                  fVar69 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar304 + lVar305 + 0x40);
                  fVar70 = *pfVar2;
                  fVar490 = pfVar2[1];
                  fVar75 = pfVar2[2];
                  fVar76 = pfVar2[3];
                  pfVar2 = (float *)(pauVar297[1] + lVar305);
                  *pfVar2 = fVar494 * local_178 +
                            fVar71 * (float)local_258 + fVar67 * (float)local_2b8._0_4_ +
                            fVar326 * local_398 + local_3c8 +
                            fVar63 * local_2f8 + fVar332 * local_378 +
                            (float)local_288 * (float)local_278 + fVar374 * (float)local_2d8 +
                            fVar325 * local_1f8;
                  pfVar2[1] = fVar495 * fStack_174 +
                              fVar72 * local_258._4_4_ + fVar506 * (float)local_2b8._4_4_ +
                              fVar327 * fStack_394 + fStack_3c4 +
                              fVar64 * fStack_2f4 + fVar358 * fStack_374 +
                              local_288._4_4_ * local_278._4_4_ + fVar59 * local_2d8._4_4_ +
                              fVar487 * fStack_1f4;
                  pfVar2[2] = fVar496 * fStack_170 + fVar73 * fStack_250 + fVar510 * fStack_2b0 +
                              fVar328 * fStack_390 + fStack_3c0 +
                              fVar65 * fStack_2f0 + fVar372 * fStack_370 +
                              (float)uStack_280 * fStack_270 + fVar60 * (float)uStack_2d0 +
                              fVar488 * fStack_1f0;
                  pfVar2[3] = fVar497 * fStack_16c + fVar74 * fStack_24c + fVar515 * fStack_2ac +
                              fVar329 * fStack_38c + fStack_3bc +
                              fVar66 * fStack_2ec + fVar373 * fStack_36c +
                              uStack_280._4_4_ * fStack_26c + fVar61 * uStack_2d0._4_4_ +
                              fVar489 * fStack_1ec;
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x50);
                  fVar326 = *pfVar2;
                  fVar327 = pfVar2[1];
                  fVar328 = pfVar2[2];
                  fVar329 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x50);
                  fVar63 = *pfVar2;
                  fVar64 = pfVar2[1];
                  fVar65 = pfVar2[2];
                  fVar66 = pfVar2[3];
                  puVar1 = (undefined8 *)((long)pfVar304 + lVar305 + 0x50);
                  uVar255 = *puVar1;
                  uVar256 = puVar1[1];
                  local_308._0_4_ = (float)uVar255;
                  local_308._4_4_ = (float)((ulong)uVar255 >> 0x20);
                  fStack_300 = (float)uVar256;
                  fStack_2fc = (float)((ulong)uVar256 >> 0x20);
                  pfVar2 = (float *)(pauVar297[2] + lVar305);
                  *pfVar2 = fVar332 * local_398 + local_3c8 +
                            fVar67 * local_2f8 + fVar494 * (float)local_258 +
                            (float)local_2b8._0_4_ * (float)local_288 + fVar374 * local_378 +
                            fVar325 * local_178 +
                            fVar428 * (float)local_2d8 + fVar311 * (float)local_278 +
                            fVar70 * local_1f8;
                  pfVar2[1] = fVar358 * fStack_394 + fStack_3c4 +
                              fVar506 * fStack_2f4 + fVar495 * local_258._4_4_ +
                              (float)local_2b8._4_4_ * local_288._4_4_ + fVar59 * fStack_374 +
                              fVar487 * fStack_174 +
                              fVar322 * local_2d8._4_4_ + fVar321 * local_278._4_4_ +
                              fVar490 * fStack_1f4;
                  pfVar2[2] = fVar372 * fStack_390 + fStack_3c0 +
                              fVar510 * fStack_2f0 + fVar496 * fStack_250 +
                              fStack_2b0 * (float)uStack_280 + fVar60 * fStack_370 +
                              fVar488 * fStack_170 +
                              fVar323 * (float)uStack_2d0 + fVar68 * fStack_270 +
                              fVar75 * fStack_1f0;
                  pfVar2[3] = fVar373 * fStack_38c + fStack_3bc +
                              fVar515 * fStack_2ec + fVar497 * fStack_24c +
                              fStack_2ac * uStack_280._4_4_ + fVar61 * fStack_36c +
                              fVar489 * fStack_16c +
                              fVar62 * uStack_2d0._4_4_ + fVar69 * fStack_26c + fVar76 * fStack_1ec;
                  fVar494 = (float)local_288 * local_2f8;
                  fVar495 = local_288._4_4_ * fStack_2f4;
                  fVar496 = (float)uStack_280 * fStack_2f0;
                  fVar497 = uStack_280._4_4_ * fStack_2ec;
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x60);
                  fVar332 = *pfVar2;
                  fVar358 = pfVar2[1];
                  local_288 = *(ulong *)pfVar2;
                  fVar372 = pfVar2[2];
                  fVar373 = pfVar2[3];
                  uStack_280 = *(ulong *)(pfVar2 + 2);
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x60);
                  fVar67 = *pfVar2;
                  fVar506 = pfVar2[1];
                  fVar510 = pfVar2[2];
                  fVar515 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar304 + lVar305 + 0x60);
                  fVar71 = *pfVar2;
                  fVar72 = pfVar2[1];
                  fVar73 = pfVar2[2];
                  fVar74 = pfVar2[3];
                  pfVar2 = (float *)(pauVar297[3] + lVar305);
                  *pfVar2 = fVar326 * (float)local_2d8 + (float)local_278 * fVar63 +
                            (float)local_308 * local_1f8 +
                            fVar428 * local_378 + (float)local_2b8._0_4_ * fVar311 +
                            local_178 * fVar70 +
                            fVar494 + (float)local_258 * fVar325 + fVar374 * local_398 + local_3c8;
                  pfVar2[1] = fVar327 * local_2d8._4_4_ + local_278._4_4_ * fVar64 +
                              local_308._4_4_ * fStack_1f4 +
                              fVar322 * fStack_374 + (float)local_2b8._4_4_ * fVar321 +
                              fStack_174 * fVar490 +
                              fVar495 + local_258._4_4_ * fVar487 + fVar59 * fStack_394 + fStack_3c4
                  ;
                  pfVar2[2] = fVar328 * (float)uStack_2d0 + fStack_270 * fVar65 +
                              fStack_300 * fStack_1f0 +
                              fVar323 * fStack_370 + fStack_2b0 * fVar68 + fStack_170 * fVar75 +
                              fVar496 + fStack_250 * fVar488 + fVar60 * fStack_390 + fStack_3c0;
                  pfVar2[3] = fVar329 * uStack_2d0._4_4_ + fStack_26c * fVar66 +
                              fStack_2fc * fStack_1ec +
                              fVar62 * fStack_36c + fStack_2ac * fVar69 + fStack_16c * fVar76 +
                              fVar497 + fStack_24c * fVar489 + fVar61 * fStack_38c + fStack_3bc;
                  pauVar6 = (undefined1 (*) [12])((long)pfVar307 + lVar305 + 0x70);
                  fVar374 = *(float *)*pauVar6;
                  fVar59 = *(float *)(*pauVar6 + 4);
                  fVar60 = *(float *)(*pauVar6 + 8);
                  auVar270 = *pauVar6;
                  fVar61 = *(float *)pauVar6[1];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x70);
                  fVar494 = *pfVar2;
                  fVar495 = pfVar2[1];
                  local_298 = *(long *)pfVar2;
                  fStack_290 = pfVar2[2];
                  fStack_28c = pfVar2[3];
                  auVar334 = *(undefined1 (*) [16])((long)pfVar304 + lVar305 + 0x70);
                  pfVar2 = (float *)(pauVar297[4] + lVar305);
                  *pfVar2 = fVar428 * local_398 + local_3c8 +
                            (float)local_258 * fVar70 + local_2f8 * fVar311 +
                            fVar63 * (float)local_2b8._0_4_ + fVar326 * local_378 +
                            local_178 * (float)local_308 +
                            fVar332 * (float)local_2d8 + (float)local_278 * fVar67 +
                            fVar71 * local_1f8;
                  pfVar2[1] = fVar322 * fStack_394 + fStack_3c4 +
                              local_258._4_4_ * fVar490 + fStack_2f4 * fVar321 +
                              fVar64 * (float)local_2b8._4_4_ + fVar327 * fStack_374 +
                              fStack_174 * local_308._4_4_ +
                              fVar358 * local_2d8._4_4_ + local_278._4_4_ * fVar506 +
                              fVar72 * fStack_1f4;
                  pfVar2[2] = fVar323 * fStack_390 + fStack_3c0 +
                              fStack_250 * fVar75 + fStack_2f0 * fVar68 +
                              fVar65 * fStack_2b0 + fVar328 * fStack_370 + fStack_170 * fStack_300 +
                              fVar372 * (float)uStack_2d0 + fStack_270 * fVar510 +
                              fVar73 * fStack_1f0;
                  pfVar2[3] = fVar62 * fStack_38c + fStack_3bc +
                              fStack_24c * fVar76 + fStack_2ec * fVar69 +
                              fVar66 * fStack_2ac + fVar329 * fStack_36c + fStack_16c * fStack_2fc +
                              fVar373 * uStack_2d0._4_4_ + fStack_26c * fVar515 +
                              fVar74 * fStack_1ec;
                  fVar311 = (float)local_258 * (float)local_308;
                  fVar321 = local_258._4_4_ * local_308._4_4_;
                  fVar497 = fStack_250 * fStack_300;
                  fVar325 = fStack_24c * fStack_2fc;
                  fVar487 = auVar334._0_4_;
                  fVar488 = auVar334._4_4_;
                  fVar489 = auVar334._8_4_;
                  fVar490 = auVar334._12_4_;
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x80);
                  fVar428 = *pfVar2;
                  fVar322 = pfVar2[1];
                  fVar323 = pfVar2[2];
                  fVar62 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x80);
                  fVar68 = *pfVar2;
                  fVar69 = pfVar2[1];
                  fVar70 = pfVar2[2];
                  fVar496 = pfVar2[3];
                  pauVar6 = (undefined1 (*) [12])((long)pfVar304 + lVar305 + 0x80);
                  auVar263 = *pauVar6;
                  local_308._0_4_ = (float)*(undefined8 *)*pauVar6;
                  local_308._4_4_ = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
                  fStack_300 = (float)*(undefined8 *)(*pauVar6 + 8);
                  fStack_2fc = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
                  pfVar2 = (float *)(pauVar297[5] + lVar305);
                  *pfVar2 = fVar326 * local_398 + local_3c8 + fVar63 * local_2f8 + fVar311 +
                            fVar332 * local_378 + fVar67 * (float)local_2b8._0_4_ +
                            fVar71 * local_178 +
                            (float)local_2d8 * fVar374 + (float)local_278 * fVar494 +
                            fVar487 * local_1f8;
                  pfVar2[1] = fVar327 * fStack_394 + fStack_3c4 + fVar64 * fStack_2f4 + fVar321 +
                              fVar358 * fStack_374 + fVar506 * (float)local_2b8._4_4_ +
                              fVar72 * fStack_174 +
                              local_2d8._4_4_ * fVar59 + local_278._4_4_ * fVar495 +
                              fVar488 * fStack_1f4;
                  pfVar2[2] = fVar328 * fStack_390 + fStack_3c0 + fVar65 * fStack_2f0 + fVar497 +
                              fVar372 * fStack_370 + fVar510 * fStack_2b0 + fVar73 * fStack_170 +
                              (float)uStack_2d0 * fVar60 + fStack_270 * fStack_290 +
                              fVar489 * fStack_1f0;
                  pfVar2[3] = fVar329 * fStack_38c + fStack_3bc + fVar66 * fStack_2ec + fVar325 +
                              fVar373 * fStack_36c + fVar515 * fStack_2ac + fVar74 * fStack_16c +
                              uStack_2d0._4_4_ * fVar61 + fStack_26c * fStack_28c +
                              fVar490 * fStack_1ec;
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x90);
                  fVar326 = *pfVar2;
                  fVar327 = pfVar2[1];
                  fVar328 = pfVar2[2];
                  fVar329 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x90);
                  fVar374 = *pfVar2;
                  fVar59 = pfVar2[1];
                  fVar60 = pfVar2[2];
                  fVar311 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar304 + lVar305 + 0x90);
                  fVar321 = *pfVar2;
                  fVar63 = pfVar2[1];
                  fVar64 = pfVar2[2];
                  fVar65 = pfVar2[3];
                  pfVar2 = (float *)(pauVar297[6] + lVar305);
                  *pfVar2 = local_398 * fVar332 + local_3c8 +
                            fVar71 * (float)local_258 + fVar67 * local_2f8 +
                            local_178 * fVar487 +
                            auVar270._0_4_ * local_378 + fVar494 * (float)local_2b8._0_4_ +
                            (float)local_2d8 * fVar428 + fVar68 * (float)local_278 +
                            auVar263._0_4_ * local_1f8;
                  pfVar2[1] = fStack_394 * fVar358 + fStack_3c4 +
                              fVar72 * local_258._4_4_ + fVar506 * fStack_2f4 +
                              fStack_174 * fVar488 +
                              auVar270._4_4_ * fStack_374 + fVar495 * (float)local_2b8._4_4_ +
                              local_2d8._4_4_ * fVar322 + fVar69 * local_278._4_4_ +
                              auVar263._4_4_ * fStack_1f4;
                  pfVar2[2] = fStack_390 * fVar372 + fStack_3c0 +
                              fVar73 * fStack_250 + fVar510 * fStack_2f0 +
                              fStack_170 * fVar489 +
                              auVar270._8_4_ * fStack_370 + fStack_290 * fStack_2b0 +
                              (float)uStack_2d0 * fVar323 + fVar70 * fStack_270 +
                              auVar263._8_4_ * fStack_1f0;
                  pfVar2[3] = fStack_38c * fVar373 + fStack_3bc +
                              fVar74 * fStack_24c + fVar515 * fStack_2ec +
                              fStack_16c * fVar490 + fVar61 * fStack_36c + fStack_28c * fStack_2ac +
                              uStack_2d0._4_4_ * fVar62 + fVar496 * fStack_26c +
                              fStack_2fc * fStack_1ec;
                  auVar313._0_4_ =
                       local_398 * auVar270._0_4_ + local_3c8 +
                       local_2f8 * fVar494 + fVar487 * (float)local_258 +
                       fVar428 * local_378 + fVar68 * (float)uVar50 + auVar263._0_4_ * local_178 +
                       (float)local_2d8 * fVar326 + (float)local_278 * fVar374 + local_1f8 * fVar321
                  ;
                  auVar313._4_4_ =
                       fStack_394 * auVar270._4_4_ + fStack_3c4 +
                       fStack_2f4 * fVar495 + fVar488 * local_258._4_4_ +
                       fVar322 * fStack_374 + fVar69 * (float)local_2b8._4_4_ +
                       auVar263._4_4_ * fStack_174 +
                       local_2d8._4_4_ * fVar327 + local_278._4_4_ * fVar59 + fStack_1f4 * fVar63;
                  auVar313._8_4_ =
                       fStack_390 * auVar270._8_4_ + fStack_3c0 +
                       fStack_2f0 * fStack_290 + fVar489 * fStack_250 +
                       fVar323 * fStack_370 + fVar70 * fStack_2b0 + auVar263._8_4_ * fStack_170 +
                       (float)uStack_2d0 * fVar328 + fStack_270 * fVar60 + fStack_1f0 * fVar64;
                  auVar313._12_4_ =
                       fStack_38c * fVar61 + fStack_3bc +
                       fStack_2ec * fStack_28c + fVar490 * fStack_24c +
                       fVar62 * fStack_36c + fVar496 * fStack_2ac + fStack_2fc * fStack_16c +
                       uStack_2d0._4_4_ * fVar329 + fStack_26c * fVar311 + fStack_1ec * fVar65;
                  *(undefined1 (*) [16])(pauVar297[7] + lVar305) = auVar313;
                  iVar292 = iVar292 + 8;
                  lVar305 = lVar305 + 0x80;
                  pfVar309 = pfVar309 + 0x20;
                  pfVar282 = pfVar282 + 0x20;
                  pfVar280 = pfVar280 + 0x20;
                }
                for (; iVar292 + 3 < iVar273; iVar292 = iVar292 + 4) {
                  pfVar4 = (float *)((long)pfVar307 + lVar305);
                  fVar326 = pfVar4[1];
                  fVar327 = pfVar4[2];
                  fVar328 = pfVar4[3];
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x10);
                  fVar329 = *pfVar2;
                  fVar332 = pfVar2[1];
                  fVar358 = pfVar2[2];
                  fVar372 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x20);
                  fVar373 = *pfVar2;
                  fVar374 = pfVar2[1];
                  local_298 = *(long *)pfVar2;
                  fStack_290 = pfVar2[2];
                  fStack_28c = pfVar2[3];
                  puVar1 = (undefined8 *)((long)pfVar307 + lVar305 + 0x30);
                  uVar255 = *puVar1;
                  uVar256 = puVar1[1];
                  local_308._0_4_ = (float)uVar255;
                  local_308._4_4_ = (float)((ulong)uVar255 >> 0x20);
                  fStack_300 = (float)uVar256;
                  fStack_2fc = (float)((ulong)uVar256 >> 0x20);
                  pfVar5 = (float *)((long)pfVar300 + lVar305);
                  fVar59 = pfVar5[1];
                  fVar60 = pfVar5[2];
                  fVar61 = pfVar5[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x10);
                  fVar62 = *pfVar2;
                  fVar311 = pfVar2[1];
                  fVar321 = pfVar2[2];
                  fVar63 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x20);
                  fVar64 = *pfVar2;
                  fVar65 = pfVar2[1];
                  fVar66 = pfVar2[2];
                  fVar67 = pfVar2[3];
                  puVar10 = (ulong *)((long)pfVar300 + lVar305 + 0x30);
                  uVar257 = *puVar10;
                  uVar258 = puVar10[1];
                  fVar428 = auVar264._0_4_;
                  fVar322 = auVar264._4_4_;
                  fVar323 = auVar264._8_4_;
                  pfVar2 = (float *)((long)pfVar304 + lVar305);
                  fVar506 = pfVar2[1];
                  fVar510 = pfVar2[2];
                  fVar515 = pfVar2[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x10);
                  fVar68 = *pfVar3;
                  fVar69 = pfVar3[1];
                  fVar70 = pfVar3[2];
                  fVar71 = pfVar3[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x20);
                  fVar72 = *pfVar3;
                  fVar73 = pfVar3[1];
                  fVar74 = pfVar3[2];
                  fVar494 = pfVar3[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x30);
                  fVar495 = *pfVar3;
                  fVar496 = pfVar3[1];
                  fVar497 = pfVar3[2];
                  fVar325 = pfVar3[3];
                  pfVar3 = (float *)((long)*pauVar297 + lVar305);
                  *pfVar3 = local_398 * *pfVar4 + local_3c8 +
                            fVar329 * local_378 + (float)local_2d8 * fVar373 +
                            local_2f8 * *pfVar5 + fVar62 * (float)local_2b8._0_4_ + fVar64 * fVar428
                            + fVar72 * local_1f8 + fVar68 * local_178 + (float)local_258 * *pfVar2;
                  pfVar3[1] = fStack_394 * fVar326 + fStack_3c4 +
                              fVar332 * fStack_374 + local_2d8._4_4_ * fVar374 +
                              fStack_2f4 * fVar59 + fVar311 * (float)local_2b8._4_4_ +
                              fVar65 * fVar322 +
                              fVar73 * fStack_1f4 + fVar69 * fStack_174 + local_258._4_4_ * fVar506;
                  pfVar3[2] = fStack_390 * fVar327 + fStack_3c0 +
                              fVar358 * fStack_370 + (float)uStack_2d0 * fStack_290 +
                              fStack_2f0 * fVar60 + fVar321 * fStack_2b0 + fVar66 * fVar323 +
                              fVar74 * fStack_1f0 + fVar70 * fStack_170 + fStack_250 * fVar510;
                  pfVar3[3] = fStack_38c * fVar328 + fStack_3bc +
                              fVar372 * fStack_36c + uStack_2d0._4_4_ * fStack_28c +
                              fStack_2ec * fVar61 + fVar63 * fStack_2ac + fVar67 * fStack_26c +
                              fVar494 * fStack_1ec + fVar71 * fStack_16c + fStack_24c * fVar515;
                  local_288._0_4_ = (float)uVar257;
                  local_288._4_4_ = (float)(uVar257 >> 0x20);
                  uStack_280._0_4_ = (float)uVar258;
                  uStack_280._4_4_ = (float)(uVar258 >> 0x20);
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x40);
                  fVar326 = *pfVar2;
                  fVar327 = pfVar2[1];
                  fVar328 = pfVar2[2];
                  fVar59 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x40);
                  fVar60 = *pfVar2;
                  fVar61 = pfVar2[1];
                  fVar506 = pfVar2[2];
                  fVar510 = pfVar2[3];
                  puVar1 = (undefined8 *)((long)pfVar304 + lVar305 + 0x40);
                  uVar255 = *puVar1;
                  uVar256 = puVar1[1];
                  pfVar2 = (float *)(pauVar297[1] + lVar305);
                  *pfVar2 = fVar329 * local_398 + local_3c8 +
                            fVar373 * local_378 + fVar62 * local_2f8 +
                            fVar64 * (float)local_2b8._0_4_ + fVar68 * (float)local_258 +
                            fVar72 * local_178 +
                            (float)local_308 * (float)local_2d8 + fVar428 * (float)local_288 +
                            fVar495 * local_1f8;
                  pfVar2[1] = fVar332 * fStack_394 + fStack_3c4 +
                              fVar374 * fStack_374 + fVar311 * fStack_2f4 +
                              fVar65 * (float)local_2b8._4_4_ + fVar69 * local_258._4_4_ +
                              fVar73 * fStack_174 +
                              local_308._4_4_ * local_2d8._4_4_ + fVar322 * local_288._4_4_ +
                              fVar496 * fStack_1f4;
                  pfVar2[2] = fVar358 * fStack_390 + fStack_3c0 +
                              fStack_290 * fStack_370 + fVar321 * fStack_2f0 +
                              fVar66 * fStack_2b0 + fVar70 * fStack_250 + fVar74 * fStack_170 +
                              fStack_300 * (float)uStack_2d0 + fVar323 * (float)uStack_280 +
                              fVar497 * fStack_1f0;
                  pfVar2[3] = fVar372 * fStack_38c + fStack_3bc +
                              fStack_28c * fStack_36c + fVar63 * fStack_2ec +
                              fVar67 * fStack_2ac + fVar71 * fStack_24c + fVar494 * fStack_16c +
                              fStack_2fc * uStack_2d0._4_4_ + fStack_26c * uStack_280._4_4_ +
                              fVar325 * fStack_1ec;
                  local_188 = (float)uVar255;
                  fStack_184 = (float)((ulong)uVar255 >> 0x20);
                  fStack_180 = (float)uVar256;
                  fStack_17c = (float)((ulong)uVar256 >> 0x20);
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x50);
                  fVar329 = *pfVar2;
                  fVar332 = pfVar2[1];
                  fVar358 = pfVar2[2];
                  fVar372 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x50);
                  fVar62 = *pfVar2;
                  fVar311 = pfVar2[1];
                  fVar321 = pfVar2[2];
                  fVar63 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar304 + lVar305 + 0x50);
                  fVar515 = *pfVar2;
                  fVar68 = pfVar2[1];
                  fVar69 = pfVar2[2];
                  fVar70 = pfVar2[3];
                  pfVar2 = (float *)(pauVar297[2] + lVar305);
                  *pfVar2 = local_3c8 + fVar373 * local_398 +
                            fVar64 * auVar265._0_4_ + fVar72 * (float)local_258 +
                            (float)local_288 * (float)local_2b8._0_4_ + (float)local_308 * local_378
                            + fVar495 * local_178 +
                            (float)local_2d8 * fVar326 + fVar428 * fVar60 + local_188 * local_1f8;
                  pfVar2[1] = fStack_3c4 + fVar374 * fStack_394 +
                              fVar65 * auVar265._4_4_ + fVar73 * local_258._4_4_ +
                              local_288._4_4_ * (float)local_2b8._4_4_ +
                              local_308._4_4_ * fStack_374 + fVar496 * fStack_174 +
                              local_2d8._4_4_ * fVar327 + fVar322 * fVar61 + fStack_184 * fStack_1f4
                  ;
                  pfVar2[2] = fStack_3c0 + fStack_290 * fStack_390 +
                              fVar66 * auVar265._8_4_ + fVar74 * fStack_250 +
                              (float)uStack_280 * fStack_2b0 + fStack_300 * fStack_370 +
                              fVar497 * fStack_170 +
                              (float)uStack_2d0 * fVar328 + fVar323 * fVar506 +
                              fStack_180 * fStack_1f0;
                  pfVar2[3] = fStack_3bc + fStack_28c * fStack_38c +
                              fVar67 * fStack_2ec + fVar494 * fStack_24c +
                              uStack_280._4_4_ * fStack_2ac + fStack_2fc * fStack_36c +
                              fVar325 * fStack_16c +
                              uStack_2d0._4_4_ * fVar59 + fStack_26c * fVar510 +
                              fStack_17c * fStack_1ec;
                  auVar314._0_4_ =
                       local_3c8 + (float)local_308 * local_398 +
                       auVar265._0_4_ * (float)local_288 + fVar495 * (float)local_258 +
                       fVar326 * local_378 + fVar60 * (float)local_2b8._0_4_ + local_188 * local_178
                       + (float)local_2d8 * fVar329 + fVar428 * fVar62 + local_1f8 * fVar515;
                  auVar314._4_4_ =
                       fStack_3c4 + local_308._4_4_ * fStack_394 +
                       auVar265._4_4_ * local_288._4_4_ + fVar496 * local_258._4_4_ +
                       fVar327 * fStack_374 + fVar61 * (float)local_2b8._4_4_ +
                       fStack_184 * fStack_174 +
                       local_2d8._4_4_ * fVar332 + fVar322 * fVar311 + fStack_1f4 * fVar68;
                  auVar314._8_4_ =
                       fStack_3c0 + fStack_300 * fStack_390 +
                       auVar265._8_4_ * (float)uStack_280 + fVar497 * fStack_250 +
                       fVar328 * fStack_370 + fVar506 * fStack_2b0 + fStack_180 * fStack_170 +
                       (float)uStack_2d0 * fVar358 + fVar323 * fVar321 + fStack_1f0 * fVar69;
                  auVar314._12_4_ =
                       fStack_3bc + fStack_2fc * fStack_38c +
                       fStack_2ec * uStack_280._4_4_ + fVar325 * fStack_24c +
                       fVar59 * fStack_36c + fVar510 * fStack_2ac + fStack_17c * fStack_16c +
                       uStack_2d0._4_4_ * fVar372 + fStack_26c * fVar63 + fStack_1ec * fVar70;
                  *(undefined1 (*) [16])(pauVar297[3] + lVar305) = auVar314;
                  lVar305 = lVar305 + 0x40;
                  pfVar309 = pfVar309 + 0x10;
                  pfVar282 = pfVar282 + 0x10;
                  pfVar280 = pfVar280 + 0x10;
                  local_288 = uVar257;
                  uStack_280 = uVar258;
                }
                for (; iVar292 + 1 < iVar273; iVar292 = iVar292 + 2) {
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x10);
                  local_308._0_4_ = *pfVar2;
                  local_308._4_4_ = pfVar2[1];
                  fStack_300 = pfVar2[2];
                  fStack_2fc = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar307 + lVar305 + 0x20);
                  fVar428 = *pfVar2;
                  fVar322 = pfVar2[1];
                  fVar323 = pfVar2[2];
                  fVar326 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x10);
                  fVar327 = *pfVar2;
                  fVar328 = pfVar2[1];
                  fVar329 = pfVar2[2];
                  fVar332 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar300 + lVar305 + 0x20);
                  fVar358 = *pfVar2;
                  fVar372 = pfVar2[1];
                  local_288 = *(ulong *)pfVar2;
                  fVar373 = pfVar2[2];
                  fVar374 = pfVar2[3];
                  uStack_280 = *(ulong *)(pfVar2 + 2);
                  pfVar2 = (float *)((long)pfVar304 + lVar305 + 0x10);
                  fVar59 = *pfVar2;
                  fVar60 = pfVar2[1];
                  fVar61 = pfVar2[2];
                  fVar62 = pfVar2[3];
                  pfVar4 = (float *)((long)pfVar307 + lVar305);
                  fVar311 = pfVar4[1];
                  fVar321 = pfVar4[2];
                  fVar63 = pfVar4[3];
                  pfVar2 = (float *)((long)pfVar304 + lVar305 + 0x20);
                  fVar64 = *pfVar2;
                  fVar65 = pfVar2[1];
                  local_298 = *(long *)pfVar2;
                  fStack_290 = pfVar2[2];
                  fStack_28c = pfVar2[3];
                  pfVar5 = (float *)((long)pfVar300 + lVar305);
                  fVar66 = pfVar5[1];
                  fVar67 = pfVar5[2];
                  fVar506 = pfVar5[3];
                  pfVar2 = (float *)((long)pfVar304 + lVar305);
                  fVar510 = pfVar2[1];
                  fVar515 = pfVar2[2];
                  fVar68 = pfVar2[3];
                  pfVar3 = (float *)((long)pfVar307 + lVar305 + 0x30);
                  fVar69 = *pfVar3;
                  fVar70 = pfVar3[1];
                  fVar71 = pfVar3[2];
                  fVar72 = pfVar3[3];
                  pfVar3 = (float *)((long)pfVar300 + lVar305 + 0x30);
                  fVar73 = *pfVar3;
                  fVar74 = pfVar3[1];
                  fVar494 = pfVar3[2];
                  fVar495 = pfVar3[3];
                  pfVar3 = (float *)((long)pfVar304 + lVar305 + 0x30);
                  fVar496 = *pfVar3;
                  fVar497 = pfVar3[1];
                  fVar325 = pfVar3[2];
                  fVar487 = pfVar3[3];
                  pfVar3 = (float *)((long)*pauVar297 + lVar305);
                  *pfVar3 = local_398 * *pfVar4 + local_3c8 +
                            local_378 * (float)local_308 + fVar428 * (float)local_2d8 +
                            auVar266._0_4_ * *pfVar5 + (float)local_2b8._0_4_ * fVar327 +
                            auVar267._0_4_ * fVar358 +
                            auVar268._0_4_ * *pfVar2 + fVar59 * auVar269._0_4_ + fVar64 * local_1f8;
                  pfVar3[1] = fStack_394 * fVar311 + fStack_3c4 +
                              fStack_374 * local_308._4_4_ + fVar322 * local_2d8._4_4_ +
                              auVar266._4_4_ * fVar66 + (float)local_2b8._4_4_ * fVar328 +
                              auVar267._4_4_ * fVar372 +
                              auVar268._4_4_ * fVar510 + fVar60 * auVar269._4_4_ +
                              fVar65 * fStack_1f4;
                  pfVar3[2] = fStack_390 * fVar321 + fStack_3c0 +
                              fStack_370 * fStack_300 + fVar323 * (float)uStack_2d0 +
                              auVar266._8_4_ * fVar67 + fStack_2b0 * fVar329 +
                              auVar267._8_4_ * fVar373 +
                              auVar268._8_4_ * fVar515 + fVar61 * auVar269._8_4_ +
                              fStack_290 * fStack_1f0;
                  pfVar3[3] = fStack_38c * fVar63 + fStack_3bc +
                              fStack_36c * fStack_2fc + fVar326 * uStack_2d0._4_4_ +
                              fStack_2ec * fVar506 + fStack_2ac * fVar332 + fStack_26c * fVar374 +
                              fStack_24c * fVar68 + fVar62 * fStack_16c + fStack_28c * fStack_1ec;
                  auVar315._0_4_ =
                       (float)local_2d8 * fVar69 + auVar267._0_4_ * fVar73 + local_1f8 * fVar496 +
                       local_3c8 + (float)local_308 * local_398 +
                       local_378 * fVar428 + fVar327 * auVar266._0_4_ +
                       (float)local_2b8._0_4_ * fVar358 + auVar268._0_4_ * fVar59 +
                       auVar269._0_4_ * fVar64;
                  auVar315._4_4_ =
                       local_2d8._4_4_ * fVar70 + auVar267._4_4_ * fVar74 + fStack_1f4 * fVar497 +
                       fStack_3c4 + local_308._4_4_ * fStack_394 +
                       fStack_374 * fVar322 + fVar328 * auVar266._4_4_ +
                       (float)local_2b8._4_4_ * fVar372 + auVar268._4_4_ * fVar60 +
                       auVar269._4_4_ * fVar65;
                  auVar315._8_4_ =
                       (float)uStack_2d0 * fVar71 + auVar267._8_4_ * fVar494 + fStack_1f0 * fVar325
                       + fStack_3c0 + fStack_300 * fStack_390 +
                         fStack_370 * fVar323 + fVar329 * auVar266._8_4_ +
                         fStack_2b0 * fVar373 + auVar268._8_4_ * fVar61 +
                         auVar269._8_4_ * fStack_290;
                  auVar315._12_4_ =
                       uStack_2d0._4_4_ * fVar72 + fStack_26c * fVar495 + fStack_1ec * fVar487 +
                       fStack_3bc + fStack_2fc * fStack_38c +
                       fStack_36c * fVar326 + fVar332 * fStack_2ec +
                       fStack_2ac * fVar374 + fStack_24c * fVar62 + fStack_16c * fStack_28c;
                  *(undefined1 (*) [16])(pauVar297[1] + lVar305) = auVar315;
                  lVar305 = lVar305 + 0x20;
                  pfVar309 = pfVar309 + 8;
                  pfVar282 = pfVar282 + 8;
                  pfVar280 = pfVar280 + 8;
                }
                pauVar297 = (undefined1 (*) [16])((long)*pauVar297 + lVar305);
                pfVar307 = pfVar309;
                for (; iVar292 < iVar273; iVar292 = iVar292 + 1) {
                  auVar316._0_4_ =
                       local_398 * pfVar307[-8] + local_3c8 +
                       local_378 * pfVar307[-4] + (float)local_2d8 * *pfVar307 +
                       local_2f8 * pfVar282[-8] + (float)local_2b8._0_4_ * pfVar282[-4] +
                       (float)local_278 * *pfVar282 +
                       (float)local_258 * pfVar280[-8] + local_178 * pfVar280[-4] +
                       local_1f8 * *pfVar280;
                  auVar316._4_4_ =
                       fStack_394 * pfVar307[-7] + fStack_3c4 +
                       fStack_374 * pfVar307[-3] + local_2d8._4_4_ * pfVar307[1] +
                       fStack_2f4 * pfVar282[-7] + (float)local_2b8._4_4_ * pfVar282[-3] +
                       local_278._4_4_ * pfVar282[1] +
                       local_258._4_4_ * pfVar280[-7] + fStack_174 * pfVar280[-3] +
                       fStack_1f4 * pfVar280[1];
                  auVar316._8_4_ =
                       fStack_390 * pfVar307[-6] + fStack_3c0 +
                       fStack_370 * pfVar307[-2] + (float)uStack_2d0 * pfVar307[2] +
                       fStack_2f0 * pfVar282[-6] + fStack_2b0 * pfVar282[-2] +
                       fStack_270 * pfVar282[2] +
                       fStack_250 * pfVar280[-6] + fStack_170 * pfVar280[-2] +
                       fStack_1f0 * pfVar280[2];
                  auVar316._12_4_ =
                       fStack_38c * pfVar307[-5] + fStack_3bc +
                       fStack_36c * pfVar307[-1] + uStack_2d0._4_4_ * pfVar307[3] +
                       fStack_2ec * pfVar282[-5] + fStack_2ac * pfVar282[-1] +
                       fStack_26c * pfVar282[3] +
                       fStack_24c * pfVar280[-5] + fStack_16c * pfVar280[-1] +
                       fStack_1ec * pfVar280[3];
                  *pauVar297 = auVar316;
                  pauVar297 = pauVar297 + 1;
                  pfVar307 = pfVar307 + 4;
                  pfVar282 = pfVar282 + 4;
                  pfVar280 = pfVar280 + 4;
                }
                pfVar300 = pfVar282;
                pfVar304 = pfVar280;
              }
              uVar294 = uVar294 + 1;
              local_2d8 = uVar277;
              uStack_2d0 = uVar275;
              _local_2b8 = auVar508;
              local_278 = uVar254;
            }
          }
          else {
            iVar292 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var281) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var281) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var281) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var281) != 2)) goto LAB_003a53bc;
            iVar273 = top_blob->w;
            lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
            uVar294 = 0;
            uVar296 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar296 = uVar294;
            }
            fVar428 = local_320;
            if ((int)local_320 < 1) {
              fVar428 = 0.0;
            }
            lVar305 = (long)((iStack_32c - iVar273) * 8) * 4;
            for (; local_258 = CONCAT44(local_258._4_4_,(float)local_258),
                local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar294 != (uint)fVar428;
                uVar294 = uVar294 + 1) {
              if (lVar290 == 0) {
                fVar322 = 0.0;
                fVar323 = 0.0;
                fVar326 = 0.0;
                fVar327 = 0.0;
              }
              else {
                pfVar300 = (float *)(lVar290 + uVar294 * 0x10);
                fVar322 = *pfVar300;
                fVar323 = pfVar300[1];
                fVar326 = pfVar300[2];
                fVar327 = pfVar300[3];
              }
              pauVar298 = (undefined1 (*) [16])
                          (top_blob->cstep * uVar294 * top_blob->elemsize + (long)top_blob->data);
              pvVar301 = (this->weight_data_tm).data;
              lVar308 = (long)(this->weight_data_tm).w * uVar294 * (this->weight_data_tm).elemsize;
              lVar303 = local_318 * uVar294 * CONCAT44(uStack_344,local_348) +
                        CONCAT44(fStack_354,local_358);
              lVar286 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
              lVar306 = lVar303 + lVar286;
              lVar286 = lVar303 + lVar286 * 2;
              pfVar300 = (float *)((long)pvVar301 + lVar308);
              fVar60 = *pfVar300;
              fVar61 = pfVar300[1];
              fVar62 = pfVar300[2];
              fVar311 = pfVar300[3];
              puVar1 = (undefined8 *)((long)pvVar301 + lVar308 + 0x10);
              uVar312 = *puVar1;
              uVar324 = puVar1[1];
              puVar10 = (ulong *)((long)pvVar301 + lVar308 + 0x20);
              uVar276 = *puVar10;
              uVar277 = puVar10[1];
              local_278._0_4_ = (float)uVar276;
              local_278._4_4_ = (float)(uVar276 >> 0x20);
              fStack_270 = (float)uVar277;
              fStack_26c = (float)(uVar277 >> 0x20);
              pfVar300 = (float *)((long)pvVar301 + lVar308 + 0x30);
              fVar328 = *pfVar300;
              fVar329 = pfVar300[1];
              fVar332 = pfVar300[2];
              fVar358 = pfVar300[3];
              pfVar300 = (float *)((long)pvVar301 + lVar308 + 0x40);
              fVar372 = *pfVar300;
              fVar373 = pfVar300[1];
              fVar374 = pfVar300[2];
              fVar59 = pfVar300[3];
              puVar1 = (undefined8 *)((long)pvVar301 + lVar308 + 0x50);
              uVar491 = *puVar1;
              uVar492 = puVar1[1];
              pauVar6 = (undefined1 (*) [12])((long)pvVar301 + lVar308 + 0x60);
              auVar265 = *pauVar6;
              local_398 = (float)*(undefined8 *)*pauVar6;
              fStack_394 = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
              fStack_390 = (float)*(undefined8 *)(*pauVar6 + 8);
              fStack_38c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
              pauVar6 = (undefined1 (*) [12])((long)pvVar301 + lVar308 + 0x70);
              auVar264 = *pauVar6;
              local_2f8 = (float)*(undefined8 *)*pauVar6;
              fStack_2f4 = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
              fStack_2f0 = (float)*(undefined8 *)(*pauVar6 + 8);
              fStack_2ec = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
              _local_2b8 = *(undefined1 (*) [16])((long)pvVar301 + lVar308 + 0x80);
              local_2d8 = CONCAT44(fVar323,fVar322);
              uStack_2d0 = CONCAT44(fVar327,fVar326);
              for (iVar284 = 0; iVar284 != (int)uVar296; iVar284 = iVar284 + 1) {
                lVar308 = 0;
                iVar292 = 0;
                while( true ) {
                  local_3c8 = (float)uVar312;
                  fStack_3c0 = (float)uVar324;
                  fStack_3c4 = (float)((ulong)uVar312 >> 0x20);
                  fStack_3bc = (float)((ulong)uVar324 >> 0x20);
                  fVar321 = (float)uVar491;
                  fVar63 = (float)((ulong)uVar491 >> 0x20);
                  fVar64 = (float)uVar492;
                  fVar65 = (float)((ulong)uVar492 >> 0x20);
                  if (iVar273 <= iVar292 + 3) break;
                  pfVar300 = (float *)(lVar303 + lVar308);
                  fVar66 = pfVar300[1];
                  fVar67 = pfVar300[2];
                  fVar506 = pfVar300[3];
                  pfVar309 = (float *)(lVar303 + 0x10 + lVar308);
                  fVar510 = pfVar309[1];
                  fVar515 = pfVar309[2];
                  fVar68 = pfVar309[3];
                  pfVar304 = (float *)(lVar303 + 0x20 + lVar308);
                  fVar69 = *pfVar304;
                  fVar70 = pfVar304[1];
                  fVar71 = pfVar304[2];
                  fVar72 = pfVar304[3];
                  pfVar304 = (float *)(lVar303 + 0x40 + lVar308);
                  fVar73 = *pfVar304;
                  fVar74 = pfVar304[1];
                  fVar494 = pfVar304[2];
                  fVar495 = pfVar304[3];
                  pfVar304 = (float *)(lVar306 + lVar308);
                  fVar496 = pfVar304[1];
                  fVar497 = pfVar304[2];
                  fVar325 = pfVar304[3];
                  pfVar282 = (float *)(lVar306 + 0x10 + lVar308);
                  fVar487 = pfVar282[1];
                  fVar488 = pfVar282[2];
                  fVar489 = pfVar282[3];
                  pfVar307 = (float *)(lVar306 + 0x20 + lVar308);
                  fVar490 = *pfVar307;
                  fVar75 = pfVar307[1];
                  fVar76 = pfVar307[2];
                  fVar77 = pfVar307[3];
                  pfVar307 = (float *)(lVar306 + 0x40 + lVar308);
                  fVar78 = *pfVar307;
                  fVar79 = pfVar307[1];
                  fVar80 = pfVar307[2];
                  fVar81 = pfVar307[3];
                  pfVar307 = (float *)(lVar286 + lVar308);
                  fVar82 = pfVar307[1];
                  fVar83 = pfVar307[2];
                  fVar84 = pfVar307[3];
                  pfVar280 = (float *)(lVar286 + 0x10 + lVar308);
                  fVar85 = pfVar280[1];
                  fVar86 = pfVar280[2];
                  fVar333 = pfVar280[3];
                  fVar416 = auVar264._0_4_;
                  fVar417 = auVar264._4_4_;
                  fVar418 = auVar264._8_4_;
                  pfVar2 = (float *)(lVar286 + 0x20 + lVar308);
                  fVar349 = *pfVar2;
                  fVar350 = pfVar2[1];
                  fVar351 = pfVar2[2];
                  fVar352 = pfVar2[3];
                  pfVar2 = (float *)(lVar286 + 0x40 + lVar308);
                  fVar93 = *pfVar2;
                  fVar94 = pfVar2[1];
                  fVar355 = pfVar2[2];
                  fVar411 = pfVar2[3];
                  pfVar2 = (float *)(lVar303 + 0x30 + lVar308);
                  fVar353 = *pfVar2;
                  fVar354 = pfVar2[1];
                  fVar356 = pfVar2[2];
                  fVar357 = pfVar2[3];
                  pfVar2 = (float *)(lVar306 + 0x30 + lVar308);
                  fVar87 = *pfVar2;
                  fVar88 = pfVar2[1];
                  fVar89 = pfVar2[2];
                  fVar90 = pfVar2[3];
                  pfVar2 = (float *)(lVar286 + 0x30 + lVar308);
                  fVar91 = *pfVar2;
                  fVar92 = pfVar2[1];
                  fVar425 = pfVar2[2];
                  fVar426 = pfVar2[3];
                  *(float *)*pauVar298 =
                       fVar60 * *pfVar300 + fVar322 +
                       local_3c8 * *pfVar309 + fVar69 * (float)local_278 +
                       fVar328 * *pfVar304 + fVar372 * *pfVar282 + fVar490 * fVar321 +
                       local_398 * *pfVar307 + fVar416 * *pfVar280 +
                       fVar349 * (float)local_2b8._0_4_;
                  *(float *)((long)*pauVar298 + 4) =
                       fVar61 * fVar66 + fVar323 + fStack_3c4 * fVar510 + fVar70 * local_278._4_4_ +
                       fVar329 * fVar496 + fVar373 * fVar487 + fVar75 * fVar63 +
                       fStack_394 * fVar82 + fVar417 * fVar85 + fVar350 * (float)local_2b8._4_4_;
                  *(float *)((long)*pauVar298 + 8) =
                       fVar62 * fVar67 + fVar326 + fStack_3c0 * fVar515 + fVar71 * fStack_270 +
                       fVar332 * fVar497 + fVar374 * fVar488 + fVar76 * fVar64 +
                       fStack_390 * fVar83 + fVar418 * fVar86 + fVar351 * fStack_2b0;
                  *(float *)((long)*pauVar298 + 0xc) =
                       fVar311 * fVar506 + fVar327 + fStack_3bc * fVar68 + fVar72 * fStack_26c +
                       fVar358 * fVar325 + fVar59 * fVar489 + fVar77 * fVar65 +
                       fStack_38c * fVar84 + fStack_2ec * fVar333 + fVar352 * fStack_2ac;
                  pfVar300 = (float *)(lVar303 + 0x60 + lVar308);
                  fVar509 = *pfVar300;
                  fVar420 = pfVar300[1];
                  fVar422 = pfVar300[2];
                  fVar427 = pfVar300[3];
                  pfVar300 = (float *)(lVar306 + 0x60 + lVar308);
                  fVar66 = *pfVar300;
                  fVar67 = pfVar300[1];
                  fVar506 = pfVar300[2];
                  fVar510 = pfVar300[3];
                  pfVar300 = (float *)(lVar303 + 0x50 + lVar308);
                  fVar515 = *pfVar300;
                  fVar68 = pfVar300[1];
                  fVar496 = pfVar300[2];
                  fVar497 = pfVar300[3];
                  pfVar300 = (float *)(lVar306 + 0x50 + lVar308);
                  fVar325 = *pfVar300;
                  fVar487 = pfVar300[1];
                  fVar488 = pfVar300[2];
                  fVar489 = pfVar300[3];
                  pfVar300 = (float *)(lVar286 + 0x60 + lVar308);
                  fVar82 = *pfVar300;
                  fVar83 = pfVar300[1];
                  fVar84 = pfVar300[2];
                  fVar85 = pfVar300[3];
                  pfVar300 = (float *)(lVar286 + 0x50 + lVar308);
                  fVar86 = *pfVar300;
                  fVar333 = pfVar300[1];
                  fVar504 = pfVar300[2];
                  fVar505 = pfVar300[3];
                  *(float *)pauVar298[1] =
                       fVar69 * fVar60 + fVar322 + fVar490 * fVar328 + fVar349 * local_398 +
                       fVar416 * fVar91 + fVar372 * fVar87 + local_3c8 * fVar353 +
                       fVar73 * (float)local_278 + fVar78 * fVar321 +
                       fVar93 * (float)local_2b8._0_4_;
                  *(float *)(pauVar298[1] + 4) =
                       fVar70 * fVar61 + fVar323 + fVar75 * fVar329 + fVar350 * fStack_394 +
                       fVar417 * fVar92 + fVar373 * fVar88 + fStack_3c4 * fVar354 +
                       fVar74 * local_278._4_4_ + fVar79 * fVar63 + fVar94 * (float)local_2b8._4_4_;
                  *(float *)(pauVar298[1] + 8) =
                       fVar71 * fVar62 + fVar326 + fVar76 * fVar332 + fVar351 * fStack_390 +
                       fVar418 * fVar425 + fVar374 * fVar89 + fStack_3c0 * fVar356 +
                       fVar494 * fStack_270 + fVar80 * fVar64 + fVar355 * fStack_2b0;
                  *(float *)(pauVar298[1] + 0xc) =
                       fVar72 * fVar311 + fVar327 + fVar77 * fVar358 + fVar352 * fStack_38c +
                       fStack_2ec * fVar426 + fVar59 * fVar90 + fStack_3bc * fVar357 +
                       fVar495 * fStack_26c + fVar81 * fVar65 + fVar411 * fStack_2ac;
                  pfVar300 = (float *)(lVar303 + 0x70 + lVar308);
                  fVar69 = *pfVar300;
                  fVar70 = pfVar300[1];
                  fVar71 = pfVar300[2];
                  fVar72 = pfVar300[3];
                  pfVar300 = (float *)(lVar303 + 0x80 + lVar308);
                  fVar490 = *pfVar300;
                  fVar75 = pfVar300[1];
                  fVar76 = pfVar300[2];
                  fVar77 = pfVar300[3];
                  pfVar300 = (float *)(lVar306 + 0x70 + lVar308);
                  fVar349 = *pfVar300;
                  fVar350 = pfVar300[1];
                  fVar351 = pfVar300[2];
                  fVar352 = pfVar300[3];
                  pfVar300 = (float *)(lVar306 + 0x80 + lVar308);
                  fVar353 = *pfVar300;
                  fVar354 = pfVar300[1];
                  fVar356 = pfVar300[2];
                  fVar357 = pfVar300[3];
                  pfVar300 = (float *)(lVar286 + 0x70 + lVar308);
                  fVar87 = *pfVar300;
                  fVar88 = pfVar300[1];
                  fVar89 = pfVar300[2];
                  fVar90 = pfVar300[3];
                  pfVar300 = (float *)(lVar286 + 0x80 + lVar308);
                  fVar91 = *pfVar300;
                  fVar92 = pfVar300[1];
                  fVar425 = pfVar300[2];
                  fVar426 = pfVar300[3];
                  *(float *)pauVar298[2] =
                       fVar78 * fVar328 + fVar93 * local_398 + fVar73 * fVar60 + fVar322 +
                       local_3c8 * fVar515 + fVar372 * fVar325 + fVar416 * fVar86 +
                       fVar509 * (float)local_278 + fVar66 * fVar321 +
                       fVar82 * (float)local_2b8._0_4_;
                  *(float *)(pauVar298[2] + 4) =
                       fVar79 * fVar329 + fVar94 * fStack_394 + fVar74 * fVar61 + fVar323 +
                       fStack_3c4 * fVar68 + fVar373 * fVar487 + fVar417 * fVar333 +
                       fVar420 * local_278._4_4_ + fVar67 * fVar63 + fVar83 * (float)local_2b8._4_4_
                  ;
                  *(float *)(pauVar298[2] + 8) =
                       fVar80 * fVar332 + fVar355 * fStack_390 + fVar494 * fVar62 + fVar326 +
                       fStack_3c0 * fVar496 + fVar374 * fVar488 + fVar418 * fVar504 +
                       fVar422 * fStack_270 + fVar506 * fVar64 + fVar84 * fStack_2b0;
                  *(float *)(pauVar298[2] + 0xc) =
                       fVar81 * fVar358 + fVar411 * fStack_38c + fVar495 * fVar311 + fVar327 +
                       fStack_3bc * fVar497 + fVar59 * fVar489 + fStack_2ec * fVar505 +
                       fVar427 * fStack_26c + fVar510 * fVar65 + fVar85 * fStack_2ac;
                  auVar317._0_4_ =
                       fVar509 * fVar60 + fVar322 + fVar82 * local_398 + fVar66 * fVar328 +
                       fVar416 * fVar87 + fVar372 * fVar349 + local_3c8 * fVar69 +
                       (float)local_2b8._0_4_ * fVar91 +
                       (float)local_278 * fVar490 + fVar321 * fVar353;
                  auVar317._4_4_ =
                       fVar420 * fVar61 + fVar323 + fVar83 * fStack_394 + fVar67 * fVar329 +
                       fVar417 * fVar88 + fVar373 * fVar350 + fStack_3c4 * fVar70 +
                       (float)local_2b8._4_4_ * fVar92 + local_278._4_4_ * fVar75 + fVar63 * fVar354
                  ;
                  auVar317._8_4_ =
                       fVar422 * fVar62 + fVar326 + fVar84 * fStack_390 + fVar506 * fVar332 +
                       fVar418 * fVar89 + fVar374 * fVar351 + fStack_3c0 * fVar71 +
                       fStack_2b0 * fVar425 + fStack_270 * fVar76 + fVar64 * fVar356;
                  auVar317._12_4_ =
                       fVar427 * fVar311 + fVar327 + fVar85 * fStack_38c + fVar510 * fVar358 +
                       fStack_2ec * fVar90 + fVar59 * fVar352 + fStack_3bc * fVar72 +
                       fStack_2ac * fVar426 + fStack_26c * fVar77 + fVar65 * fVar357;
                  pauVar298[3] = auVar317;
                  pauVar298 = pauVar298 + 4;
                  iVar292 = iVar292 + 4;
                  lVar308 = lVar308 + 0x80;
                }
                for (; iVar292 + 1 < iVar273; iVar292 = iVar292 + 2) {
                  pfVar300 = (float *)(lVar303 + 0x20 + lVar308);
                  fVar66 = *pfVar300;
                  fVar67 = pfVar300[1];
                  fVar506 = pfVar300[2];
                  fVar510 = pfVar300[3];
                  pfVar300 = (float *)(lVar306 + 0x20 + lVar308);
                  fVar515 = *pfVar300;
                  fVar68 = pfVar300[1];
                  fVar69 = pfVar300[2];
                  fVar70 = pfVar300[3];
                  pfVar300 = (float *)(lVar303 + lVar308);
                  fVar71 = pfVar300[1];
                  fVar72 = pfVar300[2];
                  fVar73 = pfVar300[3];
                  pfVar304 = (float *)(lVar286 + 0x20 + lVar308);
                  fVar504 = *pfVar304;
                  fVar505 = pfVar304[1];
                  fVar509 = pfVar304[2];
                  fVar420 = pfVar304[3];
                  pfVar309 = (float *)(lVar303 + 0x10 + lVar308);
                  fVar74 = pfVar309[1];
                  fVar494 = pfVar309[2];
                  fVar495 = pfVar309[3];
                  pfVar304 = (float *)(lVar306 + lVar308);
                  fVar496 = pfVar304[1];
                  fVar497 = pfVar304[2];
                  fVar325 = pfVar304[3];
                  pfVar282 = (float *)(lVar306 + 0x10 + lVar308);
                  fVar487 = pfVar282[1];
                  fVar488 = pfVar282[2];
                  fVar489 = pfVar282[3];
                  pfVar307 = (float *)(lVar286 + lVar308);
                  fVar490 = pfVar307[1];
                  fVar75 = pfVar307[2];
                  fVar76 = pfVar307[3];
                  pfVar280 = (float *)(lVar286 + 0x10 + lVar308);
                  fVar77 = pfVar280[1];
                  fVar78 = pfVar280[2];
                  fVar79 = pfVar280[3];
                  pfVar2 = (float *)(lVar303 + 0x30 + lVar308);
                  fVar80 = *pfVar2;
                  fVar81 = pfVar2[1];
                  fVar82 = pfVar2[2];
                  fVar83 = pfVar2[3];
                  pfVar2 = (float *)(lVar303 + 0x40 + lVar308);
                  fVar84 = *pfVar2;
                  fVar85 = pfVar2[1];
                  fVar86 = pfVar2[2];
                  fVar333 = pfVar2[3];
                  pfVar2 = (float *)(lVar306 + 0x30 + lVar308);
                  fVar349 = *pfVar2;
                  fVar350 = pfVar2[1];
                  fVar351 = pfVar2[2];
                  fVar352 = pfVar2[3];
                  pfVar2 = (float *)(lVar306 + 0x40 + lVar308);
                  fVar353 = *pfVar2;
                  fVar354 = pfVar2[1];
                  fVar356 = pfVar2[2];
                  fVar357 = pfVar2[3];
                  pfVar2 = (float *)(lVar286 + 0x30 + lVar308);
                  fVar87 = *pfVar2;
                  fVar88 = pfVar2[1];
                  fVar89 = pfVar2[2];
                  fVar90 = pfVar2[3];
                  pfVar2 = (float *)(lVar286 + 0x40 + lVar308);
                  fVar91 = *pfVar2;
                  fVar92 = pfVar2[1];
                  fVar425 = pfVar2[2];
                  fVar426 = pfVar2[3];
                  *(float *)*pauVar298 =
                       fVar322 + fVar60 * *pfVar300 +
                       local_3c8 * *pfVar309 + fVar66 * (float)local_278 +
                       fVar328 * *pfVar304 + fVar372 * *pfVar282 + fVar515 * fVar321 +
                       auVar265._0_4_ * *pfVar307 + local_2f8 * *pfVar280 +
                       fVar504 * (float)local_2b8._0_4_;
                  *(float *)((long)*pauVar298 + 4) =
                       fVar323 + fVar61 * fVar71 + fStack_3c4 * fVar74 + fVar67 * local_278._4_4_ +
                       fVar329 * fVar496 + fVar373 * fVar487 + fVar68 * fVar63 +
                       auVar265._4_4_ * fVar490 + fStack_2f4 * fVar77 +
                       fVar505 * (float)local_2b8._4_4_;
                  *(float *)((long)*pauVar298 + 8) =
                       fVar326 + fVar62 * fVar72 + fStack_3c0 * fVar494 + fVar506 * fStack_270 +
                       fVar332 * fVar497 + fVar374 * fVar488 + fVar69 * fVar64 +
                       auVar265._8_4_ * fVar75 + fStack_2f0 * fVar78 + fVar509 * fStack_2b0;
                  *(float *)((long)*pauVar298 + 0xc) =
                       fVar327 + fVar311 * fVar73 + fStack_3bc * fVar495 + fVar510 * fStack_26c +
                       fVar358 * fVar325 + fVar59 * fVar489 + fVar70 * fVar65 +
                       fStack_38c * fVar76 + fStack_2ec * fVar79 + fVar420 * fStack_2ac;
                  auVar318._0_4_ =
                       fVar66 * fVar60 + fVar322 + fVar504 * auVar265._0_4_ + fVar515 * fVar328 +
                       local_2f8 * fVar87 + fVar372 * fVar349 + local_3c8 * fVar80 +
                       (float)local_2b8._0_4_ * fVar91 +
                       (float)local_278 * fVar84 + fVar321 * fVar353;
                  auVar318._4_4_ =
                       fVar67 * fVar61 + fVar323 + fVar505 * auVar265._4_4_ + fVar68 * fVar329 +
                       fStack_2f4 * fVar88 + fVar373 * fVar350 + fStack_3c4 * fVar81 +
                       (float)local_2b8._4_4_ * fVar92 + local_278._4_4_ * fVar85 + fVar63 * fVar354
                  ;
                  auVar318._8_4_ =
                       fVar506 * fVar62 + fVar326 + fVar509 * auVar265._8_4_ + fVar69 * fVar332 +
                       fStack_2f0 * fVar89 + fVar374 * fVar351 + fStack_3c0 * fVar82 +
                       fStack_2b0 * fVar425 + fStack_270 * fVar86 + fVar64 * fVar356;
                  auVar318._12_4_ =
                       fVar510 * fVar311 + fVar327 + fVar420 * fStack_38c + fVar70 * fVar358 +
                       fStack_2ec * fVar90 + fVar59 * fVar352 + fStack_3bc * fVar83 +
                       fStack_2ac * fVar426 + fStack_26c * fVar333 + fVar65 * fVar357;
                  pauVar298[1] = auVar318;
                  pauVar298 = pauVar298 + 2;
                  lVar308 = lVar308 + 0x40;
                }
                for (; iVar292 < iVar273; iVar292 = iVar292 + 1) {
                  pfVar300 = (float *)(lVar303 + lVar308);
                  pfVar309 = (float *)(lVar303 + 0x10 + lVar308);
                  pfVar282 = (float *)(lVar303 + 0x20 + lVar308);
                  pfVar304 = (float *)(lVar306 + lVar308);
                  pfVar280 = (float *)(lVar306 + 0x10 + lVar308);
                  pfVar2 = (float *)(lVar306 + 0x20 + lVar308);
                  pfVar307 = (float *)(lVar286 + lVar308);
                  pfVar3 = (float *)(lVar286 + 0x10 + lVar308);
                  pfVar4 = (float *)(lVar286 + 0x20 + lVar308);
                  auVar319._0_4_ =
                       fVar322 + fVar60 * *pfVar300 +
                       local_3c8 * *pfVar309 + (float)local_278 * *pfVar282 +
                       fVar321 * *pfVar2 + fVar328 * *pfVar304 + fVar372 * *pfVar280 +
                       local_398 * *pfVar307 + local_2f8 * *pfVar3 +
                       (float)local_2b8._0_4_ * *pfVar4;
                  auVar319._4_4_ =
                       fVar323 + fVar61 * pfVar300[1] +
                       fStack_3c4 * pfVar309[1] + local_278._4_4_ * pfVar282[1] +
                       fVar63 * pfVar2[1] + fVar329 * pfVar304[1] + fVar373 * pfVar280[1] +
                       fStack_394 * pfVar307[1] + fStack_2f4 * pfVar3[1] +
                       (float)local_2b8._4_4_ * pfVar4[1];
                  auVar319._8_4_ =
                       fVar326 + fVar62 * pfVar300[2] +
                       fStack_3c0 * pfVar309[2] + fStack_270 * pfVar282[2] +
                       fVar64 * pfVar2[2] + fVar332 * pfVar304[2] + fVar374 * pfVar280[2] +
                       fStack_390 * pfVar307[2] + fStack_2f0 * pfVar3[2] + fStack_2b0 * pfVar4[2];
                  auVar319._12_4_ =
                       fVar327 + fVar311 * pfVar300[3] +
                       fStack_3bc * pfVar309[3] + fStack_26c * pfVar282[3] +
                       fVar65 * pfVar2[3] + fVar358 * pfVar304[3] + fVar59 * pfVar280[3] +
                       fStack_38c * pfVar307[3] + fStack_2ec * pfVar3[3] + fStack_2ac * pfVar4[3];
                  *pauVar298 = auVar319;
                  pauVar298 = pauVar298 + 1;
                  lVar308 = lVar308 + 0x20;
                }
                lVar303 = lVar303 + lVar305 + lVar308;
                lVar306 = lVar306 + lVar305 + lVar308;
                lVar286 = lVar286 + lVar305 + lVar308;
              }
              local_278 = uVar276;
            }
          }
          goto LAB_003a66c5;
        }
LAB_003a53bc:
        uVar283 = iVar292 * iVar273;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar283,(allocator_type *)&opt_p);
        pp_Var56 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var281 = pp_Var56[-3];
        iVar273 = *(int *)(&this->field_0xe0 + (long)p_Var281);
        iVar292 = *(int *)(&this->field_0xdc + (long)p_Var281);
        iVar278 = *(int *)(&this->field_0xd4 + (long)p_Var281);
        lVar290 = 0;
        iVar285 = 0;
        for (iVar289 = 0; iVar289 < *(int *)(&this->field_0xd8 + (long)p_Var281);
            iVar289 = iVar289 + 1) {
          for (lVar305 = 0; (int)lVar305 < *(int *)(&this->field_0xd4 + (long)p_Var281);
              lVar305 = lVar305 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar290 + lVar305] = iVar285;
            p_Var281 = pp_Var56[-3];
            iVar285 = iVar285 + *(int *)(&this->field_0xdc + (long)p_Var281);
          }
          iVar285 = iVar285 + (iVar271 * iVar273 - iVar292 * iVar278);
          lVar290 = (int)lVar290 + lVar305;
        }
        local_278 = CONCAT44(local_278._4_4_,uVar283 * 4);
        iVar273 = (int)(float)local_2d8 << 2;
        uVar296 = 0;
        uVar294 = (ulong)uVar283;
        if ((int)uVar283 < 1) {
          uVar294 = uVar296;
        }
        uVar276 = (ulong)(uint)local_2f8;
        if ((int)local_2f8 < 1) {
          uVar276 = uVar296;
        }
        local_2f8 = (float)uVar276;
        fStack_2f4 = 0.0;
        auVar320 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar432 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar438._8_4_ = 0x3f800000;
        auVar438._0_8_ = 0x3f8000003f800000;
        auVar438._12_4_ = 0x3f800000;
        for (uVar277 = 0; uVar275 = uVar296, uVar277 != uVar276; uVar277 = uVar277 + 1) {
          iVar278 = (int)uVar275;
          pvVar301 = (void *)(top_blob->cstep * uVar277 * top_blob->elemsize + (long)top_blob->data)
          ;
          local_2b8 = (undefined1  [8])uVar277;
          pvVar279 = (this->weight_data_tm).data;
          for (iVar292 = 0; iVar292 <= (int)local_398; iVar292 = iVar292 + 1) {
            pp_Var56 = this->_vptr_ConvolutionDepthWise_x86_avx;
            for (lVar290 = 0; lVar290 <= iVar284; lVar290 = lVar290 + 1) {
              p_Var281 = pp_Var56[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var281) == 0) {
                auVar341 = ZEXT816(0) << 0x40;
              }
              else {
                auVar341 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x1b0 + (long)p_Var281) + uVar277 * 0x10);
              }
              lVar305 = 0;
              while( true ) {
                fVar428 = auVar341._0_4_;
                fVar322 = auVar341._4_4_;
                fVar323 = auVar341._8_4_;
                fVar326 = auVar341._12_4_;
                if (uVar294 * 4 == lVar305) break;
                pfVar300 = (float *)((long)pvVar279 + lVar305 * 4 + (long)iVar278 * 4);
                pfVar304 = (float *)((long)iVar292 *
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var281) *
                                     (long)iStack_32c * CONCAT44(uStack_344,local_348) +
                                     local_318 * uVar277 * CONCAT44(uStack_344,local_348) +
                                     CONCAT44(fStack_354,local_358) +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var281) *
                                            (int)lVar290 * 4) * 4 +
                                    (long)*(int *)((long)_space_ofs.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar305
                                                  ) * 0x10);
                auVar341._0_4_ = *pfVar300 * *pfVar304 + fVar428;
                auVar341._4_4_ = pfVar300[1] * pfVar304[1] + fVar322;
                auVar341._8_4_ = pfVar300[2] * pfVar304[2] + fVar323;
                auVar341._12_4_ = pfVar300[3] * pfVar304[3] + fVar326;
                lVar305 = lVar305 + 4;
              }
              auVar454 = auVar341;
              if (5 < *(int *)(&this->field_0x110 + (long)p_Var281) - 1U)
              goto switchD_003a560a_caseD_1;
              auVar447 = auVar320._0_16_;
              auVar454 = vmaxps_avx(auVar341,auVar447);
              fVar328 = auVar432._4_4_;
              fVar329 = auVar432._8_4_;
              fVar332 = auVar432._12_4_;
              fVar327 = auVar432._0_4_;
              switch(*(int *)(&this->field_0x110 + (long)p_Var281)) {
              case 2:
                auVar447 = vminps_avx(auVar341,auVar447);
                fVar428 = **(float **)(&this->field_0x118 + (long)p_Var281);
                auVar445._0_4_ = fVar428 * auVar447._0_4_ + auVar454._0_4_;
                auVar445._4_4_ = fVar428 * auVar447._4_4_ + auVar454._4_4_;
                auVar445._8_4_ = fVar428 * auVar447._8_4_ + auVar454._8_4_;
                auVar445._12_4_ = fVar428 * auVar447._12_4_ + auVar454._12_4_;
                auVar454 = auVar445;
                break;
              case 3:
                uVar50 = **(undefined4 **)(&this->field_0x118 + (long)p_Var281);
                auVar451._4_4_ = uVar50;
                auVar451._0_4_ = uVar50;
                auVar451._8_4_ = uVar50;
                auVar451._12_4_ = uVar50;
                uVar50 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var281))[1];
                auVar513._4_4_ = uVar50;
                auVar513._0_4_ = uVar50;
                auVar513._8_4_ = uVar50;
                auVar513._12_4_ = uVar50;
                auVar447 = vmaxps_avx(auVar341,auVar451);
                auVar454 = vminps_avx(auVar513,auVar447);
                break;
              case 4:
                auVar342._0_8_ = auVar341._0_8_ ^ 0x8000000080000000;
                auVar342._8_4_ = -fVar323;
                auVar342._12_4_ = -fVar326;
                auVar366._8_4_ = 0x42b0c0a5;
                auVar366._0_8_ = 0x42b0c0a542b0c0a5;
                auVar366._12_4_ = 0x42b0c0a5;
                auVar447 = vminps_avx(auVar342,auVar366);
                auVar367._8_4_ = 0xc2b0c0a5;
                auVar367._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar367._12_4_ = 0xc2b0c0a5;
                auVar334 = vmaxps_avx(auVar447,auVar367);
                auVar452._0_4_ = auVar334._0_4_ * 1.442695 + fVar327;
                auVar452._4_4_ = auVar334._4_4_ * 1.442695 + fVar328;
                auVar452._8_4_ = auVar334._8_4_ * 1.442695 + fVar329;
                auVar452._12_4_ = auVar334._12_4_ * 1.442695 + fVar332;
                auVar514._0_4_ = (int)auVar452._0_4_;
                auVar514._4_4_ = (int)auVar452._4_4_;
                auVar514._8_4_ = (int)auVar452._8_4_;
                auVar514._12_4_ = (int)auVar452._12_4_;
                auVar508 = vcvtdq2ps_avx(auVar514);
                auVar447 = vcmpps_avx(auVar452,auVar508,1);
                auVar447 = vandps_avx(auVar447,auVar438);
                auVar447 = vsubps_avx(auVar508,auVar447);
                fVar428 = auVar447._0_4_ * -0.6931472 + auVar334._0_4_;
                fVar322 = auVar447._4_4_ * -0.6931472 + auVar334._4_4_;
                fVar323 = auVar447._8_4_ * -0.6931472 + auVar334._8_4_;
                fVar326 = auVar447._12_4_ * -0.6931472 + auVar334._12_4_;
                auVar453._0_4_ = (int)auVar447._0_4_;
                auVar453._4_4_ = (int)auVar447._4_4_;
                auVar453._8_4_ = (int)auVar447._8_4_;
                auVar453._12_4_ = (int)auVar447._12_4_;
                auVar447 = vpslld_avx(auVar453,0x17);
                auVar447 = vpaddd_avx(auVar447,auVar438);
                auVar343._0_4_ =
                     (fVar428 * fVar428 *
                      (((((fVar428 * 0.00019875691 + 0.0013981999) * fVar428 + 0.008333452) *
                         fVar428 + 0.041665796) * fVar428 + 0.16666666) * fVar428 + fVar327) +
                     fVar428 + 1.0) * auVar447._0_4_ + 1.0;
                auVar343._4_4_ =
                     (fVar322 * fVar322 *
                      (((((fVar322 * 0.00019875691 + 0.0013981999) * fVar322 + 0.008333452) *
                         fVar322 + 0.041665796) * fVar322 + 0.16666666) * fVar322 + fVar328) +
                     fVar322 + 1.0) * auVar447._4_4_ + 1.0;
                auVar343._8_4_ =
                     (fVar323 * fVar323 *
                      (((((fVar323 * 0.00019875691 + 0.0013981999) * fVar323 + 0.008333452) *
                         fVar323 + 0.041665796) * fVar323 + 0.16666666) * fVar323 + fVar329) +
                     fVar323 + 1.0) * auVar447._8_4_ + 1.0;
                auVar343._12_4_ =
                     (fVar326 * fVar326 *
                      (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                         fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar332) +
                     fVar326 + 1.0) * auVar447._12_4_ + 1.0;
                auVar447 = vrcpps_avx(auVar343);
                fVar428 = auVar447._0_4_;
                auVar344._0_4_ = auVar343._0_4_ * fVar428;
                fVar322 = auVar447._4_4_;
                auVar344._4_4_ = auVar343._4_4_ * fVar322;
                fVar323 = auVar447._8_4_;
                auVar344._8_4_ = auVar343._8_4_ * fVar323;
                fVar326 = auVar447._12_4_;
                auVar344._12_4_ = auVar343._12_4_ * fVar326;
                auVar447 = vsubps_avx(auVar438,auVar344);
                auVar454._0_4_ = fVar428 + fVar428 * auVar447._0_4_;
                auVar454._4_4_ = fVar322 + fVar322 * auVar447._4_4_;
                auVar454._8_4_ = fVar323 + fVar323 * auVar447._8_4_;
                auVar454._12_4_ = fVar326 + fVar326 * auVar447._12_4_;
                break;
              case 5:
                auVar414._8_4_ = 0x42b0c0a5;
                auVar414._0_8_ = 0x42b0c0a542b0c0a5;
                auVar414._12_4_ = 0x42b0c0a5;
                auVar447 = vminps_avx(auVar341,auVar414);
                auVar470._8_4_ = 0xc2b0c0a5;
                auVar470._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar470._12_4_ = 0xc2b0c0a5;
                auVar334 = vmaxps_avx(auVar470,auVar447);
                auVar507._0_4_ = auVar334._0_4_ * 1.442695 + fVar327;
                auVar507._4_4_ = auVar334._4_4_ * 1.442695 + fVar328;
                auVar507._8_4_ = auVar334._8_4_ * 1.442695 + fVar329;
                auVar507._12_4_ = auVar334._12_4_ * 1.442695 + fVar332;
                auVar511._0_4_ = (int)auVar507._0_4_;
                auVar511._4_4_ = (int)auVar507._4_4_;
                auVar511._8_4_ = (int)auVar507._8_4_;
                auVar511._12_4_ = (int)auVar507._12_4_;
                auVar508 = vcvtdq2ps_avx(auVar511);
                auVar447 = vcmpps_avx(auVar507,auVar508,1);
                auVar447 = vandps_avx(auVar447,auVar438);
                auVar447 = vsubps_avx(auVar508,auVar447);
                auVar512._0_4_ = auVar447._0_4_ * 0.6931472;
                auVar512._4_4_ = auVar447._4_4_ * 0.6931472;
                auVar512._8_4_ = auVar447._8_4_ * 0.6931472;
                auVar512._12_4_ = auVar447._12_4_ * 0.6931472;
                auVar508 = vsubps_avx(auVar334,auVar512);
                fVar358 = auVar508._0_4_;
                fVar372 = auVar508._4_4_;
                fVar373 = auVar508._8_4_;
                fVar374 = auVar508._12_4_;
                auVar446._0_4_ = (int)auVar447._0_4_;
                auVar446._4_4_ = (int)auVar447._4_4_;
                auVar446._8_4_ = (int)auVar447._8_4_;
                auVar446._12_4_ = (int)auVar447._12_4_;
                auVar447 = vpslld_avx(auVar446,0x17);
                auVar447 = vpaddd_avx(auVar447,auVar438);
                auVar448._0_4_ =
                     (fVar358 + 1.0 +
                     fVar358 * fVar358 *
                     (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358
                       + 0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar327)) * auVar447._0_4_
                     + 1.0;
                auVar448._4_4_ =
                     (fVar372 + 1.0 +
                     fVar372 * fVar372 *
                     (((((fVar372 * 0.00019875691 + 0.0013981999) * fVar372 + 0.008333452) * fVar372
                       + 0.041665796) * fVar372 + 0.16666666) * fVar372 + fVar328)) * auVar447._4_4_
                     + 1.0;
                auVar448._8_4_ =
                     (fVar373 + 1.0 +
                     fVar373 * fVar373 *
                     (((((fVar373 * 0.00019875691 + 0.0013981999) * fVar373 + 0.008333452) * fVar373
                       + 0.041665796) * fVar373 + 0.16666666) * fVar373 + fVar329)) * auVar447._8_4_
                     + 1.0;
                auVar448._12_4_ =
                     (fVar374 + 1.0 +
                     fVar374 * fVar374 *
                     (((((fVar374 * 0.00019875691 + 0.0013981999) * fVar374 + 0.008333452) * fVar374
                       + 0.041665796) * fVar374 + 0.16666666) * fVar374 + fVar332)) *
                     auVar447._12_4_ + 1.0;
                auVar361._8_4_ = 0x800000;
                auVar361._0_8_ = 0x80000000800000;
                auVar361._12_4_ = 0x800000;
                auVar447 = vmaxps_avx(auVar448,auVar361);
                auVar508 = vpsrld_avx(auVar447,0x17);
                auVar385._8_4_ = 0xffffff82;
                auVar385._0_8_ = 0xffffff82ffffff82;
                auVar385._12_4_ = 0xffffff82;
                auVar508 = vpaddd_avx(auVar508,auVar385);
                auVar386._8_4_ = 0x807fffff;
                auVar386._0_8_ = 0x807fffff807fffff;
                auVar386._12_4_ = 0x807fffff;
                auVar447 = vandps_avx(auVar447,auVar386);
                auVar359 = vorps_avx(auVar447,auVar432._0_16_);
                auVar334 = vcvtdq2ps_avx(auVar508);
                auVar387._8_4_ = 0x3f3504f3;
                auVar387._0_8_ = 0x3f3504f33f3504f3;
                auVar387._12_4_ = 0x3f3504f3;
                auVar508 = vcmpps_avx(auVar359,auVar387,1);
                auVar447 = vandps_avx(auVar508,auVar359);
                fVar358 = auVar359._0_4_ + -1.0 + auVar447._0_4_;
                fVar372 = auVar359._4_4_ + -1.0 + auVar447._4_4_;
                fVar373 = auVar359._8_4_ + -1.0 + auVar447._8_4_;
                fVar374 = auVar359._12_4_ + -1.0 + auVar447._12_4_;
                auVar447 = vandps_avx(auVar508,auVar438);
                auVar508 = vsubps_avx(auVar334,auVar447);
                auVar447 = vcmpps_avx(auVar448,_DAT_004eb030,2);
                auVar362._0_4_ =
                     (fVar358 * fVar358 *
                      (((((((((fVar358 * 0.070376836 + -0.1151461) * fVar358 + 0.116769984) *
                             fVar358 + -0.12420141) * fVar358 + 0.14249323) * fVar358 + -0.16668057)
                          * fVar358 + 0.20000714) * fVar358 + -0.24999994) * fVar358 + 0.3333333) *
                       fVar358 + -0.5) + auVar508._0_4_ * 0.6931472 + fVar358) * -2.0;
                auVar362._4_4_ =
                     (fVar372 * fVar372 *
                      (((((((((fVar372 * 0.070376836 + -0.1151461) * fVar372 + 0.116769984) *
                             fVar372 + -0.12420141) * fVar372 + 0.14249323) * fVar372 + -0.16668057)
                          * fVar372 + 0.20000714) * fVar372 + -0.24999994) * fVar372 + 0.3333333) *
                       fVar372 + -0.5) + auVar508._4_4_ * 0.6931472 + fVar372) * -2.0;
                auVar362._8_4_ =
                     (fVar373 * fVar373 *
                      (((((((((fVar373 * 0.070376836 + -0.1151461) * fVar373 + 0.116769984) *
                             fVar373 + -0.12420141) * fVar373 + 0.14249323) * fVar373 + -0.16668057)
                          * fVar373 + 0.20000714) * fVar373 + -0.24999994) * fVar373 + 0.3333333) *
                       fVar373 + -0.5) + auVar508._8_4_ * 0.6931472 + fVar373) * -2.0;
                auVar362._12_4_ =
                     (fVar374 * fVar374 *
                      (((((((((fVar374 * 0.070376836 + -0.1151461) * fVar374 + 0.116769984) *
                             fVar374 + -0.12420141) * fVar374 + 0.14249323) * fVar374 + -0.16668057)
                          * fVar374 + 0.20000714) * fVar374 + -0.24999994) * fVar374 + 0.3333333) *
                       fVar374 + -0.5) + auVar508._12_4_ * 0.6931472 + fVar374) * -2.0;
                auVar388._8_4_ = 0x7fffffff;
                auVar388._0_8_ = 0x7fffffff7fffffff;
                auVar388._12_4_ = 0x7fffffff;
                auVar447 = vblendvps_avx(auVar362,auVar388,auVar447);
                auVar389._8_4_ = 0x42b0c0a5;
                auVar389._0_8_ = 0x42b0c0a542b0c0a5;
                auVar389._12_4_ = 0x42b0c0a5;
                auVar447 = vminps_avx(auVar447,auVar389);
                auVar390._8_4_ = 0xc2b0c0a5;
                auVar390._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar390._12_4_ = 0xc2b0c0a5;
                auVar334 = vmaxps_avx(auVar447,auVar390);
                auVar391._0_4_ = auVar334._0_4_ * 1.442695 + fVar327;
                auVar391._4_4_ = auVar334._4_4_ * 1.442695 + fVar328;
                auVar391._8_4_ = auVar334._8_4_ * 1.442695 + fVar329;
                auVar391._12_4_ = auVar334._12_4_ * 1.442695 + fVar332;
                auVar449._0_4_ = (int)auVar391._0_4_;
                auVar449._4_4_ = (int)auVar391._4_4_;
                auVar449._8_4_ = (int)auVar391._8_4_;
                auVar449._12_4_ = (int)auVar391._12_4_;
                auVar508 = vcvtdq2ps_avx(auVar449);
                auVar447 = vcmpps_avx(auVar391,auVar508,1);
                auVar447 = vandps_avx(auVar447,auVar438);
                auVar447 = vsubps_avx(auVar508,auVar447);
                auVar450._0_4_ = auVar447._0_4_ * 0.6931472;
                auVar450._4_4_ = auVar447._4_4_ * 0.6931472;
                auVar450._8_4_ = auVar447._8_4_ * 0.6931472;
                auVar450._12_4_ = auVar447._12_4_ * 0.6931472;
                auVar508 = vsubps_avx(auVar334,auVar450);
                fVar358 = auVar508._0_4_;
                fVar372 = auVar508._4_4_;
                fVar373 = auVar508._8_4_;
                fVar374 = auVar508._12_4_;
                auVar432 = ZEXT1664(auVar432._0_16_);
                auVar320 = ZEXT864(0) << 0x20;
                auVar392._0_4_ = (int)auVar447._0_4_;
                auVar392._4_4_ = (int)auVar447._4_4_;
                auVar392._8_4_ = (int)auVar447._8_4_;
                auVar392._12_4_ = (int)auVar447._12_4_;
                auVar447 = vpslld_avx(auVar392,0x17);
                auVar447 = vpaddd_avx(auVar447,auVar438);
                auVar363._0_4_ =
                     (fVar358 + 1.0 +
                     (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358
                       + 0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar327) *
                     fVar358 * fVar358) * auVar447._0_4_ + 1.0;
                auVar363._4_4_ =
                     (fVar372 + 1.0 +
                     (((((fVar372 * 0.00019875691 + 0.0013981999) * fVar372 + 0.008333452) * fVar372
                       + 0.041665796) * fVar372 + 0.16666666) * fVar372 + fVar328) *
                     fVar372 * fVar372) * auVar447._4_4_ + 1.0;
                auVar363._8_4_ =
                     (fVar373 + 1.0 +
                     (((((fVar373 * 0.00019875691 + 0.0013981999) * fVar373 + 0.008333452) * fVar373
                       + 0.041665796) * fVar373 + 0.16666666) * fVar373 + fVar329) *
                     fVar373 * fVar373) * auVar447._8_4_ + 1.0;
                auVar363._12_4_ =
                     (fVar374 + 1.0 +
                     (((((fVar374 * 0.00019875691 + 0.0013981999) * fVar374 + 0.008333452) * fVar374
                       + 0.041665796) * fVar374 + 0.16666666) * fVar374 + fVar332) *
                     fVar374 * fVar374) * auVar447._12_4_ + 1.0;
                auVar447 = vrcpps_avx(auVar363);
                fVar327 = auVar447._0_4_;
                fVar328 = auVar447._4_4_;
                fVar329 = auVar447._8_4_;
                fVar332 = auVar447._12_4_;
                auVar364._0_4_ = auVar363._0_4_ * (fVar327 + fVar327);
                auVar364._4_4_ = auVar363._4_4_ * (fVar328 + fVar328);
                auVar364._8_4_ = auVar363._8_4_ * (fVar329 + fVar329);
                auVar364._12_4_ = auVar363._12_4_ * (fVar332 + fVar332);
                auVar415._8_4_ = 0x40000000;
                auVar415._0_8_ = 0x4000000040000000;
                auVar415._12_4_ = 0x40000000;
                auVar447 = vsubps_avx(auVar415,auVar364);
                auVar365._0_4_ = fVar327 + fVar327 + -1.0 + fVar327 * auVar447._0_4_;
                auVar365._4_4_ = fVar328 + fVar328 + -1.0 + fVar328 * auVar447._4_4_;
                auVar365._8_4_ = fVar329 + fVar329 + -1.0 + fVar329 * auVar447._8_4_;
                auVar365._12_4_ = fVar332 + fVar332 + -1.0 + fVar332 * auVar447._12_4_;
                goto LAB_003a5a0c;
              case 6:
                fVar327 = **(float **)(&this->field_0x118 + (long)p_Var281);
                fVar328 = (*(float **)(&this->field_0x118 + (long)p_Var281))[1];
                auVar368._0_4_ = fVar327 * fVar428 + fVar328;
                auVar368._4_4_ = fVar327 * fVar322 + fVar328;
                auVar368._8_4_ = fVar327 * fVar323 + fVar328;
                auVar368._12_4_ = fVar327 * fVar326 + fVar328;
                auVar447 = vmaxps_avx(auVar368,auVar447);
                auVar365 = vminps_avx(auVar447,auVar438);
LAB_003a5a0c:
                auVar454._0_4_ = auVar365._0_4_ * fVar428;
                auVar454._4_4_ = auVar365._4_4_ * fVar322;
                auVar454._8_4_ = auVar365._8_4_ * fVar323;
                auVar454._12_4_ = auVar365._12_4_ * fVar326;
              }
switchD_003a560a_caseD_1:
              *(undefined1 (*) [16])((long)pvVar301 + lVar290 * 0x10) = auVar454;
            }
            pvVar301 = (void *)((long)pvVar301 + (long)iVar273 * 4);
          }
          uVar296 = (ulong)(iVar278 + uVar283 * 4);
          local_2d8 = uVar275;
        }
      }
      else {
        if (iVar273 != 8) goto LAB_003a459b;
        iVar273 = *(int *)(&this->field_0xd4 + (long)p_Var281);
        iVar292 = *(int *)(&this->field_0xd8 + (long)p_Var281);
        if (iVar273 == 5) {
          if (iVar292 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var281) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var281) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var281) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var281) == 1)))) {
              uVar294 = 0;
              uVar296 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar296 = uVar294;
              }
              lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
              uVar276 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar276 = uVar294;
              }
              uVar277 = (ulong)(uint)local_320;
              if ((int)local_320 < 1) {
                uVar277 = uVar294;
              }
              for (; local_258 = CONCAT44(local_258._4_4_,(float)local_258),
                  local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar294 != uVar277;
                  uVar294 = uVar294 + 1) {
                if (lVar290 == 0) {
                  fVar428 = 0.0;
                  fVar322 = 0.0;
                  fVar323 = 0.0;
                  fVar326 = 0.0;
                  fVar327 = 0.0;
                  fVar328 = 0.0;
                  fVar329 = 0.0;
                  fVar332 = 0.0;
                }
                else {
                  pfVar300 = (float *)(lVar290 + uVar294 * 0x20);
                  fVar323 = *pfVar300;
                  fVar326 = pfVar300[1];
                  fVar428 = pfVar300[2];
                  fVar322 = pfVar300[3];
                  fVar327 = pfVar300[4];
                  fVar328 = pfVar300[5];
                  fVar329 = pfVar300[6];
                  fVar332 = pfVar300[7];
                }
                pvVar279 = (void *)(top_blob->cstep * uVar294 * top_blob->elemsize +
                                   (long)top_blob->data);
                pvVar301 = (this->weight_data_tm).data;
                lVar308 = (long)(this->weight_data_tm).w * uVar294 * (this->weight_data_tm).elemsize
                ;
                lVar303 = local_318 * uVar294 * CONCAT44(uStack_344,local_348) +
                          CONCAT44(fStack_354,local_358);
                lVar286 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
                lVar305 = lVar303 + lVar286;
                lVar306 = lVar303 + lVar286 * 2;
                lVar295 = lVar286 * 3 + lVar303;
                lVar286 = lVar303 + lVar286 * 4;
                for (iVar273 = 0; iVar273 != (int)uVar276; iVar273 = iVar273 + 1) {
                  lVar291 = 0;
                  uVar275 = uVar296;
                  while (iVar284 = (int)uVar275, uVar275 = (ulong)(iVar284 - 1), iVar284 != 0) {
                    pfVar300 = (float *)((long)pvVar301 + lVar308);
                    fVar358 = pfVar300[1];
                    fVar372 = pfVar300[2];
                    fVar373 = pfVar300[3];
                    fVar374 = pfVar300[4];
                    fVar59 = pfVar300[5];
                    fVar60 = pfVar300[6];
                    fVar61 = pfVar300[7];
                    pfVar280 = (float *)((long)pvVar301 + lVar308 + 0x20);
                    fVar62 = pfVar280[1];
                    fVar311 = pfVar280[2];
                    fVar321 = pfVar280[3];
                    fVar63 = pfVar280[4];
                    fVar64 = pfVar280[5];
                    fVar65 = pfVar280[6];
                    pfVar2 = (float *)((long)pvVar301 + lVar308 + 0x40);
                    fVar66 = pfVar2[1];
                    fVar67 = pfVar2[2];
                    fVar506 = pfVar2[3];
                    fVar510 = pfVar2[4];
                    fVar515 = pfVar2[5];
                    fVar68 = pfVar2[6];
                    pfVar3 = (float *)((long)pvVar301 + lVar308 + 0x60);
                    fVar69 = pfVar3[1];
                    fVar70 = pfVar3[2];
                    fVar71 = pfVar3[3];
                    fVar72 = pfVar3[4];
                    fVar73 = pfVar3[5];
                    fVar74 = pfVar3[6];
                    pfVar304 = (float *)(lVar303 + lVar291);
                    fVar494 = pfVar304[1];
                    fVar495 = pfVar304[2];
                    fVar496 = pfVar304[3];
                    fVar497 = pfVar304[4];
                    fVar325 = pfVar304[5];
                    fVar487 = pfVar304[6];
                    pfVar21 = (float *)((long)pvVar301 + lVar308 + 0x80);
                    fVar488 = pfVar21[1];
                    fVar489 = pfVar21[2];
                    fVar490 = pfVar21[3];
                    fVar75 = pfVar21[4];
                    fVar76 = pfVar21[5];
                    fVar77 = pfVar21[6];
                    pfVar4 = (float *)(lVar303 + 0x20 + lVar291);
                    fVar78 = pfVar4[1];
                    fVar79 = pfVar4[2];
                    fVar80 = pfVar4[3];
                    fVar81 = pfVar4[4];
                    fVar82 = pfVar4[5];
                    fVar83 = pfVar4[6];
                    pfVar5 = (float *)(lVar303 + 0x40 + lVar291);
                    fVar84 = pfVar5[1];
                    fVar85 = pfVar5[2];
                    fVar86 = pfVar5[3];
                    fVar333 = pfVar5[4];
                    fVar349 = pfVar5[5];
                    fVar350 = pfVar5[6];
                    fVar377 = pfVar280[7] + pfVar2[7];
                    pfVar13 = (float *)(lVar303 + 0x60 + lVar291);
                    fVar351 = pfVar13[1];
                    fVar352 = pfVar13[2];
                    fVar353 = pfVar13[3];
                    fVar354 = pfVar13[4];
                    fVar356 = pfVar13[5];
                    fVar357 = pfVar13[6];
                    pfVar22 = (float *)(lVar303 + 0x80 + lVar291);
                    fVar87 = pfVar22[1];
                    fVar88 = pfVar22[2];
                    fVar89 = pfVar22[3];
                    fVar90 = pfVar22[4];
                    fVar91 = pfVar22[5];
                    fVar92 = pfVar22[6];
                    pfVar23 = (float *)((long)pvVar301 + lVar308 + 0xa0);
                    fVar425 = pfVar23[1];
                    fVar426 = pfVar23[2];
                    fVar504 = pfVar23[3];
                    fVar505 = pfVar23[4];
                    fVar509 = pfVar23[5];
                    fVar420 = pfVar23[6];
                    fVar422 = pfVar23[7];
                    pfVar24 = (float *)((long)pvVar301 + lVar308 + 0xc0);
                    fVar427 = pfVar24[1];
                    fVar93 = pfVar24[2];
                    fVar94 = pfVar24[3];
                    fVar355 = pfVar24[4];
                    fVar411 = pfVar24[5];
                    fVar416 = pfVar24[6];
                    fVar417 = pfVar24[7];
                    pfVar25 = (float *)((long)pvVar301 + lVar308 + 0xe0);
                    fVar418 = pfVar25[1];
                    fVar419 = pfVar25[2];
                    fVar421 = pfVar25[3];
                    fVar423 = pfVar25[4];
                    fVar380 = pfVar25[5];
                    fVar430 = pfVar25[6];
                    pfVar26 = (float *)((long)pvVar301 + lVar308 + 0x100);
                    fVar410 = pfVar26[1];
                    fVar429 = pfVar26[2];
                    fVar95 = pfVar26[3];
                    fVar433 = pfVar26[4];
                    fVar468 = pfVar26[5];
                    fVar96 = pfVar26[6];
                    pfVar27 = (float *)((long)pvVar301 + lVar308 + 0x120);
                    fVar97 = pfVar27[1];
                    fVar98 = pfVar27[2];
                    fVar99 = pfVar27[3];
                    fVar100 = pfVar27[4];
                    fVar101 = pfVar27[5];
                    fVar102 = pfVar27[6];
                    pfVar307 = (float *)(lVar305 + lVar291);
                    fVar103 = pfVar307[1];
                    fVar104 = pfVar307[2];
                    fVar105 = pfVar307[3];
                    fVar106 = pfVar307[4];
                    fVar107 = pfVar307[5];
                    fVar108 = pfVar307[6];
                    fVar378 = fVar377 + pfVar2[7] + fVar422;
                    pfVar14 = (float *)(lVar305 + 0x20 + lVar291);
                    fVar330 = pfVar14[1];
                    fVar109 = pfVar14[2];
                    fVar110 = pfVar14[3];
                    fVar111 = pfVar14[4];
                    fVar112 = pfVar14[5];
                    fVar113 = pfVar14[6];
                    pfVar15 = (float *)(lVar305 + 0x40 + lVar291);
                    fVar114 = pfVar15[1];
                    fVar115 = pfVar15[2];
                    fVar116 = pfVar15[3];
                    fVar117 = pfVar15[4];
                    fVar118 = pfVar15[5];
                    fVar119 = pfVar15[6];
                    pfVar16 = (float *)(lVar305 + 0x60 + lVar291);
                    fVar120 = pfVar16[1];
                    fVar121 = pfVar16[2];
                    fVar122 = pfVar16[3];
                    fVar123 = pfVar16[4];
                    fVar124 = pfVar16[5];
                    fVar125 = pfVar16[6];
                    pfVar28 = (float *)(lVar305 + 0x80 + lVar291);
                    fVar126 = pfVar28[1];
                    fVar440 = pfVar28[2];
                    fVar467 = pfVar28[3];
                    fVar127 = pfVar28[4];
                    fVar128 = pfVar28[5];
                    fVar129 = pfVar28[6];
                    pfVar29 = (float *)((long)pvVar301 + lVar308 + 0x140);
                    fVar130 = pfVar29[1];
                    fVar131 = pfVar29[2];
                    fVar132 = pfVar29[3];
                    fVar133 = pfVar29[4];
                    fVar134 = pfVar29[5];
                    fVar135 = pfVar29[6];
                    fVar136 = pfVar29[7];
                    pfVar30 = (float *)((long)pvVar301 + lVar308 + 0x160);
                    fVar137 = pfVar30[1];
                    fVar138 = pfVar30[2];
                    fVar139 = pfVar30[3];
                    fVar140 = pfVar30[4];
                    fVar141 = pfVar30[5];
                    fVar142 = pfVar30[6];
                    fVar143 = pfVar30[7];
                    pfVar31 = (float *)((long)pvVar301 + lVar308 + 0x180);
                    fVar144 = pfVar31[1];
                    fVar145 = pfVar31[2];
                    fVar146 = pfVar31[3];
                    fVar383 = pfVar31[4];
                    fVar399 = pfVar31[5];
                    fVar401 = pfVar31[6];
                    fVar403 = pfVar31[7];
                    pfVar32 = (float *)((long)pvVar301 + lVar308 + 0x1a0);
                    fVar404 = pfVar32[1];
                    fVar405 = pfVar32[2];
                    fVar406 = pfVar32[3];
                    fVar409 = pfVar32[4];
                    fVar441 = pfVar32[5];
                    fVar444 = pfVar32[6];
                    pfVar309 = (float *)(lVar306 + lVar291);
                    fVar457 = pfVar309[1];
                    fVar471 = pfVar309[2];
                    fVar499 = pfVar309[3];
                    fVar462 = pfVar309[4];
                    fVar464 = pfVar309[5];
                    fVar408 = pfVar309[6];
                    pfVar33 = (float *)((long)pvVar301 + lVar308 + 0x1c0);
                    fVar493 = pfVar33[1];
                    fVar503 = pfVar33[2];
                    fVar331 = pfVar33[3];
                    fVar424 = pfVar33[4];
                    fVar147 = pfVar33[5];
                    fVar375 = pfVar33[6];
                    pfVar17 = (float *)(lVar306 + 0x20 + lVar291);
                    fVar407 = pfVar17[1];
                    fVar439 = pfVar17[2];
                    fVar473 = pfVar17[3];
                    fVar475 = pfVar17[4];
                    fVar477 = pfVar17[5];
                    fVar479 = pfVar17[6];
                    pfVar18 = (float *)(lVar306 + 0x40 + lVar291);
                    fVar481 = pfVar18[1];
                    fVar483 = pfVar18[2];
                    fVar485 = pfVar18[3];
                    fVar502 = pfVar18[4];
                    fVar148 = pfVar18[5];
                    fVar149 = pfVar18[6];
                    pfVar19 = (float *)(lVar306 + 0x60 + lVar291);
                    fVar150 = pfVar19[1];
                    fVar151 = pfVar19[2];
                    fVar152 = pfVar19[3];
                    fVar153 = pfVar19[4];
                    fVar154 = pfVar19[5];
                    fVar155 = pfVar19[6];
                    pfVar34 = (float *)(lVar306 + 0x80 + lVar291);
                    fVar156 = pfVar34[1];
                    fVar157 = pfVar34[2];
                    fVar158 = pfVar34[3];
                    fVar376 = pfVar34[4];
                    fVar434 = pfVar34[5];
                    fVar435 = pfVar34[6];
                    pfVar35 = (float *)((long)pvVar301 + lVar308 + 0x1e0);
                    fVar436 = pfVar35[1];
                    fVar469 = pfVar35[2];
                    fVar437 = pfVar35[3];
                    fVar443 = pfVar35[4];
                    fVar456 = pfVar35[5];
                    fVar458 = pfVar35[6];
                    pfVar36 = (float *)((long)pvVar301 + lVar308 + 0x200);
                    fVar459 = pfVar36[1];
                    fVar461 = pfVar36[2];
                    fVar501 = pfVar36[3];
                    fVar382 = pfVar36[4];
                    fVar398 = pfVar36[5];
                    fVar400 = pfVar36[6];
                    fVar402 = pfVar36[7];
                    pfVar37 = (float *)((long)pvVar301 + lVar308 + 0x220);
                    fVar498 = pfVar37[1];
                    fVar442 = pfVar37[2];
                    fVar455 = pfVar37[3];
                    fVar460 = pfVar37[4];
                    fVar463 = pfVar37[5];
                    fVar465 = pfVar37[6];
                    pfVar38 = (float *)((long)pvVar301 + lVar308 + 0x240);
                    fVar466 = pfVar38[1];
                    fVar472 = pfVar38[2];
                    fVar474 = pfVar38[3];
                    fVar476 = pfVar38[4];
                    fVar478 = pfVar38[5];
                    fVar480 = pfVar38[6];
                    pfVar11 = (float *)(lVar295 + lVar291);
                    fVar482 = pfVar11[1];
                    fVar484 = pfVar11[2];
                    fVar486 = pfVar11[3];
                    fVar500 = pfVar11[4];
                    fVar159 = pfVar11[5];
                    fVar160 = pfVar11[6];
                    pfVar39 = (float *)((long)pvVar301 + lVar308 + 0x260);
                    fVar161 = pfVar39[1];
                    fVar162 = pfVar39[2];
                    fVar163 = pfVar39[3];
                    fVar164 = pfVar39[4];
                    fVar165 = pfVar39[5];
                    fVar166 = pfVar39[6];
                    pfVar20 = (float *)(lVar295 + 0x20 + lVar291);
                    fVar167 = pfVar20[1];
                    fVar168 = pfVar20[2];
                    fVar169 = pfVar20[3];
                    fVar170 = pfVar20[4];
                    fVar171 = pfVar20[5];
                    fVar172 = pfVar20[6];
                    pfVar47 = (float *)(lVar295 + 0x40 + lVar291);
                    fVar173 = pfVar47[1];
                    fVar174 = pfVar47[2];
                    fVar175 = pfVar47[3];
                    fVar176 = pfVar47[4];
                    fVar177 = pfVar47[5];
                    fVar178 = pfVar47[6];
                    pfVar48 = (float *)(lVar295 + 0x60 + lVar291);
                    fVar179 = pfVar48[1];
                    fVar180 = pfVar48[2];
                    fVar181 = pfVar48[3];
                    fVar182 = pfVar48[4];
                    fVar183 = pfVar48[5];
                    fVar184 = pfVar48[6];
                    pfVar40 = (float *)(lVar295 + 0x80 + lVar291);
                    fVar185 = pfVar40[1];
                    fVar186 = pfVar40[2];
                    fVar187 = pfVar40[3];
                    fVar188 = pfVar40[4];
                    fVar189 = pfVar40[5];
                    fVar190 = pfVar40[6];
                    pfVar41 = (float *)((long)pvVar301 + lVar308 + 0x280);
                    fVar191 = pfVar41[1];
                    fVar192 = pfVar41[2];
                    fVar193 = pfVar41[3];
                    fVar194 = pfVar41[4];
                    fVar195 = pfVar41[5];
                    fVar196 = pfVar41[6];
                    fVar197 = pfVar41[7];
                    pfVar42 = (float *)((long)pvVar301 + lVar308 + 0x2a0);
                    fVar198 = pfVar42[1];
                    fVar199 = pfVar42[2];
                    fVar200 = pfVar42[3];
                    fVar201 = pfVar42[4];
                    fVar202 = pfVar42[5];
                    fVar203 = pfVar42[6];
                    fVar204 = pfVar42[7];
                    pfVar43 = (float *)((long)pvVar301 + lVar308 + 0x2c0);
                    fVar205 = pfVar43[1];
                    fVar206 = pfVar43[2];
                    fVar207 = pfVar43[3];
                    fVar208 = pfVar43[4];
                    fVar209 = pfVar43[5];
                    fVar210 = pfVar43[6];
                    pfVar44 = (float *)((long)pvVar301 + lVar308 + 0x2e0);
                    fVar211 = pfVar44[1];
                    fVar212 = pfVar44[2];
                    fVar213 = pfVar44[3];
                    fVar214 = pfVar44[4];
                    fVar215 = pfVar44[5];
                    fVar216 = pfVar44[6];
                    pfVar45 = (float *)((long)pvVar301 + lVar308 + 0x300);
                    fVar217 = pfVar45[1];
                    fVar218 = pfVar45[2];
                    fVar219 = pfVar45[3];
                    fVar220 = pfVar45[4];
                    fVar221 = pfVar45[5];
                    fVar222 = pfVar45[6];
                    pfVar12 = (float *)(lVar286 + lVar291);
                    fVar223 = pfVar12[1];
                    fVar224 = pfVar12[2];
                    fVar225 = pfVar12[3];
                    fVar226 = pfVar12[4];
                    fVar227 = pfVar12[5];
                    fVar228 = pfVar12[6];
                    fVar379 = pfVar35[7] + fVar402 + fVar402 + pfVar37[7] + fVar402 + fVar197;
                    pfVar49 = (float *)(lVar286 + 0x20 + lVar291);
                    fVar402 = pfVar49[1];
                    fVar229 = pfVar49[2];
                    fVar230 = pfVar49[3];
                    fVar231 = pfVar49[4];
                    fVar232 = pfVar49[5];
                    fVar233 = pfVar49[6];
                    pfVar7 = (float *)(lVar286 + 0x40 + lVar291);
                    fVar234 = pfVar7[1];
                    fVar235 = pfVar7[2];
                    fVar236 = pfVar7[3];
                    fVar237 = pfVar7[4];
                    fVar238 = pfVar7[5];
                    fVar239 = pfVar7[6];
                    pfVar8 = (float *)(lVar286 + 0x60 + lVar291);
                    fVar240 = pfVar8[1];
                    fVar241 = pfVar8[2];
                    fVar242 = pfVar8[3];
                    fVar243 = pfVar8[4];
                    fVar244 = pfVar8[5];
                    fVar245 = pfVar8[6];
                    pfVar46 = (float *)(lVar286 + 0x80 + lVar291);
                    fVar246 = pfVar46[1];
                    fVar247 = pfVar46[2];
                    fVar248 = pfVar46[3];
                    fVar249 = pfVar46[4];
                    fVar250 = pfVar46[5];
                    fVar251 = pfVar46[6];
                    pfVar282 = (float *)((long)pvVar279 + lVar291);
                    *pfVar282 = *pfVar300 * *pfVar304 + fVar323 +
                                *pfVar280 * *pfVar4 + *pfVar2 * *pfVar5 +
                                *pfVar3 * *pfVar13 + *pfVar21 * *pfVar22 + *pfVar23 * *pfVar307 +
                                *pfVar24 * *pfVar14 + *pfVar25 * *pfVar15 + *pfVar26 * *pfVar16 +
                                *pfVar27 * *pfVar28 +
                                *pfVar29 * *pfVar309 + *pfVar30 * *pfVar17 + *pfVar31 * *pfVar18 +
                                *pfVar32 * *pfVar19 + *pfVar33 * *pfVar34 +
                                *pfVar35 * *pfVar11 + *pfVar36 * *pfVar20 + *pfVar37 * *pfVar47 +
                                *pfVar38 * *pfVar48 + *pfVar39 * *pfVar40 + *pfVar41 * *pfVar12 +
                                *pfVar42 * *pfVar49 + *pfVar43 * *pfVar7 + *pfVar44 * *pfVar8 +
                                *pfVar45 * *pfVar46;
                    pfVar282[1] = fVar358 * fVar494 + fVar326 + fVar62 * fVar78 + fVar66 * fVar84 +
                                  fVar69 * fVar351 + fVar488 * fVar87 + fVar425 * fVar103 +
                                  fVar427 * fVar330 + fVar418 * fVar114 + fVar410 * fVar120 +
                                  fVar97 * fVar126 +
                                  fVar130 * fVar457 + fVar137 * fVar407 + fVar144 * fVar481 +
                                  fVar404 * fVar150 + fVar493 * fVar156 +
                                  fVar436 * fVar482 + fVar459 * fVar167 + fVar498 * fVar173 +
                                  fVar466 * fVar179 + fVar161 * fVar185 + fVar191 * fVar223 +
                                  fVar198 * fVar402 + fVar205 * fVar234 + fVar211 * fVar240 +
                                  fVar217 * fVar246;
                    pfVar282[2] = fVar372 * fVar495 + fVar428 + fVar311 * fVar79 + fVar67 * fVar85 +
                                  fVar70 * fVar352 + fVar489 * fVar88 + fVar426 * fVar104 +
                                  fVar93 * fVar109 + fVar419 * fVar115 + fVar429 * fVar121 +
                                  fVar98 * fVar440 +
                                  fVar131 * fVar471 + fVar138 * fVar439 + fVar145 * fVar483 +
                                  fVar405 * fVar151 + fVar503 * fVar157 +
                                  fVar469 * fVar484 + fVar461 * fVar168 + fVar442 * fVar174 +
                                  fVar472 * fVar180 + fVar162 * fVar186 + fVar192 * fVar224 +
                                  fVar199 * fVar229 + fVar206 * fVar235 + fVar212 * fVar241 +
                                  fVar218 * fVar247;
                    pfVar282[3] = fVar373 * fVar496 + fVar322 + fVar321 * fVar80 + fVar506 * fVar86
                                  + fVar71 * fVar353 + fVar490 * fVar89 + fVar504 * fVar105 +
                                  fVar94 * fVar110 + fVar421 * fVar116 + fVar95 * fVar122 +
                                  fVar99 * fVar467 +
                                  fVar132 * fVar499 + fVar139 * fVar473 + fVar146 * fVar485 +
                                  fVar406 * fVar152 + fVar331 * fVar158 +
                                  fVar437 * fVar486 + fVar501 * fVar169 + fVar455 * fVar175 +
                                  fVar474 * fVar181 + fVar163 * fVar187 + fVar193 * fVar225 +
                                  fVar200 * fVar230 + fVar207 * fVar236 + fVar213 * fVar242 +
                                  fVar219 * fVar248;
                    pfVar282[4] = fVar374 * fVar497 + fVar327 + fVar63 * fVar81 + fVar510 * fVar333
                                  + fVar72 * fVar354 + fVar75 * fVar90 + fVar505 * fVar106 +
                                  fVar355 * fVar111 + fVar423 * fVar117 + fVar433 * fVar123 +
                                  fVar100 * fVar127 +
                                  fVar133 * fVar462 + fVar140 * fVar475 + fVar383 * fVar502 +
                                  fVar409 * fVar153 + fVar424 * fVar376 +
                                  fVar443 * fVar500 + fVar382 * fVar170 + fVar460 * fVar176 +
                                  fVar476 * fVar182 + fVar164 * fVar188 + fVar194 * fVar226 +
                                  fVar201 * fVar231 + fVar208 * fVar237 + fVar214 * fVar243 +
                                  fVar220 * fVar249;
                    pfVar282[5] = fVar59 * fVar325 + fVar328 + fVar64 * fVar82 + fVar515 * fVar349 +
                                  fVar73 * fVar356 + fVar76 * fVar91 + fVar509 * fVar107 +
                                  fVar411 * fVar112 + fVar380 * fVar118 + fVar468 * fVar124 +
                                  fVar101 * fVar128 +
                                  fVar134 * fVar464 + fVar141 * fVar477 + fVar399 * fVar148 +
                                  fVar441 * fVar154 + fVar147 * fVar434 +
                                  fVar456 * fVar159 + fVar398 * fVar171 + fVar463 * fVar177 +
                                  fVar478 * fVar183 + fVar165 * fVar189 + fVar195 * fVar227 +
                                  fVar202 * fVar232 + fVar209 * fVar238 + fVar215 * fVar244 +
                                  fVar221 * fVar250;
                    pfVar282[6] = fVar60 * fVar487 + fVar329 + fVar65 * fVar83 + fVar68 * fVar350 +
                                  fVar74 * fVar357 + fVar77 * fVar92 + fVar420 * fVar108 +
                                  fVar416 * fVar113 + fVar430 * fVar119 + fVar96 * fVar125 +
                                  fVar102 * fVar129 +
                                  fVar135 * fVar408 + fVar142 * fVar479 + fVar401 * fVar149 +
                                  fVar444 * fVar155 + fVar375 * fVar435 +
                                  fVar458 * fVar160 + fVar400 * fVar172 + fVar465 * fVar178 +
                                  fVar480 * fVar184 + fVar166 * fVar190 + fVar196 * fVar228 +
                                  fVar203 * fVar233 + fVar210 * fVar239 + fVar216 * fVar245 +
                                  fVar222 * fVar251;
                    pfVar282[7] = fVar61 + fVar332 + fVar377 + fVar378 +
                                  fVar378 + fVar422 + fVar417 + fVar422 +
                                  fVar136 + fVar143 + fVar143 + fVar403 + fVar143 + fVar379 +
                                  fVar379 + fVar197 + fVar204 + fVar197;
                    lVar291 = lVar291 + 0x20;
                  }
                  lVar303 = lVar303 + lVar291 + 0x80;
                  lVar305 = lVar305 + lVar291 + 0x80;
                  lVar306 = lVar306 + lVar291 + 0x80;
                  lVar295 = lVar295 + lVar291 + 0x80;
                  lVar286 = lVar286 + lVar291 + 0x80;
                  pvVar279 = (void *)((long)pvVar279 + lVar291);
                }
              }
            }
            else {
              iVar292 = 5;
              if (((*(int *)(&this->field_0xdc + (long)p_Var281) != 1) ||
                  (*(int *)(&this->field_0xe0 + (long)p_Var281) != 1)) ||
                 ((*(int *)(&this->field_0xe4 + (long)p_Var281) != 2 ||
                  (*(int *)(&this->field_0xe8 + (long)p_Var281) != 2)))) goto LAB_003a6352;
              iVar273 = top_blob->w;
              iVar284 = iStack_32c - iVar273;
              lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
              uVar296 = 0;
              if (iVar273 < 1) {
                iVar273 = 0;
              }
              uVar294 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar294 = uVar296;
              }
              uVar276 = (ulong)(uint)local_320;
              if ((int)local_320 < 1) {
                uVar276 = uVar296;
              }
              lVar305 = (long)(iVar284 * 0x10) * 4;
              for (; local_258 = CONCAT44(local_258._4_4_,(float)local_258),
                  local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar296 != uVar276;
                  uVar296 = uVar296 + 1) {
                if (lVar290 == 0) {
                  fVar428 = 0.0;
                  fVar322 = 0.0;
                  fVar323 = 0.0;
                  fVar326 = 0.0;
                  fVar327 = 0.0;
                  fVar328 = 0.0;
                  fVar329 = 0.0;
                  fVar332 = 0.0;
                }
                else {
                  pfVar300 = (float *)(lVar290 + uVar296 * 0x20);
                  fVar323 = *pfVar300;
                  fVar326 = pfVar300[1];
                  fVar428 = pfVar300[2];
                  fVar322 = pfVar300[3];
                  fVar327 = pfVar300[4];
                  fVar328 = pfVar300[5];
                  fVar329 = pfVar300[6];
                  fVar332 = pfVar300[7];
                }
                pfVar300 = (float *)(top_blob->cstep * uVar296 * top_blob->elemsize +
                                    (long)top_blob->data);
                pvVar301 = (this->weight_data_tm).data;
                lVar295 = (long)(this->weight_data_tm).w * uVar296 * (this->weight_data_tm).elemsize
                ;
                lVar308 = local_318 * uVar296 * CONCAT44(uStack_344,local_348) +
                          CONCAT44(fStack_354,local_358);
                lVar303 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
                lVar306 = lVar308 + lVar303;
                lVar286 = lVar308 + lVar303 * 2;
                lVar291 = lVar303 * 3 + lVar308;
                lVar303 = lVar308 + lVar303 * 4;
                for (iVar284 = 0; iVar284 != (int)uVar294; iVar284 = iVar284 + 1) {
                  lVar288 = 0;
                  iVar292 = iVar273;
                  while (bVar310 = iVar292 != 0, iVar292 = iVar292 + -1, bVar310) {
                    pfVar304 = (float *)((long)pvVar301 + lVar295);
                    fVar358 = pfVar304[1];
                    fVar372 = pfVar304[2];
                    fVar373 = pfVar304[3];
                    fVar374 = pfVar304[4];
                    fVar59 = pfVar304[5];
                    fVar60 = pfVar304[6];
                    fVar61 = pfVar304[7];
                    pfVar280 = (float *)((long)pvVar301 + lVar295 + 0x20);
                    fVar62 = pfVar280[1];
                    fVar311 = pfVar280[2];
                    fVar321 = pfVar280[3];
                    fVar63 = pfVar280[4];
                    fVar64 = pfVar280[5];
                    fVar65 = pfVar280[6];
                    pfVar2 = (float *)((long)pvVar301 + lVar295 + 0x40);
                    fVar66 = pfVar2[1];
                    fVar67 = pfVar2[2];
                    fVar506 = pfVar2[3];
                    fVar510 = pfVar2[4];
                    fVar515 = pfVar2[5];
                    fVar68 = pfVar2[6];
                    fVar69 = pfVar2[7];
                    pfVar3 = (float *)((long)pvVar301 + lVar295 + 0x60);
                    fVar70 = pfVar3[1];
                    fVar71 = pfVar3[2];
                    fVar72 = pfVar3[3];
                    fVar73 = pfVar3[4];
                    fVar74 = pfVar3[5];
                    fVar494 = pfVar3[6];
                    pfVar21 = (float *)((long)pvVar301 + lVar295 + 0x80);
                    fVar495 = pfVar21[1];
                    fVar496 = pfVar21[2];
                    fVar497 = pfVar21[3];
                    fVar325 = pfVar21[4];
                    fVar487 = pfVar21[5];
                    fVar488 = pfVar21[6];
                    pfVar307 = (float *)(lVar308 + lVar288);
                    fVar489 = pfVar307[1];
                    fVar490 = pfVar307[2];
                    fVar75 = pfVar307[3];
                    fVar76 = pfVar307[4];
                    fVar77 = pfVar307[5];
                    fVar78 = pfVar307[6];
                    pfVar4 = (float *)(lVar308 + 0x20 + lVar288);
                    fVar79 = pfVar4[1];
                    fVar80 = pfVar4[2];
                    fVar81 = pfVar4[3];
                    fVar82 = pfVar4[4];
                    fVar83 = pfVar4[5];
                    fVar84 = pfVar4[6];
                    pfVar5 = (float *)(lVar308 + 0x40 + lVar288);
                    fVar85 = pfVar5[1];
                    fVar86 = pfVar5[2];
                    fVar333 = pfVar5[3];
                    fVar349 = pfVar5[4];
                    fVar350 = pfVar5[5];
                    fVar351 = pfVar5[6];
                    fVar381 = pfVar280[7] + fVar69;
                    pfVar13 = (float *)(lVar308 + 0x60 + lVar288);
                    fVar352 = pfVar13[1];
                    fVar353 = pfVar13[2];
                    fVar354 = pfVar13[3];
                    fVar356 = pfVar13[4];
                    fVar357 = pfVar13[5];
                    fVar87 = pfVar13[6];
                    pfVar22 = (float *)(lVar308 + 0x80 + lVar288);
                    fVar88 = pfVar22[1];
                    fVar89 = pfVar22[2];
                    fVar90 = pfVar22[3];
                    fVar91 = pfVar22[4];
                    fVar92 = pfVar22[5];
                    fVar425 = pfVar22[6];
                    pfVar23 = (float *)((long)pvVar301 + lVar295 + 0xa0);
                    fVar426 = pfVar23[1];
                    fVar504 = pfVar23[2];
                    fVar505 = pfVar23[3];
                    fVar509 = pfVar23[4];
                    fVar420 = pfVar23[5];
                    fVar422 = pfVar23[6];
                    fVar427 = pfVar23[7];
                    pfVar24 = (float *)((long)pvVar301 + lVar295 + 0xc0);
                    fVar93 = pfVar24[1];
                    fVar94 = pfVar24[2];
                    fVar355 = pfVar24[3];
                    fVar411 = pfVar24[4];
                    fVar416 = pfVar24[5];
                    fVar417 = pfVar24[6];
                    fVar418 = pfVar24[7];
                    pfVar25 = (float *)((long)pvVar301 + lVar295 + 0xe0);
                    fVar419 = pfVar25[1];
                    fVar421 = pfVar25[2];
                    fVar423 = pfVar25[3];
                    fVar380 = pfVar25[4];
                    fVar430 = pfVar25[5];
                    fVar410 = pfVar25[6];
                    pfVar26 = (float *)((long)pvVar301 + lVar295 + 0x100);
                    fVar429 = pfVar26[1];
                    fVar95 = pfVar26[2];
                    fVar433 = pfVar26[3];
                    fVar468 = pfVar26[4];
                    fVar96 = pfVar26[5];
                    fVar97 = pfVar26[6];
                    pfVar27 = (float *)((long)pvVar301 + lVar295 + 0x120);
                    fVar98 = pfVar27[1];
                    fVar99 = pfVar27[2];
                    fVar100 = pfVar27[3];
                    fVar101 = pfVar27[4];
                    fVar102 = pfVar27[5];
                    fVar103 = pfVar27[6];
                    pfVar309 = (float *)(lVar306 + lVar288);
                    fVar104 = pfVar309[1];
                    fVar105 = pfVar309[2];
                    fVar106 = pfVar309[3];
                    fVar107 = pfVar309[4];
                    fVar108 = pfVar309[5];
                    fVar330 = pfVar309[6];
                    pfVar14 = (float *)(lVar306 + 0x20 + lVar288);
                    fVar109 = pfVar14[1];
                    fVar110 = pfVar14[2];
                    fVar111 = pfVar14[3];
                    fVar112 = pfVar14[4];
                    fVar113 = pfVar14[5];
                    fVar114 = pfVar14[6];
                    pfVar15 = (float *)(lVar306 + 0x40 + lVar288);
                    fVar115 = pfVar15[1];
                    fVar116 = pfVar15[2];
                    fVar117 = pfVar15[3];
                    fVar118 = pfVar15[4];
                    fVar119 = pfVar15[5];
                    fVar120 = pfVar15[6];
                    pfVar16 = (float *)(lVar306 + 0x60 + lVar288);
                    fVar121 = pfVar16[1];
                    fVar122 = pfVar16[2];
                    fVar123 = pfVar16[3];
                    fVar124 = pfVar16[4];
                    fVar125 = pfVar16[5];
                    fVar126 = pfVar16[6];
                    pfVar28 = (float *)(lVar306 + 0x80 + lVar288);
                    fVar440 = pfVar28[1];
                    fVar467 = pfVar28[2];
                    fVar127 = pfVar28[3];
                    fVar128 = pfVar28[4];
                    fVar129 = pfVar28[5];
                    fVar130 = pfVar28[6];
                    pfVar29 = (float *)((long)pvVar301 + lVar295 + 0x140);
                    fVar131 = pfVar29[1];
                    fVar132 = pfVar29[2];
                    fVar133 = pfVar29[3];
                    fVar134 = pfVar29[4];
                    fVar135 = pfVar29[5];
                    fVar136 = pfVar29[6];
                    fVar137 = pfVar29[7];
                    pfVar30 = (float *)((long)pvVar301 + lVar295 + 0x160);
                    fVar138 = pfVar30[1];
                    fVar139 = pfVar30[2];
                    fVar140 = pfVar30[3];
                    fVar141 = pfVar30[4];
                    fVar142 = pfVar30[5];
                    fVar143 = pfVar30[6];
                    fVar144 = pfVar30[7];
                    pfVar31 = (float *)((long)pvVar301 + lVar295 + 0x180);
                    fVar145 = pfVar31[1];
                    fVar146 = pfVar31[2];
                    fVar383 = pfVar31[3];
                    fVar399 = pfVar31[4];
                    fVar401 = pfVar31[5];
                    fVar403 = pfVar31[6];
                    fVar404 = pfVar31[7];
                    pfVar32 = (float *)((long)pvVar301 + lVar295 + 0x1a0);
                    fVar405 = pfVar32[1];
                    fVar406 = pfVar32[2];
                    fVar409 = pfVar32[3];
                    fVar441 = pfVar32[4];
                    fVar444 = pfVar32[5];
                    fVar457 = pfVar32[6];
                    pfVar33 = (float *)((long)pvVar301 + lVar295 + 0x1c0);
                    fVar471 = pfVar33[1];
                    fVar499 = pfVar33[2];
                    fVar462 = pfVar33[3];
                    fVar464 = pfVar33[4];
                    fVar408 = pfVar33[5];
                    fVar493 = pfVar33[6];
                    pfVar282 = (float *)(lVar286 + lVar288);
                    fVar503 = pfVar282[1];
                    fVar331 = pfVar282[2];
                    fVar424 = pfVar282[3];
                    fVar147 = pfVar282[4];
                    fVar375 = pfVar282[5];
                    fVar407 = pfVar282[6];
                    pfVar17 = (float *)(lVar286 + 0x20 + lVar288);
                    fVar439 = pfVar17[1];
                    fVar473 = pfVar17[2];
                    fVar475 = pfVar17[3];
                    fVar477 = pfVar17[4];
                    fVar479 = pfVar17[5];
                    fVar481 = pfVar17[6];
                    pfVar18 = (float *)(lVar286 + 0x40 + lVar288);
                    fVar483 = pfVar18[1];
                    fVar485 = pfVar18[2];
                    fVar502 = pfVar18[3];
                    fVar148 = pfVar18[4];
                    fVar149 = pfVar18[5];
                    fVar150 = pfVar18[6];
                    pfVar19 = (float *)(lVar286 + 0x60 + lVar288);
                    fVar151 = pfVar19[1];
                    fVar152 = pfVar19[2];
                    fVar153 = pfVar19[3];
                    fVar154 = pfVar19[4];
                    fVar155 = pfVar19[5];
                    fVar156 = pfVar19[6];
                    pfVar34 = (float *)(lVar286 + 0x80 + lVar288);
                    fVar157 = pfVar34[1];
                    fVar158 = pfVar34[2];
                    fVar376 = pfVar34[3];
                    fVar434 = pfVar34[4];
                    fVar435 = pfVar34[5];
                    fVar436 = pfVar34[6];
                    pfVar35 = (float *)((long)pvVar301 + lVar295 + 0x1e0);
                    fVar469 = pfVar35[1];
                    fVar437 = pfVar35[2];
                    fVar443 = pfVar35[3];
                    fVar456 = pfVar35[4];
                    fVar458 = pfVar35[5];
                    fVar459 = pfVar35[6];
                    fVar461 = pfVar35[7];
                    pfVar36 = (float *)((long)pvVar301 + lVar295 + 0x200);
                    fVar501 = pfVar36[1];
                    fVar382 = pfVar36[2];
                    fVar398 = pfVar36[3];
                    fVar400 = pfVar36[4];
                    fVar402 = pfVar36[5];
                    fVar498 = pfVar36[6];
                    fVar442 = pfVar36[7];
                    pfVar37 = (float *)((long)pvVar301 + lVar295 + 0x220);
                    fVar455 = pfVar37[1];
                    fVar460 = pfVar37[2];
                    fVar463 = pfVar37[3];
                    fVar465 = pfVar37[4];
                    fVar466 = pfVar37[5];
                    fVar472 = pfVar37[6];
                    fVar474 = pfVar37[7];
                    pfVar38 = (float *)((long)pvVar301 + lVar295 + 0x240);
                    fVar476 = pfVar38[1];
                    fVar478 = pfVar38[2];
                    fVar480 = pfVar38[3];
                    fVar482 = pfVar38[4];
                    fVar484 = pfVar38[5];
                    fVar486 = pfVar38[6];
                    pfVar39 = (float *)((long)pvVar301 + lVar295 + 0x260);
                    fVar500 = pfVar39[1];
                    fVar159 = pfVar39[2];
                    fVar160 = pfVar39[3];
                    fVar161 = pfVar39[4];
                    fVar162 = pfVar39[5];
                    fVar163 = pfVar39[6];
                    pfVar11 = (float *)(lVar291 + lVar288);
                    fVar164 = pfVar11[1];
                    fVar165 = pfVar11[2];
                    fVar166 = pfVar11[3];
                    fVar167 = pfVar11[4];
                    fVar168 = pfVar11[5];
                    fVar169 = pfVar11[6];
                    pfVar20 = (float *)(lVar291 + 0x20 + lVar288);
                    fVar170 = pfVar20[1];
                    fVar171 = pfVar20[2];
                    fVar172 = pfVar20[3];
                    fVar173 = pfVar20[4];
                    fVar174 = pfVar20[5];
                    fVar175 = pfVar20[6];
                    pfVar47 = (float *)(lVar291 + 0x40 + lVar288);
                    fVar176 = pfVar47[1];
                    fVar177 = pfVar47[2];
                    fVar178 = pfVar47[3];
                    fVar179 = pfVar47[4];
                    fVar180 = pfVar47[5];
                    fVar181 = pfVar47[6];
                    pfVar48 = (float *)(lVar291 + 0x60 + lVar288);
                    fVar182 = pfVar48[1];
                    fVar183 = pfVar48[2];
                    fVar184 = pfVar48[3];
                    fVar185 = pfVar48[4];
                    fVar186 = pfVar48[5];
                    fVar187 = pfVar48[6];
                    pfVar40 = (float *)(lVar291 + 0x80 + lVar288);
                    fVar188 = pfVar40[1];
                    fVar189 = pfVar40[2];
                    fVar190 = pfVar40[3];
                    fVar191 = pfVar40[4];
                    fVar192 = pfVar40[5];
                    fVar193 = pfVar40[6];
                    pfVar41 = (float *)((long)pvVar301 + lVar295 + 0x280);
                    fVar194 = pfVar41[1];
                    fVar195 = pfVar41[2];
                    fVar196 = pfVar41[3];
                    fVar197 = pfVar41[4];
                    fVar198 = pfVar41[5];
                    fVar199 = pfVar41[6];
                    fVar200 = pfVar41[7];
                    pfVar42 = (float *)((long)pvVar301 + lVar295 + 0x2a0);
                    fVar201 = pfVar42[1];
                    fVar202 = pfVar42[2];
                    fVar203 = pfVar42[3];
                    fVar204 = pfVar42[4];
                    fVar205 = pfVar42[5];
                    fVar206 = pfVar42[6];
                    fVar207 = pfVar42[7];
                    pfVar43 = (float *)((long)pvVar301 + lVar295 + 0x2c0);
                    fVar208 = pfVar43[1];
                    fVar209 = pfVar43[2];
                    fVar210 = pfVar43[3];
                    fVar211 = pfVar43[4];
                    fVar212 = pfVar43[5];
                    fVar213 = pfVar43[6];
                    pfVar44 = (float *)((long)pvVar301 + lVar295 + 0x2e0);
                    fVar214 = pfVar44[1];
                    fVar215 = pfVar44[2];
                    fVar216 = pfVar44[3];
                    fVar217 = pfVar44[4];
                    fVar218 = pfVar44[5];
                    fVar219 = pfVar44[6];
                    pfVar45 = (float *)((long)pvVar301 + lVar295 + 0x300);
                    fVar220 = pfVar45[1];
                    fVar221 = pfVar45[2];
                    fVar222 = pfVar45[3];
                    fVar223 = pfVar45[4];
                    fVar224 = pfVar45[5];
                    fVar225 = pfVar45[6];
                    pfVar12 = (float *)(lVar303 + lVar288);
                    fVar226 = pfVar12[1];
                    fVar227 = pfVar12[2];
                    fVar228 = pfVar12[3];
                    fVar229 = pfVar12[4];
                    fVar230 = pfVar12[5];
                    fVar231 = pfVar12[6];
                    pfVar49 = (float *)(lVar303 + 0x20 + lVar288);
                    fVar232 = pfVar49[1];
                    fVar233 = pfVar49[2];
                    fVar234 = pfVar49[3];
                    fVar235 = pfVar49[4];
                    fVar236 = pfVar49[5];
                    fVar237 = pfVar49[6];
                    pfVar7 = (float *)(lVar303 + 0x40 + lVar288);
                    fVar238 = pfVar7[1];
                    fVar239 = pfVar7[2];
                    fVar240 = pfVar7[3];
                    fVar241 = pfVar7[4];
                    fVar242 = pfVar7[5];
                    fVar243 = pfVar7[6];
                    pfVar8 = (float *)(lVar303 + 0x60 + lVar288);
                    fVar244 = pfVar8[1];
                    fVar245 = pfVar8[2];
                    fVar246 = pfVar8[3];
                    fVar247 = pfVar8[4];
                    fVar248 = pfVar8[5];
                    fVar249 = pfVar8[6];
                    pfVar46 = (float *)(lVar303 + 0x80 + lVar288);
                    fVar250 = pfVar46[1];
                    fVar251 = pfVar46[2];
                    fVar377 = pfVar46[3];
                    fVar378 = pfVar46[4];
                    fVar379 = pfVar46[5];
                    fVar252 = pfVar46[6];
                    *pfVar300 = *pfVar304 * *pfVar307 + fVar323 +
                                *pfVar280 * *pfVar4 + *pfVar2 * *pfVar5 +
                                *pfVar3 * *pfVar13 + *pfVar21 * *pfVar22 + *pfVar23 * *pfVar309 +
                                *pfVar24 * *pfVar14 + *pfVar25 * *pfVar15 + *pfVar26 * *pfVar16 +
                                *pfVar27 * *pfVar28 +
                                *pfVar29 * *pfVar282 + *pfVar30 * *pfVar17 + *pfVar31 * *pfVar18 +
                                *pfVar32 * *pfVar19 + *pfVar33 * *pfVar34 +
                                *pfVar35 * *pfVar11 + *pfVar36 * *pfVar20 + *pfVar37 * *pfVar47 +
                                *pfVar38 * *pfVar48 + *pfVar39 * *pfVar40 + *pfVar41 * *pfVar12 +
                                *pfVar42 * *pfVar49 + *pfVar43 * *pfVar7 + *pfVar44 * *pfVar8 +
                                *pfVar45 * *pfVar46;
                    pfVar300[1] = fVar358 * fVar489 + fVar326 + fVar62 * fVar79 + fVar66 * fVar85 +
                                  fVar70 * fVar352 + fVar495 * fVar88 + fVar426 * fVar104 +
                                  fVar93 * fVar109 + fVar419 * fVar115 + fVar429 * fVar121 +
                                  fVar98 * fVar440 +
                                  fVar131 * fVar503 + fVar138 * fVar439 + fVar145 * fVar483 +
                                  fVar405 * fVar151 + fVar471 * fVar157 +
                                  fVar469 * fVar164 + fVar501 * fVar170 + fVar455 * fVar176 +
                                  fVar476 * fVar182 + fVar500 * fVar188 + fVar194 * fVar226 +
                                  fVar201 * fVar232 + fVar208 * fVar238 + fVar214 * fVar244 +
                                  fVar220 * fVar250;
                    pfVar300[2] = fVar372 * fVar490 + fVar428 + fVar311 * fVar80 + fVar67 * fVar86 +
                                  fVar71 * fVar353 + fVar496 * fVar89 + fVar504 * fVar105 +
                                  fVar94 * fVar110 + fVar421 * fVar116 + fVar95 * fVar122 +
                                  fVar99 * fVar467 +
                                  fVar132 * fVar331 + fVar139 * fVar473 + fVar146 * fVar485 +
                                  fVar406 * fVar152 + fVar499 * fVar158 +
                                  fVar437 * fVar165 + fVar382 * fVar171 + fVar460 * fVar177 +
                                  fVar478 * fVar183 + fVar159 * fVar189 + fVar195 * fVar227 +
                                  fVar202 * fVar233 + fVar209 * fVar239 + fVar215 * fVar245 +
                                  fVar221 * fVar251;
                    pfVar300[3] = fVar373 * fVar75 + fVar322 + fVar321 * fVar81 + fVar506 * fVar333
                                  + fVar72 * fVar354 + fVar497 * fVar90 + fVar505 * fVar106 +
                                  fVar355 * fVar111 + fVar423 * fVar117 + fVar433 * fVar123 +
                                  fVar100 * fVar127 +
                                  fVar133 * fVar424 + fVar140 * fVar475 + fVar383 * fVar502 +
                                  fVar409 * fVar153 + fVar462 * fVar376 +
                                  fVar443 * fVar166 + fVar398 * fVar172 + fVar463 * fVar178 +
                                  fVar480 * fVar184 + fVar160 * fVar190 + fVar196 * fVar228 +
                                  fVar203 * fVar234 + fVar210 * fVar240 + fVar216 * fVar246 +
                                  fVar222 * fVar377;
                    pfVar300[4] = fVar374 * fVar76 + fVar327 + fVar63 * fVar82 + fVar510 * fVar349 +
                                  fVar73 * fVar356 + fVar325 * fVar91 + fVar509 * fVar107 +
                                  fVar411 * fVar112 + fVar380 * fVar118 + fVar468 * fVar124 +
                                  fVar101 * fVar128 +
                                  fVar134 * fVar147 + fVar141 * fVar477 + fVar399 * fVar148 +
                                  fVar441 * fVar154 + fVar464 * fVar434 +
                                  fVar456 * fVar167 + fVar400 * fVar173 + fVar465 * fVar179 +
                                  fVar482 * fVar185 + fVar161 * fVar191 + fVar197 * fVar229 +
                                  fVar204 * fVar235 + fVar211 * fVar241 + fVar217 * fVar247 +
                                  fVar223 * fVar378;
                    pfVar300[5] = fVar59 * fVar77 + fVar328 + fVar64 * fVar83 + fVar515 * fVar350 +
                                  fVar74 * fVar357 + fVar487 * fVar92 + fVar420 * fVar108 +
                                  fVar416 * fVar113 + fVar430 * fVar119 + fVar96 * fVar125 +
                                  fVar102 * fVar129 +
                                  fVar135 * fVar375 + fVar142 * fVar479 + fVar401 * fVar149 +
                                  fVar444 * fVar155 + fVar408 * fVar435 +
                                  fVar458 * fVar168 + fVar402 * fVar174 + fVar466 * fVar180 +
                                  fVar484 * fVar186 + fVar162 * fVar192 + fVar198 * fVar230 +
                                  fVar205 * fVar236 + fVar212 * fVar242 + fVar218 * fVar248 +
                                  fVar224 * fVar379;
                    pfVar300[6] = fVar60 * fVar78 + fVar329 + fVar65 * fVar84 + fVar68 * fVar351 +
                                  fVar494 * fVar87 + fVar488 * fVar425 + fVar422 * fVar330 +
                                  fVar417 * fVar114 + fVar410 * fVar120 + fVar97 * fVar126 +
                                  fVar103 * fVar130 +
                                  fVar136 * fVar407 + fVar143 * fVar481 + fVar403 * fVar150 +
                                  fVar457 * fVar156 + fVar493 * fVar436 +
                                  fVar459 * fVar169 + fVar498 * fVar175 + fVar472 * fVar181 +
                                  fVar486 * fVar187 + fVar163 * fVar193 + fVar199 * fVar231 +
                                  fVar206 * fVar237 + fVar213 * fVar243 + fVar219 * fVar249 +
                                  fVar225 * fVar252;
                    pfVar300[7] = fVar61 + fVar332 + fVar381 + fVar69 + fVar381 + fVar427 +
                                  fVar427 + fVar418 + fVar427 + fVar427 +
                                  fVar137 + fVar144 + fVar404 + fVar144 + fVar144 +
                                  fVar461 + fVar442 + fVar474 + fVar442 + fVar442 + fVar200 +
                                  fVar200 + fVar207 + fVar200 + fVar200;
                    pfVar300 = pfVar300 + 8;
                    lVar288 = lVar288 + 0x40;
                  }
                  lVar308 = lVar308 + lVar305 + lVar288;
                  lVar306 = lVar306 + lVar305 + lVar288;
                  lVar286 = lVar286 + lVar305 + lVar288;
                  lVar291 = lVar291 + lVar305 + lVar288;
                  lVar303 = lVar303 + lVar305 + lVar288;
                }
              }
            }
            goto LAB_003a66c5;
          }
        }
        else if ((iVar273 == 3) && (iVar292 == 3)) {
          if ((*(int *)(&this->field_0xdc + (long)p_Var281) == 1) &&
             (((*(int *)(&this->field_0xe0 + (long)p_Var281) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var281) == 1)) &&
              (*(int *)(&this->field_0xe8 + (long)p_Var281) == 1)))) {
            iVar273 = top_blob->w;
            iVar284 = top_blob->h;
            local_298 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
            uVar296 = 0;
            local_288 = (ulong)(uint)local_320;
            if ((int)local_320 < 1) {
              local_288 = uVar296;
            }
            local_258 = (long)(iVar273 * 8) * 4;
            lVar290 = (long)(iStack_32c * 8 + 0x10) * 4;
            for (; local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar296 != local_288;
                uVar296 = uVar296 + 1) {
              if (local_298 == 0) {
                fVar428 = 0.0;
                fVar322 = 0.0;
                fVar323 = 0.0;
                fVar326 = 0.0;
                fVar327 = 0.0;
                fVar328 = 0.0;
                fVar329 = 0.0;
                fVar332 = 0.0;
              }
              else {
                pfVar300 = (float *)(local_298 + uVar296 * 0x20);
                fVar428 = *pfVar300;
                fVar322 = pfVar300[1];
                fVar323 = pfVar300[2];
                fVar326 = pfVar300[3];
                fVar327 = pfVar300[4];
                fVar328 = pfVar300[5];
                fVar329 = pfVar300[6];
                fVar332 = pfVar300[7];
              }
              pvVar302 = (void *)(top_blob->cstep * uVar296 * top_blob->elemsize +
                                 (long)top_blob->data);
              lVar303 = (long)(this->weight_data_tm).w * uVar296 * (this->weight_data_tm).elemsize;
              pvVar301 = (this->weight_data_tm).data;
              pvVar279 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar302);
              local_308._0_4_ = (float)uVar296;
              local_308._4_4_ = (float)(uVar296 >> 0x20);
              lVar308 = local_318 * uVar296 * CONCAT44(uStack_344,local_348) +
                        CONCAT44(fStack_354,local_358);
              lVar286 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
              lVar305 = lVar308 + lVar286;
              lVar306 = lVar308 + lVar286 * 2;
              lVar286 = lVar286 * 3 + lVar308;
              for (uVar283 = 0; (int)(uVar283 | 1) < iVar284; uVar283 = uVar283 + 2) {
                lVar295 = 0;
                for (iVar292 = 0; iVar292 + 3 < iVar273; iVar292 = iVar292 + 4) {
                  pfVar309 = (float *)(lVar308 + 0x20 + lVar295);
                  pfVar307 = (float *)(lVar308 + 0x40 + lVar295);
                  fVar358 = *pfVar307;
                  fVar372 = pfVar307[1];
                  fVar373 = pfVar307[2];
                  fVar374 = pfVar307[3];
                  fVar59 = pfVar307[4];
                  fVar60 = pfVar307[5];
                  fVar61 = pfVar307[6];
                  pfVar300 = (float *)(lVar308 + 0x60 + lVar295);
                  fVar62 = *pfVar300;
                  fVar311 = pfVar300[1];
                  fVar321 = pfVar300[2];
                  fVar63 = pfVar300[3];
                  fVar64 = pfVar300[4];
                  fVar65 = pfVar300[5];
                  fVar66 = pfVar300[6];
                  fVar67 = pfVar300[7];
                  pfVar13 = (float *)(lVar308 + 0x80 + lVar295);
                  pfVar300 = (float *)((long)pvVar301 + lVar303);
                  fVar506 = *pfVar300;
                  fVar510 = pfVar300[1];
                  fVar515 = pfVar300[2];
                  fVar68 = pfVar300[3];
                  fVar69 = pfVar300[4];
                  fVar70 = pfVar300[5];
                  fVar71 = pfVar300[6];
                  pfVar282 = (float *)((long)pvVar301 + lVar303 + 0x20);
                  fVar72 = *pfVar282;
                  fVar73 = pfVar282[1];
                  fVar74 = pfVar282[2];
                  fVar494 = pfVar282[3];
                  fVar495 = pfVar282[4];
                  fVar496 = pfVar282[5];
                  fVar497 = pfVar282[6];
                  pfVar280 = (float *)((long)pvVar301 + lVar303 + 0x40);
                  fVar325 = *pfVar280;
                  fVar487 = pfVar280[1];
                  fVar488 = pfVar280[2];
                  fVar489 = pfVar280[3];
                  fVar490 = pfVar280[4];
                  fVar75 = pfVar280[5];
                  fVar76 = pfVar280[6];
                  pfVar2 = (float *)((long)pvVar301 + lVar303 + 0x60);
                  fVar77 = *pfVar2;
                  fVar78 = pfVar2[1];
                  fVar79 = pfVar2[2];
                  fVar80 = pfVar2[3];
                  fVar81 = pfVar2[4];
                  fVar82 = pfVar2[5];
                  fVar83 = pfVar2[6];
                  pfVar304 = (float *)(lVar308 + lVar295);
                  fStack_2dc = in_register_0000141c + fVar332 + pfVar309[7] + pfVar307[7];
                  fVar330 = in_ZMM9._28_4_ + fVar332 + in_register_0000151c + fStack_2dc;
                  pfVar14 = (float *)(lVar308 + 0xa0 + lVar295);
                  fStack_29c = in_register_000014dc + fVar332 + in_register_0000159c + pfVar307[7];
                  pfVar15 = (float *)((long)pvVar301 + lVar303 + 0x80);
                  fVar84 = *pfVar15;
                  fVar85 = pfVar15[1];
                  fVar86 = pfVar15[2];
                  fVar333 = pfVar15[3];
                  fVar349 = pfVar15[4];
                  fVar350 = pfVar15[5];
                  fVar351 = pfVar15[6];
                  pfVar307 = (float *)(lVar305 + lVar295);
                  fVar352 = *pfVar307;
                  fVar353 = pfVar307[1];
                  fVar354 = pfVar307[2];
                  fVar356 = pfVar307[3];
                  fVar357 = pfVar307[4];
                  fVar87 = pfVar307[5];
                  fVar88 = pfVar307[6];
                  pfVar3 = (float *)(lVar305 + 0x20 + lVar295);
                  fVar89 = *pfVar3;
                  fVar90 = pfVar3[1];
                  fVar91 = pfVar3[2];
                  fVar92 = pfVar3[3];
                  fVar425 = pfVar3[4];
                  fVar426 = pfVar3[5];
                  fVar504 = pfVar3[6];
                  pfVar4 = (float *)(lVar305 + 0x40 + lVar295);
                  fVar505 = *pfVar4;
                  fVar509 = pfVar4[1];
                  fVar420 = pfVar4[2];
                  fVar422 = pfVar4[3];
                  fVar427 = pfVar4[4];
                  fVar93 = pfVar4[5];
                  fVar94 = pfVar4[6];
                  pfVar5 = (float *)(lVar305 + 0x60 + lVar295);
                  fVar355 = *pfVar5;
                  fVar411 = pfVar5[1];
                  fVar416 = pfVar5[2];
                  fVar417 = pfVar5[3];
                  fVar418 = pfVar5[4];
                  fVar419 = pfVar5[5];
                  fVar421 = pfVar5[6];
                  pfVar16 = (float *)(lVar305 + 0x80 + lVar295);
                  fVar423 = *pfVar16;
                  fVar380 = pfVar16[1];
                  fVar430 = pfVar16[2];
                  fVar410 = pfVar16[3];
                  fVar429 = pfVar16[4];
                  fVar95 = pfVar16[5];
                  fVar433 = pfVar16[6];
                  in_register_0000151c = in_register_0000155c + in_register_0000151c;
                  fVar498 = pfVar307[7] + fVar332 + in_register_0000151c;
                  fVar499 = fVar498 + in_register_0000151c;
                  fVar500 = fVar499 + in_register_0000151c;
                  fVar442 = fVar505 * fVar506 + fVar428 + fVar355 * fVar72 + fVar423 * fVar325;
                  fVar455 = fVar509 * fVar510 + fVar322 + fVar411 * fVar73 + fVar380 * fVar487;
                  local_278 = CONCAT44(fVar455,fVar442);
                  fStack_270 = fVar420 * fVar515 + fVar323 + fVar416 * fVar74 + fVar430 * fVar488;
                  fStack_26c = fVar422 * fVar68 + fVar326 + fVar417 * fVar494 + fVar410 * fVar489;
                  fVar460 = fVar427 * fVar69 + fVar327 + fVar418 * fVar495 + fVar429 * fVar490;
                  fVar463 = fVar93 * fVar70 + fVar328 + fVar419 * fVar496 + fVar95 * fVar75;
                  fVar465 = fVar94 * fVar71 + fVar329 + fVar421 * fVar497 + fVar433 * fVar76;
                  fVar466 = in_register_0000151c + fVar332 + fVar500;
                  uStack_268 = CONCAT44(fVar463,fVar460);
                  uStack_260 = CONCAT44(fVar466,fVar465);
                  pfVar307 = (float *)(lVar305 + 0xa0 + lVar295);
                  fVar468 = *pfVar307;
                  fVar96 = pfVar307[1];
                  fVar97 = pfVar307[2];
                  fVar98 = pfVar307[3];
                  fVar99 = pfVar307[4];
                  fVar100 = pfVar307[5];
                  fVar101 = pfVar307[6];
                  fVar424 = pfVar282[7] + pfVar280[7];
                  pfVar280 = (float *)((long)pvVar301 + lVar303 + 0xa0);
                  fVar102 = *pfVar280;
                  fVar103 = pfVar280[1];
                  fVar104 = pfVar280[2];
                  fVar105 = pfVar280[3];
                  fVar106 = pfVar280[4];
                  fVar107 = pfVar280[5];
                  fVar108 = pfVar280[6];
                  local_2f8 = fVar89 * fVar84 + fVar352 * fVar77 + fVar505 * fVar102 +
                              fVar506 * *pfVar304 + fVar428 + *pfVar309 * fVar72 + fVar358 * fVar325
                  ;
                  fStack_2f4 = fVar90 * fVar85 + fVar353 * fVar78 + fVar509 * fVar103 +
                               fVar510 * pfVar304[1] + fVar322 +
                               pfVar309[1] * fVar73 + fVar372 * fVar487;
                  fStack_2f0 = fVar91 * fVar86 + fVar354 * fVar79 + fVar420 * fVar104 +
                               fVar515 * pfVar304[2] + fVar323 +
                               pfVar309[2] * fVar74 + fVar373 * fVar488;
                  fStack_2ec = fVar92 * fVar333 + fVar356 * fVar80 + fVar422 * fVar105 +
                               fVar68 * pfVar304[3] + fVar326 +
                               pfVar309[3] * fVar494 + fVar374 * fVar489;
                  fStack_2e8 = fVar425 * fVar349 + fVar357 * fVar81 + fVar427 * fVar106 +
                               fVar69 * pfVar304[4] + fVar327 +
                               pfVar309[4] * fVar495 + fVar59 * fVar490;
                  fStack_2e4 = fVar426 * fVar350 + fVar87 * fVar82 + fVar93 * fVar107 +
                               fVar70 * pfVar304[5] + fVar328 +
                               pfVar309[5] * fVar496 + fVar60 * fVar75;
                  fStack_2e0 = fVar504 * fVar351 + fVar88 * fVar83 + fVar94 * fVar108 +
                               fVar71 * pfVar304[6] + fVar329 +
                               pfVar309[6] * fVar497 + fVar61 * fVar76;
                  fStack_2dc = in_register_0000141c + fVar332 + fStack_29c + fVar424 + fStack_2dc;
                  fVar382 = fVar89 * fVar77 + fVar505 * fVar84 + fVar355 * fVar102 +
                            *pfVar309 * fVar506 + fVar428 + fVar358 * fVar72 + fVar62 * fVar325;
                  fVar398 = fVar90 * fVar78 + fVar509 * fVar85 + fVar411 * fVar103 +
                            pfVar309[1] * fVar510 + fVar322 + fVar372 * fVar73 + fVar311 * fVar487;
                  fVar400 = fVar91 * fVar79 + fVar420 * fVar86 + fVar416 * fVar104 +
                            pfVar309[2] * fVar515 + fVar323 + fVar373 * fVar74 + fVar321 * fVar488;
                  fVar402 = fVar92 * fVar80 + fVar422 * fVar333 + fVar417 * fVar105 +
                            pfVar309[3] * fVar68 + fVar326 + fVar374 * fVar494 + fVar63 * fVar489;
                  fStack_2c8 = fVar425 * fVar81 + fVar427 * fVar349 + fVar418 * fVar106 +
                               pfVar309[4] * fVar69 + fVar327 + fVar59 * fVar495 + fVar64 * fVar490;
                  fStack_2c4 = fVar426 * fVar82 + fVar93 * fVar350 + fVar419 * fVar107 +
                               pfVar309[5] * fVar70 + fVar328 + fVar60 * fVar496 + fVar65 * fVar75;
                  fStack_2c0 = fVar504 * fVar83 + fVar94 * fVar351 + fVar421 * fVar108 +
                               pfVar309[6] * fVar71 + fVar329 + fVar61 * fVar497 + fVar66 * fVar76;
                  fStack_2bc = fVar67 + fStack_29c + pfVar282[7] + fVar330;
                  local_2d8 = CONCAT44(fVar398,fVar382);
                  uStack_2d0 = CONCAT44(fVar402,fVar400);
                  fVar331 = fStack_29c + fVar67 + pfVar16[7] +
                            in_register_0000149c + fVar332 + in_register_0000155c + fVar330;
                  local_2b8._0_4_ =
                       fVar423 * fVar84 + fVar355 * fVar77 + fVar468 * fVar102 +
                       fVar62 * fVar506 + fVar428 + *pfVar13 * fVar72 + fVar325 * *pfVar14;
                  local_2b8._4_4_ =
                       fVar380 * fVar85 + fVar411 * fVar78 + fVar96 * fVar103 +
                       fVar311 * fVar510 + fVar322 + pfVar13[1] * fVar73 + fVar487 * pfVar14[1];
                  fStack_2b0 = fVar430 * fVar86 + fVar416 * fVar79 + fVar97 * fVar104 +
                               fVar321 * fVar515 + fVar323 +
                               pfVar13[2] * fVar74 + fVar488 * pfVar14[2];
                  fStack_2ac = fVar410 * fVar333 + fVar417 * fVar80 + fVar98 * fVar105 +
                               fVar63 * fVar68 + fVar326 +
                               pfVar13[3] * fVar494 + fVar489 * pfVar14[3];
                  fStack_2a8 = fVar429 * fVar349 + fVar418 * fVar81 + fVar99 * fVar106 +
                               fVar64 * fVar69 + fVar327 +
                               pfVar13[4] * fVar495 + fVar490 * pfVar14[4];
                  fStack_2a4 = fVar95 * fVar350 + fVar419 * fVar82 + fVar100 * fVar107 +
                               fVar65 * fVar70 + fVar328 +
                               pfVar13[5] * fVar496 + fVar75 * pfVar14[5];
                  fStack_2a0 = fVar433 * fVar351 + fVar421 * fVar83 + fVar101 * fVar108 +
                               fVar66 * fVar71 + fVar329 +
                               pfVar13[6] * fVar497 + fVar76 * pfVar14[6];
                  fStack_29c = in_register_0000155c + fVar67 + fVar331 + fStack_29c;
                  pfVar304 = (float *)(lVar306 + lVar295);
                  fVar67 = *pfVar304;
                  fVar330 = pfVar304[1];
                  fVar109 = pfVar304[2];
                  fVar110 = pfVar304[3];
                  fVar111 = pfVar304[4];
                  fVar112 = pfVar304[5];
                  fVar113 = pfVar304[6];
                  fVar114 = pfVar304[7];
                  pfVar304 = (float *)(lVar306 + 0x20 + lVar295);
                  fVar115 = *pfVar304;
                  fVar116 = pfVar304[1];
                  fVar117 = pfVar304[2];
                  fVar118 = pfVar304[3];
                  fVar119 = pfVar304[4];
                  fVar120 = pfVar304[5];
                  fVar121 = pfVar304[6];
                  fVar122 = pfVar304[7];
                  pfVar304 = (float *)(lVar306 + 0x40 + lVar295);
                  fVar123 = *pfVar304;
                  fVar124 = pfVar304[1];
                  fVar125 = pfVar304[2];
                  fVar126 = pfVar304[3];
                  fVar440 = pfVar304[4];
                  fVar467 = pfVar304[5];
                  fVar127 = pfVar304[6];
                  fVar501 = pfVar307[7] + pfVar5[7];
                  pfVar304 = (float *)(lVar306 + 0x60 + lVar295);
                  fVar128 = *pfVar304;
                  fVar129 = pfVar304[1];
                  fVar130 = pfVar304[2];
                  fVar131 = pfVar304[3];
                  fVar132 = pfVar304[4];
                  fVar133 = pfVar304[5];
                  fVar134 = pfVar304[6];
                  pfVar304 = (float *)(lVar306 + 0x80 + lVar295);
                  fVar135 = *pfVar304;
                  fVar136 = pfVar304[1];
                  fVar137 = pfVar304[2];
                  fVar138 = pfVar304[3];
                  fVar139 = pfVar304[4];
                  fVar140 = pfVar304[5];
                  fVar141 = pfVar304[6];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0xc0);
                  fVar142 = *pfVar307;
                  fVar143 = pfVar307[1];
                  fVar144 = pfVar307[2];
                  fVar145 = pfVar307[3];
                  fVar146 = pfVar307[4];
                  fVar383 = pfVar307[5];
                  fVar399 = pfVar307[6];
                  fVar401 = pfVar307[7];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0xe0);
                  fVar403 = *pfVar307;
                  fVar404 = pfVar307[1];
                  fVar405 = pfVar307[2];
                  fVar406 = pfVar307[3];
                  fVar409 = pfVar307[4];
                  fVar441 = pfVar307[5];
                  fVar444 = pfVar307[6];
                  fVar457 = pfVar307[7];
                  fVar500 = fVar500 + fVar114;
                  fVar498 = fVar501 + fVar114 + fVar498;
                  fVar471 = pfVar5[7] + pfVar4[7] + fVar122;
                  fVar472 = fVar115 * fVar77 + fVar123 * fVar84 + fVar128 * fVar102 +
                            fVar505 * fVar72 + fVar355 * fVar325 + fVar89 * fVar506 + fVar428;
                  fVar474 = fVar116 * fVar78 + fVar124 * fVar85 + fVar129 * fVar103 +
                            fVar509 * fVar73 + fVar411 * fVar487 + fVar90 * fVar510 + fVar322;
                  fVar476 = fVar117 * fVar79 + fVar125 * fVar86 + fVar130 * fVar104 +
                            fVar420 * fVar74 + fVar416 * fVar488 + fVar91 * fVar515 + fVar323;
                  fVar478 = fVar118 * fVar80 + fVar126 * fVar333 + fVar131 * fVar105 +
                            fVar422 * fVar494 + fVar417 * fVar489 + fVar92 * fVar68 + fVar326;
                  fVar480 = fVar119 * fVar81 + fVar440 * fVar349 + fVar132 * fVar106 +
                            fVar427 * fVar495 + fVar418 * fVar490 + fVar425 * fVar69 + fVar327;
                  fVar482 = fVar120 * fVar82 + fVar467 * fVar350 + fVar133 * fVar107 +
                            fVar93 * fVar496 + fVar419 * fVar75 + fVar426 * fVar70 + fVar328;
                  fVar484 = fVar121 * fVar83 + fVar127 * fVar351 + fVar134 * fVar108 +
                            fVar94 * fVar497 + fVar421 * fVar76 + fVar504 * fVar71 + fVar329;
                  fVar486 = fVar471 + fVar499 + pfVar3[7] + fVar332;
                  in_ZMM9 = ZEXT3264(CONCAT428(fVar486,CONCAT424(fVar484,CONCAT420(fVar482,CONCAT416
                                                  (fVar480,CONCAT412(fVar478,CONCAT48(fVar476,
                                                  CONCAT44(fVar474,fVar472))))))));
                  fVar466 = fVar471 + pfVar4[7] + fVar466 + fVar466;
                  pfVar307 = (float *)(lVar306 + 0xa0 + lVar295);
                  fVar471 = *pfVar307;
                  fVar499 = pfVar307[1];
                  fVar462 = pfVar307[2];
                  fVar464 = pfVar307[3];
                  fVar408 = pfVar307[4];
                  fVar493 = pfVar307[5];
                  fVar503 = pfVar307[6];
                  fVar501 = fVar501 + pfVar2[7] + pfVar15[7];
                  in_register_0000155c = fVar501 + pfVar300[7] + fVar332 + fVar424;
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x100);
                  fVar156 = *pfVar300;
                  fVar157 = pfVar300[1];
                  fVar158 = pfVar300[2];
                  fVar376 = pfVar300[3];
                  fVar434 = pfVar300[4];
                  fVar435 = pfVar300[5];
                  fVar436 = pfVar300[6];
                  in_register_0000151c = pfVar300[7];
                  fVar501 = fVar500 + fVar501;
                  in_register_0000149c = fVar501 + fStack_2dc;
                  fVar501 = fVar122 + fVar114 + fVar501;
                  in_register_0000135c = fVar501 + fStack_2bc;
                  fVar501 = fVar122 + fVar114 + fVar501;
                  auVar393._0_4_ =
                       fVar128 * fVar403 + fVar123 * fVar142 + fVar135 * fVar156 +
                       fVar505 * fVar77 + fVar355 * fVar84 + fVar102 * fVar423 +
                       fVar358 * fVar506 + fVar428 + fVar62 * fVar72 + *pfVar13 * fVar325;
                  auVar393._4_4_ =
                       fVar129 * fVar404 + fVar124 * fVar143 + fVar136 * fVar157 +
                       fVar509 * fVar78 + fVar411 * fVar85 + fVar103 * fVar380 +
                       fVar372 * fVar510 + fVar322 + fVar311 * fVar73 + pfVar13[1] * fVar487;
                  auVar393._8_4_ =
                       fVar130 * fVar405 + fVar125 * fVar144 + fVar137 * fVar158 +
                       fVar420 * fVar79 + fVar416 * fVar86 + fVar104 * fVar430 +
                       fVar373 * fVar515 + fVar323 + fVar321 * fVar74 + pfVar13[2] * fVar488;
                  auVar393._12_4_ =
                       fVar131 * fVar406 + fVar126 * fVar145 + fVar138 * fVar376 +
                       fVar422 * fVar80 + fVar417 * fVar333 + fVar105 * fVar410 +
                       fVar374 * fVar68 + fVar326 + fVar63 * fVar494 + pfVar13[3] * fVar489;
                  auVar393._16_4_ =
                       fVar132 * fVar409 + fVar440 * fVar146 + fVar139 * fVar434 +
                       fVar427 * fVar81 + fVar418 * fVar349 + fVar106 * fVar429 +
                       fVar59 * fVar69 + fVar327 + fVar64 * fVar495 + pfVar13[4] * fVar490;
                  auVar393._20_4_ =
                       fVar133 * fVar441 + fVar467 * fVar383 + fVar140 * fVar435 +
                       fVar93 * fVar82 + fVar419 * fVar350 + fVar107 * fVar95 +
                       fVar60 * fVar70 + fVar328 + fVar65 * fVar496 + pfVar13[5] * fVar75;
                  auVar393._24_4_ =
                       fVar134 * fVar444 + fVar127 * fVar399 + fVar141 * fVar436 +
                       fVar94 * fVar83 + fVar421 * fVar351 + fVar108 * fVar433 +
                       fVar61 * fVar71 + fVar329 + fVar66 * fVar497 + pfVar13[6] * fVar76;
                  auVar393._28_4_ = fVar501 + fVar331;
                  in_ZMM3 = ZEXT3264(auVar393);
                  pfVar300 = (float *)(lVar286 + 0x20 + lVar295);
                  fVar358 = *pfVar300;
                  fVar372 = pfVar300[1];
                  fVar373 = pfVar300[2];
                  fVar374 = pfVar300[3];
                  fVar59 = pfVar300[4];
                  fVar60 = pfVar300[5];
                  fVar61 = pfVar300[6];
                  fVar62 = pfVar300[7];
                  pfVar300 = (float *)(lVar286 + 0x40 + lVar295);
                  fVar311 = *pfVar300;
                  fVar321 = pfVar300[1];
                  fVar63 = pfVar300[2];
                  fVar64 = pfVar300[3];
                  fVar65 = pfVar300[4];
                  fVar66 = pfVar300[5];
                  fVar331 = pfVar300[6];
                  in_register_0000141c = pfVar300[7];
                  pfVar300 = (float *)(lVar286 + lVar295);
                  fVar424 = *pfVar300;
                  fVar147 = pfVar300[1];
                  fVar375 = pfVar300[2];
                  fVar407 = pfVar300[3];
                  fVar439 = pfVar300[4];
                  fVar473 = pfVar300[5];
                  fVar475 = pfVar300[6];
                  pfVar300 = (float *)(lVar286 + 0x60 + lVar295);
                  fVar469 = *pfVar300;
                  fVar437 = pfVar300[1];
                  fVar443 = pfVar300[2];
                  fVar456 = pfVar300[3];
                  fVar458 = pfVar300[4];
                  fVar459 = pfVar300[5];
                  fVar461 = pfVar300[6];
                  in_register_0000159c = pfVar300[7];
                  in_register_000014dc = pfVar304[7] + fVar500;
                  pfVar300 = (float *)(lVar286 + 0x80 + lVar295);
                  fVar477 = *pfVar300;
                  fVar479 = pfVar300[1];
                  fVar481 = pfVar300[2];
                  fVar483 = pfVar300[3];
                  fVar485 = pfVar300[4];
                  fVar502 = pfVar300[5];
                  fVar148 = pfVar300[6];
                  in_register_0000139c = fVar466 + in_register_0000141c + pfVar304[7] + fVar498;
                  pfVar300 = (float *)(lVar286 + 0xa0 + lVar295);
                  fVar149 = *pfVar300;
                  fVar150 = pfVar300[1];
                  fVar151 = pfVar300[2];
                  fVar152 = pfVar300[3];
                  fVar153 = pfVar300[4];
                  fVar154 = pfVar300[5];
                  fVar155 = pfVar300[6];
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar466,CONCAT424(fVar436 * fVar155,
                                                                 CONCAT420(fVar435 * fVar154,
                                                                           CONCAT416(fVar434 * 
                                                  fVar153,CONCAT412(fVar376 * fVar152,
                                                                    CONCAT48(fVar158 * fVar151,
                                                                             CONCAT44(fVar157 * 
                                                  fVar150,fVar156 * fVar149))))))));
                  pfVar300 = (float *)((long)pvVar302 + lVar295);
                  *pfVar300 = fVar115 * fVar403 + fVar67 * fVar142 + fVar123 * fVar156 + local_2f8;
                  pfVar300[1] = fVar116 * fVar404 + fVar330 * fVar143 + fVar124 * fVar157 +
                                fStack_2f4;
                  pfVar300[2] = fVar117 * fVar405 + fVar109 * fVar144 + fVar125 * fVar158 +
                                fStack_2f0;
                  pfVar300[3] = fVar118 * fVar406 + fVar110 * fVar145 + fVar126 * fVar376 +
                                fStack_2ec;
                  pfVar300[4] = fVar119 * fVar409 + fVar111 * fVar146 + fVar440 * fVar434 +
                                fStack_2e8;
                  pfVar300[5] = fVar120 * fVar441 + fVar112 * fVar383 + fVar467 * fVar435 +
                                fStack_2e4;
                  pfVar300[6] = fVar121 * fVar444 + fVar113 * fVar399 + fVar127 * fVar436 +
                                fStack_2e0;
                  pfVar300[7] = in_register_0000149c;
                  pfVar300 = (float *)((long)pvVar302 + lVar295 + 0x20);
                  *pfVar300 = fVar123 * fVar403 + fVar115 * fVar142 + fVar128 * fVar156 + fVar382;
                  pfVar300[1] = fVar124 * fVar404 + fVar116 * fVar143 + fVar129 * fVar157 + fVar398;
                  pfVar300[2] = fVar125 * fVar405 + fVar117 * fVar144 + fVar130 * fVar158 + fVar400;
                  pfVar300[3] = fVar126 * fVar406 + fVar118 * fVar145 + fVar131 * fVar376 + fVar402;
                  pfVar300[4] = fVar440 * fVar409 + fVar119 * fVar146 + fVar132 * fVar434 +
                                fStack_2c8;
                  pfVar300[5] = fVar467 * fVar441 + fVar120 * fVar383 + fVar133 * fVar435 +
                                fStack_2c4;
                  pfVar300[6] = fVar127 * fVar444 + fVar121 * fVar399 + fVar134 * fVar436 +
                                fStack_2c0;
                  pfVar300[7] = in_register_0000135c;
                  *(undefined1 (*) [32])((long)pvVar302 + lVar295 + 0x40) = auVar393;
                  pfVar300 = (float *)((long)pvVar302 + lVar295 + 0x60);
                  *pfVar300 = fVar135 * fVar403 + fVar128 * fVar142 + fVar471 * fVar156 +
                              (float)local_2b8._0_4_;
                  pfVar300[1] = fVar136 * fVar404 + fVar129 * fVar143 + fVar499 * fVar157 +
                                (float)local_2b8._4_4_;
                  pfVar300[2] = fVar137 * fVar405 + fVar130 * fVar144 + fVar462 * fVar158 +
                                fStack_2b0;
                  pfVar300[3] = fVar138 * fVar406 + fVar131 * fVar145 + fVar464 * fVar376 +
                                fStack_2ac;
                  pfVar300[4] = fVar139 * fVar409 + fVar132 * fVar146 + fVar408 * fVar434 +
                                fStack_2a8;
                  pfVar300[5] = fVar140 * fVar441 + fVar133 * fVar383 + fVar493 * fVar435 +
                                fStack_2a4;
                  pfVar300[6] = fVar141 * fVar444 + fVar134 * fVar399 + fVar503 * fVar436 +
                                fStack_2a0;
                  pfVar300[7] = fVar122 + fVar114 + fVar501 + fStack_29c;
                  pfVar300 = (float *)((long)pvVar279 + lVar295);
                  *pfVar300 = fVar142 * fVar424 + fVar358 * fVar403 + fVar311 * fVar156 +
                              fVar67 * fVar77 + fVar115 * fVar84 + fVar123 * fVar102 +
                              fVar352 * fVar506 + fVar428 + fVar89 * fVar72 + fVar505 * fVar325;
                  pfVar300[1] = fVar143 * fVar147 + fVar372 * fVar404 + fVar321 * fVar157 +
                                fVar330 * fVar78 + fVar116 * fVar85 + fVar124 * fVar103 +
                                fVar353 * fVar510 + fVar322 + fVar90 * fVar73 + fVar509 * fVar487;
                  pfVar300[2] = fVar144 * fVar375 + fVar373 * fVar405 + fVar63 * fVar158 +
                                fVar109 * fVar79 + fVar117 * fVar86 + fVar125 * fVar104 +
                                fVar354 * fVar515 + fVar323 + fVar91 * fVar74 + fVar420 * fVar488;
                  pfVar300[3] = fVar145 * fVar407 + fVar374 * fVar406 + fVar64 * fVar376 +
                                fVar110 * fVar80 + fVar118 * fVar333 + fVar126 * fVar105 +
                                fVar356 * fVar68 + fVar326 + fVar92 * fVar494 + fVar422 * fVar489;
                  pfVar300[4] = fVar146 * fVar439 + fVar59 * fVar409 + fVar65 * fVar434 +
                                fVar111 * fVar81 + fVar119 * fVar349 + fVar440 * fVar106 +
                                fVar357 * fVar69 + fVar327 + fVar425 * fVar495 + fVar427 * fVar490;
                  pfVar300[5] = fVar383 * fVar473 + fVar60 * fVar441 + fVar66 * fVar435 +
                                fVar112 * fVar82 + fVar120 * fVar350 + fVar467 * fVar107 +
                                fVar87 * fVar70 + fVar328 + fVar426 * fVar496 + fVar93 * fVar75;
                  pfVar300[6] = fVar399 * fVar475 + fVar61 * fVar444 + fVar331 * fVar436 +
                                fVar113 * fVar83 + fVar121 * fVar351 + fVar127 * fVar108 +
                                fVar88 * fVar71 + fVar329 + fVar504 * fVar497 + fVar94 * fVar76;
                  pfVar300[7] = fVar500 + fVar62 + fVar457 + fVar498;
                  pfVar300 = (float *)((long)pvVar279 + lVar295 + 0x20);
                  *pfVar300 = fVar472 + fVar358 * fVar142 + fVar311 * fVar403 + fVar469 * fVar156;
                  pfVar300[1] = fVar474 + fVar372 * fVar143 + fVar321 * fVar404 + fVar437 * fVar157;
                  pfVar300[2] = fVar476 + fVar373 * fVar144 + fVar63 * fVar405 + fVar443 * fVar158;
                  pfVar300[3] = fVar478 + fVar374 * fVar145 + fVar64 * fVar406 + fVar456 * fVar376;
                  pfVar300[4] = fVar480 + fVar59 * fVar146 + fVar65 * fVar409 + fVar458 * fVar434;
                  pfVar300[5] = fVar482 + fVar60 * fVar383 + fVar66 * fVar441 + fVar459 * fVar435;
                  pfVar300[6] = fVar484 + fVar61 * fVar399 + fVar331 * fVar444 + fVar461 * fVar436;
                  pfVar300[7] = fVar486 + in_register_000014dc + fVar500 + fVar62;
                  pfVar300 = (float *)((long)pvVar279 + lVar295 + 0x40);
                  *pfVar300 = fVar135 * fVar102 + fVar123 * fVar77 + fVar128 * fVar84 + fVar442 +
                              fVar477 * fVar156 + fVar311 * fVar142 + fVar469 * fVar403;
                  pfVar300[1] = fVar136 * fVar103 + fVar124 * fVar78 + fVar129 * fVar85 + fVar455 +
                                fVar479 * fVar157 + fVar321 * fVar143 + fVar437 * fVar404;
                  pfVar300[2] = fVar137 * fVar104 + fVar125 * fVar79 + fVar130 * fVar86 + fStack_270
                                + fVar481 * fVar158 + fVar63 * fVar144 + fVar443 * fVar405;
                  pfVar300[3] = fVar138 * fVar105 + fVar126 * fVar80 + fVar131 * fVar333 +
                                fStack_26c +
                                fVar483 * fVar376 + fVar64 * fVar145 + fVar456 * fVar406;
                  pfVar300[4] = fVar139 * fVar106 + fVar440 * fVar81 + fVar132 * fVar349 + fVar460 +
                                fVar485 * fVar434 + fVar65 * fVar146 + fVar458 * fVar409;
                  pfVar300[5] = fVar140 * fVar107 + fVar467 * fVar82 + fVar133 * fVar350 + fVar463 +
                                fVar502 * fVar435 + fVar66 * fVar383 + fVar459 * fVar441;
                  pfVar300[6] = fVar141 * fVar108 + fVar127 * fVar83 + fVar134 * fVar351 + fVar465 +
                                fVar148 * fVar436 + fVar331 * fVar399 + fVar461 * fVar444;
                  pfVar300[7] = in_register_0000139c;
                  pfVar300 = (float *)((long)pvVar279 + lVar295 + 0x60);
                  *pfVar300 = fVar471 * fVar102 + fVar128 * fVar77 + fVar135 * fVar84 +
                              fVar355 * fVar506 + fVar428 + fVar423 * fVar72 + fVar468 * fVar325 +
                              fVar469 * fVar142 + fVar477 * fVar403 + fVar156 * fVar149;
                  pfVar300[1] = fVar499 * fVar103 + fVar129 * fVar78 + fVar136 * fVar85 +
                                fVar411 * fVar510 + fVar322 + fVar380 * fVar73 + fVar96 * fVar487 +
                                fVar437 * fVar143 + fVar479 * fVar404 + fVar157 * fVar150;
                  pfVar300[2] = fVar462 * fVar104 + fVar130 * fVar79 + fVar137 * fVar86 +
                                fVar416 * fVar515 + fVar323 + fVar430 * fVar74 + fVar97 * fVar488 +
                                fVar443 * fVar144 + fVar481 * fVar405 + fVar158 * fVar151;
                  pfVar300[3] = fVar464 * fVar105 + fVar131 * fVar80 + fVar138 * fVar333 +
                                fVar417 * fVar68 + fVar326 + fVar410 * fVar494 + fVar98 * fVar489 +
                                fVar456 * fVar145 + fVar483 * fVar406 + fVar376 * fVar152;
                  pfVar300[4] = fVar408 * fVar106 + fVar132 * fVar81 + fVar139 * fVar349 +
                                fVar418 * fVar69 + fVar327 + fVar429 * fVar495 + fVar99 * fVar490 +
                                fVar458 * fVar146 + fVar485 * fVar409 + fVar434 * fVar153;
                  pfVar300[5] = fVar493 * fVar107 + fVar133 * fVar82 + fVar140 * fVar350 +
                                fVar419 * fVar70 + fVar328 + fVar95 * fVar496 + fVar100 * fVar75 +
                                fVar459 * fVar383 + fVar502 * fVar441 + fVar435 * fVar154;
                  pfVar300[6] = fVar503 * fVar108 + fVar134 * fVar83 + fVar141 * fVar351 +
                                fVar421 * fVar71 + fVar329 + fVar433 * fVar497 + fVar101 * fVar76 +
                                fVar461 * fVar399 + fVar148 * fVar444 + fVar436 * fVar155;
                  pfVar300[7] = in_register_0000155c + fVar401 + fVar457 + fVar466;
                  lVar295 = lVar295 + 0x80;
                }
                for (; iVar292 + 1 < iVar273; iVar292 = iVar292 + 2) {
                  pfVar309 = (float *)(lVar308 + 0x20 + lVar295);
                  fVar358 = pfVar309[1];
                  fVar372 = pfVar309[2];
                  fVar373 = pfVar309[3];
                  fVar374 = pfVar309[4];
                  fVar59 = pfVar309[5];
                  fVar60 = pfVar309[6];
                  pfVar282 = (float *)(lVar308 + 0x40 + lVar295);
                  fVar61 = pfVar282[1];
                  fVar62 = pfVar282[2];
                  fVar311 = pfVar282[3];
                  fVar321 = pfVar282[4];
                  fVar63 = pfVar282[5];
                  fVar64 = pfVar282[6];
                  pfVar300 = (float *)((long)pvVar301 + lVar303);
                  fVar65 = *pfVar300;
                  fVar66 = pfVar300[1];
                  fVar67 = pfVar300[2];
                  fVar506 = pfVar300[3];
                  fVar510 = pfVar300[4];
                  fVar515 = pfVar300[5];
                  fVar68 = pfVar300[6];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0x20);
                  fVar69 = *pfVar304;
                  fVar70 = pfVar304[1];
                  fVar71 = pfVar304[2];
                  fVar72 = pfVar304[3];
                  fVar73 = pfVar304[4];
                  fVar74 = pfVar304[5];
                  fVar494 = pfVar304[6];
                  fVar495 = pfVar304[7];
                  pfVar280 = (float *)((long)pvVar301 + lVar303 + 0x40);
                  fVar496 = *pfVar280;
                  fVar497 = pfVar280[1];
                  fVar325 = pfVar280[2];
                  fVar487 = pfVar280[3];
                  fVar488 = pfVar280[4];
                  fVar489 = pfVar280[5];
                  fVar490 = pfVar280[6];
                  pfVar304 = (float *)(lVar308 + lVar295);
                  fVar75 = pfVar304[1];
                  fVar76 = pfVar304[2];
                  fVar77 = pfVar304[3];
                  fVar78 = pfVar304[4];
                  fVar79 = pfVar304[5];
                  fVar80 = pfVar304[6];
                  pfVar2 = (float *)((long)pvVar301 + lVar303 + 0x60);
                  fVar81 = *pfVar2;
                  fVar82 = pfVar2[1];
                  fVar83 = pfVar2[2];
                  fVar84 = pfVar2[3];
                  fVar85 = pfVar2[4];
                  fVar86 = pfVar2[5];
                  fVar333 = pfVar2[6];
                  fVar439 = fVar332 + in_register_0000139c + pfVar309[7] + pfVar282[7];
                  pfVar3 = (float *)(lVar308 + 0x60 + lVar295);
                  fVar467 = fVar332 + in_ZMM7._28_4_ +
                            in_register_0000141c + pfVar309[7] + pfVar282[7];
                  pfVar13 = (float *)((long)pvVar301 + lVar303 + 0x80);
                  fVar349 = *pfVar13;
                  fVar350 = pfVar13[1];
                  fVar351 = pfVar13[2];
                  fVar352 = pfVar13[3];
                  fVar353 = pfVar13[4];
                  fVar354 = pfVar13[5];
                  fVar356 = pfVar13[6];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0xa0);
                  fVar357 = *pfVar307;
                  fVar87 = pfVar307[1];
                  fVar88 = pfVar307[2];
                  fVar89 = pfVar307[3];
                  fVar90 = pfVar307[4];
                  fVar91 = pfVar307[5];
                  fVar92 = pfVar307[6];
                  fVar425 = pfVar307[7];
                  pfVar307 = (float *)(lVar305 + lVar295);
                  fVar426 = *pfVar307;
                  fVar504 = pfVar307[1];
                  fVar505 = pfVar307[2];
                  fVar509 = pfVar307[3];
                  fVar420 = pfVar307[4];
                  fVar422 = pfVar307[5];
                  fVar427 = pfVar307[6];
                  pfVar4 = (float *)(lVar305 + 0x20 + lVar295);
                  fVar93 = *pfVar4;
                  fVar94 = pfVar4[1];
                  fVar355 = pfVar4[2];
                  fVar411 = pfVar4[3];
                  fVar416 = pfVar4[4];
                  fVar417 = pfVar4[5];
                  fVar418 = pfVar4[6];
                  pfVar5 = (float *)(lVar305 + 0x40 + lVar295);
                  fVar419 = *pfVar5;
                  fVar421 = pfVar5[1];
                  fVar423 = pfVar5[2];
                  fVar380 = pfVar5[3];
                  fVar430 = pfVar5[4];
                  fVar410 = pfVar5[5];
                  fVar429 = pfVar5[6];
                  pfVar5 = (float *)(lVar305 + 0x60 + lVar295);
                  fVar95 = *pfVar5;
                  fVar433 = pfVar5[1];
                  fVar468 = pfVar5[2];
                  fVar96 = pfVar5[3];
                  fVar97 = pfVar5[4];
                  fVar98 = pfVar5[5];
                  fVar99 = pfVar5[6];
                  fVar502 = in_register_0000151c + in_register_0000159c;
                  fVar440 = fVar467 + in_register_0000155c + in_register_0000159c + fVar439;
                  in_register_0000141c = fVar332 + pfVar300[7] + in_register_0000159c + pfVar280[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0xc0);
                  fVar100 = *pfVar300;
                  fVar101 = pfVar300[1];
                  fVar102 = pfVar300[2];
                  fVar103 = pfVar300[3];
                  fVar104 = pfVar300[4];
                  fVar105 = pfVar300[5];
                  fVar106 = pfVar300[6];
                  in_register_0000135c = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0xe0);
                  fVar107 = *pfVar300;
                  fVar108 = pfVar300[1];
                  fVar330 = pfVar300[2];
                  fVar109 = pfVar300[3];
                  fVar110 = pfVar300[4];
                  fVar111 = pfVar300[5];
                  fVar112 = pfVar300[6];
                  fVar113 = pfVar300[7];
                  pfVar5 = (float *)(lVar306 + lVar295);
                  fVar114 = pfVar5[1];
                  fVar115 = pfVar5[2];
                  fVar116 = pfVar5[3];
                  fVar117 = pfVar5[4];
                  fVar118 = pfVar5[5];
                  fVar119 = pfVar5[6];
                  pfVar300 = (float *)(lVar306 + 0x20 + lVar295);
                  fVar120 = *pfVar300;
                  fVar121 = pfVar300[1];
                  fVar122 = pfVar300[2];
                  fVar123 = pfVar300[3];
                  fVar124 = pfVar300[4];
                  fVar125 = pfVar300[5];
                  fVar126 = pfVar300[6];
                  pfVar280 = (float *)(lVar306 + 0x40 + lVar295);
                  fVar409 = *pfVar280;
                  fVar441 = pfVar280[1];
                  fVar444 = pfVar280[2];
                  fVar457 = pfVar280[3];
                  fVar471 = pfVar280[4];
                  fVar499 = pfVar280[5];
                  fVar462 = pfVar280[6];
                  in_register_000014dc = pfVar280[7];
                  in_register_0000155c =
                       in_register_0000155c + in_register_0000159c + in_register_0000159c;
                  fVar473 = *pfVar5 * fVar81 + fVar120 * fVar349;
                  fVar475 = fVar114 * fVar82 + fVar121 * fVar350;
                  fVar477 = fVar115 * fVar83 + fVar122 * fVar351;
                  fVar479 = fVar116 * fVar84 + fVar123 * fVar352;
                  fVar481 = fVar117 * fVar85 + fVar124 * fVar353;
                  fVar483 = fVar118 * fVar86 + fVar125 * fVar354;
                  fVar485 = fVar119 * fVar333 + fVar126 * fVar356;
                  in_ZMM9 = ZEXT3264(CONCAT428(pfVar5[7] + pfVar300[7],
                                               CONCAT424(fVar485,CONCAT420(fVar483,CONCAT416(fVar481
                                                  ,CONCAT412(fVar479,CONCAT48(fVar477,CONCAT44(
                                                  fVar475,fVar473))))))));
                  pfVar280 = (float *)((long)pvVar301 + lVar303 + 0x100);
                  fVar383 = *pfVar280;
                  fVar399 = pfVar280[1];
                  fVar401 = pfVar280[2];
                  fVar403 = pfVar280[3];
                  fVar404 = pfVar280[4];
                  fVar405 = pfVar280[5];
                  fVar406 = pfVar280[6];
                  in_register_0000149c = pfVar280[7];
                  fVar375 = pfVar2[7] + pfVar13[7];
                  fVar407 = fVar502 + in_register_0000159c + pfVar13[7];
                  pfVar280 = (float *)(lVar306 + 0x60 + lVar295);
                  fVar464 = *pfVar280;
                  fVar408 = pfVar280[1];
                  fVar493 = pfVar280[2];
                  fVar503 = pfVar280[3];
                  fVar331 = pfVar280[4];
                  fVar424 = pfVar280[5];
                  fVar147 = pfVar280[6];
                  in_register_0000151c = pfVar280[7];
                  auVar394._0_4_ =
                       fVar428 + *pfVar309 * fVar65 + *pfVar282 * fVar69 + fVar496 * *pfVar3 +
                       fVar93 * fVar81 + fVar419 * fVar349 + fVar95 * fVar357 +
                       fVar120 * fVar100 + fVar409 * fVar107 + fVar464 * fVar383;
                  auVar394._4_4_ =
                       fVar322 + fVar358 * fVar66 + fVar61 * fVar70 + fVar497 * pfVar3[1] +
                       fVar94 * fVar82 + fVar421 * fVar350 + fVar433 * fVar87 +
                       fVar121 * fVar101 + fVar441 * fVar108 + fVar408 * fVar399;
                  auVar394._8_4_ =
                       fVar323 + fVar372 * fVar67 + fVar62 * fVar71 + fVar325 * pfVar3[2] +
                       fVar355 * fVar83 + fVar423 * fVar351 + fVar468 * fVar88 +
                       fVar122 * fVar102 + fVar444 * fVar330 + fVar493 * fVar401;
                  auVar394._12_4_ =
                       fVar326 + fVar373 * fVar506 + fVar311 * fVar72 + fVar487 * pfVar3[3] +
                       fVar411 * fVar84 + fVar380 * fVar352 + fVar96 * fVar89 +
                       fVar123 * fVar103 + fVar457 * fVar109 + fVar503 * fVar403;
                  auVar394._16_4_ =
                       fVar327 + fVar374 * fVar510 + fVar321 * fVar73 + fVar488 * pfVar3[4] +
                       fVar416 * fVar85 + fVar430 * fVar353 + fVar97 * fVar90 +
                       fVar124 * fVar104 + fVar471 * fVar110 + fVar331 * fVar404;
                  auVar394._20_4_ =
                       fVar328 + fVar59 * fVar515 + fVar63 * fVar74 + fVar489 * pfVar3[5] +
                       fVar417 * fVar86 + fVar410 * fVar354 + fVar98 * fVar91 +
                       fVar125 * fVar105 + fVar499 * fVar111 + fVar424 * fVar405;
                  auVar394._24_4_ =
                       fVar329 + fVar60 * fVar68 + fVar64 * fVar494 + fVar490 * pfVar3[6] +
                       fVar418 * fVar333 + fVar429 * fVar356 + fVar99 * fVar92 +
                       fVar126 * fVar106 + fVar462 * fVar112 + fVar147 * fVar406;
                  auVar394._28_4_ = fVar440 + in_register_0000155c + fVar407;
                  in_ZMM3 = ZEXT3264(auVar394);
                  in_register_0000139c =
                       pfVar307[7] + fVar332 + pfVar4[7] + fVar467 +
                       pfVar5[7] + pfVar300[7] + fVar440;
                  pfVar300 = (float *)(lVar286 + lVar295);
                  fVar440 = *pfVar300;
                  fVar467 = pfVar300[1];
                  fVar127 = pfVar300[2];
                  fVar128 = pfVar300[3];
                  fVar129 = pfVar300[4];
                  fVar130 = pfVar300[5];
                  fVar131 = pfVar300[6];
                  pfVar300 = (float *)(lVar286 + 0x20 + lVar295);
                  fVar132 = *pfVar300;
                  fVar133 = pfVar300[1];
                  fVar134 = pfVar300[2];
                  fVar135 = pfVar300[3];
                  fVar136 = pfVar300[4];
                  fVar137 = pfVar300[5];
                  fVar138 = pfVar300[6];
                  fVar139 = pfVar300[7];
                  auVar346 = *(undefined1 (*) [32])(lVar286 + 0x40 + lVar295);
                  in_ZMM7 = ZEXT3264(auVar346);
                  pfVar300 = (float *)(lVar286 + 0x60 + lVar295);
                  fVar140 = *pfVar300;
                  fVar141 = pfVar300[1];
                  fVar142 = pfVar300[2];
                  fVar143 = pfVar300[3];
                  fVar144 = pfVar300[4];
                  fVar145 = pfVar300[5];
                  fVar146 = pfVar300[6];
                  pfVar300 = (float *)((long)pvVar302 + lVar295);
                  *pfVar300 = fVar428 + fVar65 * *pfVar304 +
                              *pfVar309 * fVar69 + *pfVar282 * fVar496 +
                              fVar426 * fVar81 + fVar93 * fVar349 + fVar419 * fVar357 +
                              *pfVar5 * fVar100 + fVar120 * fVar107 + fVar409 * fVar383;
                  pfVar300[1] = fVar322 + fVar66 * fVar75 + fVar358 * fVar70 + fVar61 * fVar497 +
                                fVar504 * fVar82 + fVar94 * fVar350 + fVar421 * fVar87 +
                                fVar114 * fVar101 + fVar121 * fVar108 + fVar441 * fVar399;
                  pfVar300[2] = fVar323 + fVar67 * fVar76 + fVar372 * fVar71 + fVar62 * fVar325 +
                                fVar505 * fVar83 + fVar355 * fVar351 + fVar423 * fVar88 +
                                fVar115 * fVar102 + fVar122 * fVar330 + fVar444 * fVar401;
                  pfVar300[3] = fVar326 + fVar506 * fVar77 + fVar373 * fVar72 + fVar311 * fVar487 +
                                fVar509 * fVar84 + fVar411 * fVar352 + fVar380 * fVar89 +
                                fVar116 * fVar103 + fVar123 * fVar109 + fVar457 * fVar403;
                  pfVar300[4] = fVar327 + fVar510 * fVar78 + fVar374 * fVar73 + fVar321 * fVar488 +
                                fVar420 * fVar85 + fVar416 * fVar353 + fVar430 * fVar90 +
                                fVar117 * fVar104 + fVar124 * fVar110 + fVar471 * fVar404;
                  pfVar300[5] = fVar328 + fVar515 * fVar79 + fVar59 * fVar74 + fVar63 * fVar489 +
                                fVar422 * fVar86 + fVar417 * fVar354 + fVar410 * fVar91 +
                                fVar118 * fVar105 + fVar125 * fVar111 + fVar499 * fVar405;
                  pfVar300[6] = fVar329 + fVar68 * fVar80 + fVar60 * fVar494 + fVar64 * fVar490 +
                                fVar427 * fVar333 + fVar418 * fVar356 + fVar429 * fVar92 +
                                fVar119 * fVar106 + fVar126 * fVar112 + fVar462 * fVar406;
                  pfVar300[7] = fVar439 + fVar502 + fVar495 + fVar407;
                  *(undefined1 (*) [32])((long)pvVar302 + lVar295 + 0x20) = auVar394;
                  pfVar300 = (float *)((long)pvVar279 + lVar295);
                  *pfVar300 = fVar426 * fVar65 + fVar428 + fVar93 * fVar69 + fVar419 * fVar496 +
                              fVar473 + fVar409 * fVar357 +
                              fVar100 * fVar440 + fVar132 * fVar107 + fVar383 * auVar346._0_4_;
                  pfVar300[1] = fVar504 * fVar66 + fVar322 + fVar94 * fVar70 + fVar421 * fVar497 +
                                fVar475 + fVar441 * fVar87 +
                                fVar101 * fVar467 + fVar133 * fVar108 + fVar399 * auVar346._4_4_;
                  pfVar300[2] = fVar505 * fVar67 + fVar323 + fVar355 * fVar71 + fVar423 * fVar325 +
                                fVar477 + fVar444 * fVar88 +
                                fVar102 * fVar127 + fVar134 * fVar330 + fVar401 * auVar346._8_4_;
                  pfVar300[3] = fVar509 * fVar506 + fVar326 + fVar411 * fVar72 + fVar380 * fVar487 +
                                fVar479 + fVar457 * fVar89 +
                                fVar103 * fVar128 + fVar135 * fVar109 + fVar403 * auVar346._12_4_;
                  pfVar300[4] = fVar420 * fVar510 + fVar327 + fVar416 * fVar73 + fVar430 * fVar488 +
                                fVar481 + fVar471 * fVar90 +
                                fVar104 * fVar129 + fVar136 * fVar110 + fVar404 * auVar346._16_4_;
                  pfVar300[5] = fVar422 * fVar515 + fVar328 + fVar417 * fVar74 + fVar410 * fVar489 +
                                fVar483 + fVar499 * fVar91 +
                                fVar105 * fVar130 + fVar137 * fVar111 + fVar405 * auVar346._20_4_;
                  pfVar300[6] = fVar427 * fVar68 + fVar329 + fVar418 * fVar494 + fVar429 * fVar490 +
                                fVar485 + fVar462 * fVar92 +
                                fVar106 * fVar131 + fVar138 * fVar112 + fVar406 * auVar346._24_4_;
                  pfVar300[7] = in_register_0000139c + fVar375 + fVar139 + in_register_0000135c;
                  pfVar300 = (float *)((long)pvVar279 + lVar295 + 0x20);
                  *pfVar300 = fVar428 + fVar93 * fVar65 + fVar419 * fVar69 + fVar95 * fVar496 +
                              fVar120 * fVar81 + fVar409 * fVar349 + fVar464 * fVar357 +
                              fVar132 * fVar100 + auVar346._0_4_ * fVar107 + fVar383 * fVar140;
                  pfVar300[1] = fVar322 + fVar94 * fVar66 + fVar421 * fVar70 + fVar433 * fVar497 +
                                fVar121 * fVar82 + fVar441 * fVar350 + fVar408 * fVar87 +
                                fVar133 * fVar101 + auVar346._4_4_ * fVar108 + fVar399 * fVar141;
                  pfVar300[2] = fVar323 + fVar355 * fVar67 + fVar423 * fVar71 + fVar468 * fVar325 +
                                fVar122 * fVar83 + fVar444 * fVar351 + fVar493 * fVar88 +
                                fVar134 * fVar102 + auVar346._8_4_ * fVar330 + fVar401 * fVar142;
                  pfVar300[3] = fVar326 + fVar411 * fVar506 + fVar380 * fVar72 + fVar96 * fVar487 +
                                fVar123 * fVar84 + fVar457 * fVar352 + fVar503 * fVar89 +
                                fVar135 * fVar103 + auVar346._12_4_ * fVar109 + fVar403 * fVar143;
                  pfVar300[4] = fVar327 + fVar416 * fVar510 + fVar430 * fVar73 + fVar97 * fVar488 +
                                fVar124 * fVar85 + fVar471 * fVar353 + fVar331 * fVar90 +
                                fVar136 * fVar104 + auVar346._16_4_ * fVar110 + fVar404 * fVar144;
                  pfVar300[5] = fVar328 + fVar417 * fVar515 + fVar410 * fVar74 + fVar98 * fVar489 +
                                fVar125 * fVar86 + fVar499 * fVar354 + fVar424 * fVar91 +
                                fVar137 * fVar105 + auVar346._20_4_ * fVar111 + fVar405 * fVar145;
                  pfVar300[6] = fVar329 + fVar418 * fVar68 + fVar429 * fVar494 + fVar99 * fVar490 +
                                fVar126 * fVar333 + fVar462 * fVar356 + fVar147 * fVar92 +
                                fVar138 * fVar106 + auVar346._24_4_ * fVar112 + fVar406 * fVar146;
                  pfVar300[7] = in_register_0000141c + fVar375 + fVar425 +
                                in_register_0000135c + fVar113 + in_register_0000135c;
                  lVar295 = lVar295 + 0x40;
                }
                for (; iVar292 < iVar273; iVar292 = iVar292 + 1) {
                  pfVar300 = (float *)((long)pvVar301 + lVar303);
                  fVar358 = *pfVar300;
                  fVar372 = pfVar300[1];
                  fVar373 = pfVar300[2];
                  fVar374 = pfVar300[3];
                  fVar59 = pfVar300[4];
                  fVar60 = pfVar300[5];
                  fVar61 = pfVar300[6];
                  fVar62 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x20);
                  fVar311 = *pfVar300;
                  fVar321 = pfVar300[1];
                  fVar63 = pfVar300[2];
                  fVar64 = pfVar300[3];
                  fVar65 = pfVar300[4];
                  fVar66 = pfVar300[5];
                  fVar67 = pfVar300[6];
                  fVar506 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x40);
                  fVar510 = *pfVar300;
                  fVar515 = pfVar300[1];
                  fVar68 = pfVar300[2];
                  fVar69 = pfVar300[3];
                  fVar70 = pfVar300[4];
                  fVar71 = pfVar300[5];
                  fVar72 = pfVar300[6];
                  fVar73 = pfVar300[7];
                  pfVar300 = (float *)(lVar308 + lVar295);
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0x60);
                  fVar74 = *pfVar304;
                  fVar494 = pfVar304[1];
                  fVar495 = pfVar304[2];
                  fVar496 = pfVar304[3];
                  fVar497 = pfVar304[4];
                  fVar325 = pfVar304[5];
                  fVar487 = pfVar304[6];
                  fVar488 = pfVar304[7];
                  pfVar307 = (float *)(lVar308 + 0x20 + lVar295);
                  pfVar309 = (float *)(lVar308 + 0x40 + lVar295);
                  fVar433 = in_register_0000135c + in_register_0000139c;
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0x80);
                  fVar489 = *pfVar304;
                  fVar490 = pfVar304[1];
                  fVar75 = pfVar304[2];
                  fVar76 = pfVar304[3];
                  fVar77 = pfVar304[4];
                  fVar78 = pfVar304[5];
                  fVar79 = pfVar304[6];
                  fVar80 = pfVar304[7];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0xa0);
                  fVar114 = *pfVar304;
                  fVar115 = pfVar304[1];
                  fVar116 = pfVar304[2];
                  fVar117 = pfVar304[3];
                  fVar118 = pfVar304[4];
                  fVar119 = pfVar304[5];
                  fVar120 = pfVar304[6];
                  in_register_0000139c = pfVar304[7];
                  pfVar304 = (float *)(lVar305 + lVar295);
                  fVar81 = *pfVar304;
                  fVar82 = pfVar304[1];
                  fVar83 = pfVar304[2];
                  fVar84 = pfVar304[3];
                  fVar85 = pfVar304[4];
                  fVar86 = pfVar304[5];
                  fVar333 = pfVar304[6];
                  pfVar282 = (float *)(lVar305 + 0x20 + lVar295);
                  fVar349 = *pfVar282;
                  fVar350 = pfVar282[1];
                  fVar351 = pfVar282[2];
                  fVar352 = pfVar282[3];
                  fVar353 = pfVar282[4];
                  fVar354 = pfVar282[5];
                  fVar356 = pfVar282[6];
                  pfVar280 = (float *)(lVar305 + 0x40 + lVar295);
                  fVar357 = *pfVar280;
                  fVar87 = pfVar280[1];
                  fVar88 = pfVar280[2];
                  fVar89 = pfVar280[3];
                  fVar90 = pfVar280[4];
                  fVar91 = pfVar280[5];
                  fVar92 = pfVar280[6];
                  fVar468 = in_register_0000149c + pfVar304[7];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0xc0);
                  fVar425 = *pfVar304;
                  fVar426 = pfVar304[1];
                  fVar504 = pfVar304[2];
                  fVar505 = pfVar304[3];
                  fVar509 = pfVar304[4];
                  fVar420 = pfVar304[5];
                  fVar422 = pfVar304[6];
                  fVar427 = pfVar304[7];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0xe0);
                  fVar93 = *pfVar304;
                  fVar94 = pfVar304[1];
                  fVar355 = pfVar304[2];
                  fVar411 = pfVar304[3];
                  fVar416 = pfVar304[4];
                  fVar417 = pfVar304[5];
                  fVar418 = pfVar304[6];
                  fVar419 = pfVar304[7];
                  auVar346 = *(undefined1 (*) [32])((long)pvVar301 + lVar303 + 0x100);
                  in_ZMM7 = ZEXT3264(auVar346);
                  pfVar280 = (float *)(lVar306 + lVar295);
                  fVar421 = *pfVar280;
                  fVar423 = pfVar280[1];
                  fVar380 = pfVar280[2];
                  fVar430 = pfVar280[3];
                  fVar410 = pfVar280[4];
                  fVar429 = pfVar280[5];
                  fVar95 = pfVar280[6];
                  auVar51 = *(undefined1 (*) [32])(lVar306 + 0x20 + lVar295);
                  in_ZMM9 = ZEXT3264(auVar51);
                  pfVar304 = (float *)(lVar306 + 0x40 + lVar295);
                  fVar121 = *pfVar304;
                  fVar122 = pfVar304[1];
                  fVar123 = pfVar304[2];
                  fVar124 = pfVar304[3];
                  fVar125 = pfVar304[4];
                  fVar126 = pfVar304[5];
                  fVar440 = pfVar304[6];
                  in_register_0000149c = pfVar304[7];
                  in_register_0000141c = in_register_000014dc + pfVar280[7];
                  in_register_0000135c = in_register_0000141c + fVar80;
                  auVar395._0_4_ =
                       fVar428 + fVar358 * *pfVar300 + fVar311 * *pfVar307 + fVar510 * *pfVar309 +
                       fVar357 * fVar114 + fVar81 * fVar74 + fVar349 * fVar489 +
                       fVar421 * fVar425 + auVar51._0_4_ * fVar93 + fVar121 * auVar346._0_4_;
                  auVar395._4_4_ =
                       fVar322 + fVar372 * pfVar300[1] +
                       fVar321 * pfVar307[1] + fVar515 * pfVar309[1] +
                       fVar87 * fVar115 + fVar82 * fVar494 + fVar350 * fVar490 +
                       fVar423 * fVar426 + auVar51._4_4_ * fVar94 + fVar122 * auVar346._4_4_;
                  auVar395._8_4_ =
                       fVar323 + fVar373 * pfVar300[2] + fVar63 * pfVar307[2] + fVar68 * pfVar309[2]
                       + fVar88 * fVar116 + fVar83 * fVar495 + fVar351 * fVar75 +
                       fVar380 * fVar504 + auVar51._8_4_ * fVar355 + fVar123 * auVar346._8_4_;
                  auVar395._12_4_ =
                       fVar326 + fVar374 * pfVar300[3] + fVar64 * pfVar307[3] + fVar69 * pfVar309[3]
                       + fVar89 * fVar117 + fVar84 * fVar496 + fVar352 * fVar76 +
                       fVar430 * fVar505 + auVar51._12_4_ * fVar411 + fVar124 * auVar346._12_4_;
                  auVar395._16_4_ =
                       fVar327 + fVar59 * pfVar300[4] + fVar65 * pfVar307[4] + fVar70 * pfVar309[4]
                       + fVar90 * fVar118 + fVar85 * fVar497 + fVar353 * fVar77 +
                       fVar410 * fVar509 + auVar51._16_4_ * fVar416 + fVar125 * auVar346._16_4_;
                  auVar395._20_4_ =
                       fVar328 + fVar60 * pfVar300[5] + fVar66 * pfVar307[5] + fVar71 * pfVar309[5]
                       + fVar91 * fVar119 + fVar86 * fVar325 + fVar354 * fVar78 +
                       fVar429 * fVar420 + auVar51._20_4_ * fVar417 + fVar126 * auVar346._20_4_;
                  auVar395._24_4_ =
                       fVar329 + fVar61 * pfVar300[6] + fVar67 * pfVar307[6] + fVar72 * pfVar309[6]
                       + fVar92 * fVar120 + fVar333 * fVar487 + fVar356 * fVar79 +
                       fVar95 * fVar422 + auVar51._24_4_ * fVar418 + fVar440 * auVar346._24_4_;
                  auVar395._28_4_ =
                       fVar332 + in_ZMM3._28_4_ + fVar433 + pfVar282[7] + fVar468 +
                       in_register_0000135c;
                  in_ZMM3 = ZEXT3264(auVar395);
                  pfVar300 = (float *)(lVar286 + lVar295);
                  fVar433 = *pfVar300;
                  fVar468 = pfVar300[1];
                  fVar96 = pfVar300[2];
                  fVar97 = pfVar300[3];
                  fVar98 = pfVar300[4];
                  fVar99 = pfVar300[5];
                  fVar100 = pfVar300[6];
                  pfVar300 = (float *)(lVar286 + 0x20 + lVar295);
                  fVar101 = *pfVar300;
                  fVar102 = pfVar300[1];
                  fVar103 = pfVar300[2];
                  fVar104 = pfVar300[3];
                  fVar105 = pfVar300[4];
                  fVar106 = pfVar300[5];
                  fVar107 = pfVar300[6];
                  pfVar300 = (float *)(lVar286 + 0x40 + lVar295);
                  fVar108 = *pfVar300;
                  fVar330 = pfVar300[1];
                  fVar109 = pfVar300[2];
                  fVar110 = pfVar300[3];
                  fVar111 = pfVar300[4];
                  fVar112 = pfVar300[5];
                  fVar113 = pfVar300[6];
                  *(undefined1 (*) [32])((long)pvVar302 + lVar295) = auVar395;
                  pfVar300 = (float *)((long)pvVar279 + lVar295);
                  *pfVar300 = fVar428 + fVar81 * fVar358 + fVar349 * fVar311 + fVar357 * fVar510 +
                              fVar421 * fVar74 + auVar51._0_4_ * fVar489 + fVar121 * fVar114 +
                              fVar425 * fVar433 + fVar93 * fVar101 + auVar346._0_4_ * fVar108;
                  pfVar300[1] = fVar322 + fVar82 * fVar372 + fVar350 * fVar321 + fVar87 * fVar515 +
                                fVar423 * fVar494 + auVar51._4_4_ * fVar490 + fVar122 * fVar115 +
                                fVar426 * fVar468 + fVar94 * fVar102 + auVar346._4_4_ * fVar330;
                  pfVar300[2] = fVar323 + fVar83 * fVar373 + fVar351 * fVar63 + fVar88 * fVar68 +
                                fVar380 * fVar495 + auVar51._8_4_ * fVar75 + fVar123 * fVar116 +
                                fVar504 * fVar96 + fVar355 * fVar103 + auVar346._8_4_ * fVar109;
                  pfVar300[3] = fVar326 + fVar84 * fVar374 + fVar352 * fVar64 + fVar89 * fVar69 +
                                fVar430 * fVar496 + auVar51._12_4_ * fVar76 + fVar124 * fVar117 +
                                fVar505 * fVar97 + fVar411 * fVar104 + auVar346._12_4_ * fVar110;
                  pfVar300[4] = fVar327 + fVar85 * fVar59 + fVar353 * fVar65 + fVar90 * fVar70 +
                                fVar410 * fVar497 + auVar51._16_4_ * fVar77 + fVar125 * fVar118 +
                                fVar509 * fVar98 + fVar416 * fVar105 + auVar346._16_4_ * fVar111;
                  pfVar300[5] = fVar328 + fVar86 * fVar60 + fVar354 * fVar66 + fVar91 * fVar71 +
                                fVar429 * fVar325 + auVar51._20_4_ * fVar78 + fVar126 * fVar119 +
                                fVar420 * fVar99 + fVar417 * fVar106 + auVar346._20_4_ * fVar112;
                  pfVar300[6] = fVar329 + fVar333 * fVar61 + fVar356 * fVar67 + fVar92 * fVar72 +
                                fVar95 * fVar487 + auVar51._24_4_ * fVar79 + fVar440 * fVar120 +
                                fVar422 * fVar100 + fVar418 * fVar107 + auVar346._24_4_ * fVar113;
                  pfVar300[7] = fVar332 + fVar62 + fVar506 + fVar73 +
                                fVar488 + fVar80 + in_register_0000135c +
                                fVar427 + fVar419 + fVar419;
                  lVar295 = lVar295 + 0x20;
                }
                lVar308 = lVar308 + lVar290 + lVar295;
                lVar305 = lVar305 + lVar290 + lVar295;
                lVar306 = lVar306 + lVar290 + lVar295;
                lVar286 = lVar286 + lVar290 + lVar295;
                pvVar302 = (void *)((long)pvVar302 + lVar295 + local_258);
                pvVar279 = (void *)((long)pvVar279 + lVar295 + local_258);
              }
              for (; (int)uVar283 < iVar284; uVar283 = uVar283 + 1) {
                lVar286 = 0;
                for (iVar292 = 0; iVar292 + 3 < iVar273; iVar292 = iVar292 + 4) {
                  pfVar300 = (float *)(lVar308 + 0x20 + lVar286);
                  fVar372 = *pfVar300;
                  fVar373 = pfVar300[1];
                  fVar374 = pfVar300[2];
                  fVar59 = pfVar300[3];
                  fVar60 = pfVar300[4];
                  fVar61 = pfVar300[5];
                  fVar62 = pfVar300[6];
                  fVar311 = pfVar300[7];
                  pfVar300 = (float *)(lVar308 + 0x40 + lVar286);
                  fVar321 = *pfVar300;
                  fVar63 = pfVar300[1];
                  fVar64 = pfVar300[2];
                  fVar65 = pfVar300[3];
                  fVar66 = pfVar300[4];
                  fVar67 = pfVar300[5];
                  fVar506 = pfVar300[6];
                  fVar510 = pfVar300[7];
                  pfVar304 = (float *)(lVar308 + 0x60 + lVar286);
                  fVar515 = *pfVar304;
                  fVar68 = pfVar304[1];
                  fVar69 = pfVar304[2];
                  fVar70 = pfVar304[3];
                  fVar71 = pfVar304[4];
                  fVar72 = pfVar304[5];
                  fVar73 = pfVar304[6];
                  pfVar300 = (float *)(lVar308 + 0x80 + lVar286);
                  fVar74 = *pfVar300;
                  fVar494 = pfVar300[1];
                  fVar495 = pfVar300[2];
                  fVar496 = pfVar300[3];
                  fVar497 = pfVar300[4];
                  fVar325 = pfVar300[5];
                  fVar487 = pfVar300[6];
                  fVar488 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303);
                  fVar489 = *pfVar300;
                  fVar490 = pfVar300[1];
                  fVar75 = pfVar300[2];
                  fVar76 = pfVar300[3];
                  fVar77 = pfVar300[4];
                  fVar78 = pfVar300[5];
                  fVar79 = pfVar300[6];
                  fVar80 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x20);
                  fVar81 = *pfVar300;
                  fVar82 = pfVar300[1];
                  fVar83 = pfVar300[2];
                  fVar84 = pfVar300[3];
                  fVar85 = pfVar300[4];
                  fVar86 = pfVar300[5];
                  fVar333 = pfVar300[6];
                  fVar349 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x40);
                  fVar350 = *pfVar300;
                  fVar351 = pfVar300[1];
                  fVar352 = pfVar300[2];
                  fVar353 = pfVar300[3];
                  fVar354 = pfVar300[4];
                  fVar356 = pfVar300[5];
                  fVar357 = pfVar300[6];
                  pfVar300 = (float *)(lVar308 + lVar286);
                  fVar87 = pfVar300[1];
                  fVar88 = pfVar300[2];
                  fVar89 = pfVar300[3];
                  fVar90 = pfVar300[4];
                  fVar91 = pfVar300[5];
                  fVar92 = pfVar300[6];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0x60);
                  fVar425 = *pfVar307;
                  fVar426 = pfVar307[1];
                  fVar504 = pfVar307[2];
                  fVar505 = pfVar307[3];
                  fVar509 = pfVar307[4];
                  fVar420 = pfVar307[5];
                  fVar422 = pfVar307[6];
                  fVar427 = pfVar307[7];
                  fVar398 = in_register_0000141c + fVar332;
                  fVar358 = in_ZMM9._28_4_;
                  fVar493 = in_register_0000149c + fVar332;
                  fVar376 = in_register_000014dc + fVar510;
                  fVar408 = in_register_0000151c + pfVar304[7];
                  pfVar304 = (float *)(lVar308 + 0xa0 + lVar286);
                  fVar93 = *pfVar304;
                  fVar94 = pfVar304[1];
                  fVar355 = pfVar304[2];
                  fVar411 = pfVar304[3];
                  fVar416 = pfVar304[4];
                  fVar417 = pfVar304[5];
                  fVar418 = pfVar304[6];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0x80);
                  fVar419 = *pfVar304;
                  fVar421 = pfVar304[1];
                  fVar423 = pfVar304[2];
                  fVar380 = pfVar304[3];
                  fVar430 = pfVar304[4];
                  fVar410 = pfVar304[5];
                  fVar429 = pfVar304[6];
                  fVar95 = pfVar304[7];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0xa0);
                  fVar433 = *pfVar304;
                  fVar468 = pfVar304[1];
                  fVar96 = pfVar304[2];
                  fVar97 = pfVar304[3];
                  fVar98 = pfVar304[4];
                  fVar99 = pfVar304[5];
                  fVar100 = pfVar304[6];
                  pfVar307 = (float *)(lVar305 + 0x20 + lVar286);
                  fVar101 = *pfVar307;
                  fVar102 = pfVar307[1];
                  fVar103 = pfVar307[2];
                  fVar104 = pfVar307[3];
                  fVar105 = pfVar307[4];
                  fVar106 = pfVar307[5];
                  fVar107 = pfVar307[6];
                  pfVar304 = (float *)(lVar305 + 0x40 + lVar286);
                  fVar108 = *pfVar304;
                  fVar330 = pfVar304[1];
                  fVar109 = pfVar304[2];
                  fVar110 = pfVar304[3];
                  fVar111 = pfVar304[4];
                  fVar112 = pfVar304[5];
                  fVar113 = pfVar304[6];
                  pfVar304 = (float *)(lVar305 + 0x60 + lVar286);
                  fVar114 = *pfVar304;
                  fVar115 = pfVar304[1];
                  fVar116 = pfVar304[2];
                  fVar117 = pfVar304[3];
                  fVar118 = pfVar304[4];
                  fVar119 = pfVar304[5];
                  fVar120 = pfVar304[6];
                  pfVar304 = (float *)(lVar305 + lVar286);
                  fVar121 = pfVar304[1];
                  fVar122 = pfVar304[2];
                  fVar123 = pfVar304[3];
                  fVar124 = pfVar304[4];
                  fVar125 = pfVar304[5];
                  fVar126 = pfVar304[6];
                  pfVar282 = (float *)(lVar305 + 0x80 + lVar286);
                  fVar440 = *pfVar282;
                  fVar467 = pfVar282[1];
                  fVar127 = pfVar282[2];
                  fVar128 = pfVar282[3];
                  fVar129 = pfVar282[4];
                  fVar130 = pfVar282[5];
                  fVar131 = pfVar282[6];
                  fVar503 = in_register_0000155c + in_register_0000151c;
                  fVar434 = fVar493 + pfVar307[7] + fVar95;
                  fVar435 = in_register_0000151c + fVar493 + fVar434;
                  fVar436 = fVar503 + fVar435;
                  pfVar307 = (float *)(lVar305 + 0xa0 + lVar286);
                  fVar132 = *pfVar307;
                  fVar133 = pfVar307[1];
                  fVar134 = pfVar307[2];
                  fVar135 = pfVar307[3];
                  fVar136 = pfVar307[4];
                  fVar137 = pfVar307[5];
                  fVar138 = pfVar307[6];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0xc0);
                  fVar139 = *pfVar307;
                  fVar140 = pfVar307[1];
                  fVar141 = pfVar307[2];
                  fVar142 = pfVar307[3];
                  fVar143 = pfVar307[4];
                  fVar144 = pfVar307[5];
                  fVar145 = pfVar307[6];
                  fVar146 = pfVar307[7];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0xe0);
                  fVar383 = *pfVar307;
                  fVar399 = pfVar307[1];
                  fVar401 = pfVar307[2];
                  fVar403 = pfVar307[3];
                  fVar404 = pfVar307[4];
                  fVar405 = pfVar307[5];
                  fVar406 = pfVar307[6];
                  fVar409 = pfVar307[7];
                  pfVar307 = (float *)((long)pvVar301 + lVar303 + 0x100);
                  fVar407 = *pfVar307;
                  fVar439 = pfVar307[1];
                  fVar473 = pfVar307[2];
                  fVar475 = pfVar307[3];
                  fVar477 = pfVar307[4];
                  fVar479 = pfVar307[5];
                  fVar481 = pfVar307[6];
                  in_register_0000139c = pfVar307[7];
                  pfVar307 = (float *)(lVar306 + 0x20 + lVar286);
                  fVar441 = *pfVar307;
                  fVar444 = pfVar307[1];
                  fVar457 = pfVar307[2];
                  fVar471 = pfVar307[3];
                  fVar499 = pfVar307[4];
                  fVar462 = pfVar307[5];
                  fVar464 = pfVar307[6];
                  pfVar309 = (float *)(lVar306 + 0x40 + lVar286);
                  fVar483 = *pfVar309;
                  fVar485 = pfVar309[1];
                  fVar502 = pfVar309[2];
                  fVar148 = pfVar309[3];
                  fVar149 = pfVar309[4];
                  fVar150 = pfVar309[5];
                  fVar151 = pfVar309[6];
                  in_register_0000141c = pfVar309[7];
                  auVar346 = *(undefined1 (*) [32])(lVar306 + 0x60 + lVar286);
                  in_ZMM9 = ZEXT3264(auVar346);
                  pfVar309 = (float *)(lVar306 + 0x80 + lVar286);
                  fVar152 = *pfVar309;
                  fVar153 = pfVar309[1];
                  fVar154 = pfVar309[2];
                  fVar155 = pfVar309[3];
                  fVar156 = pfVar309[4];
                  fVar157 = pfVar309[5];
                  fVar158 = pfVar309[6];
                  in_register_0000149c = pfVar309[7];
                  pfVar309 = (float *)(lVar306 + lVar286);
                  fVar400 = auVar346._0_4_;
                  fVar402 = auVar346._4_4_;
                  fVar498 = auVar346._8_4_;
                  fVar442 = auVar346._12_4_;
                  fVar455 = auVar346._16_4_;
                  fVar460 = auVar346._20_4_;
                  fVar463 = auVar346._24_4_;
                  fVar443 = fVar139 * *pfVar309 + fVar441 * fVar383;
                  fVar456 = fVar140 * pfVar309[1] + fVar444 * fVar399;
                  fVar458 = fVar141 * pfVar309[2] + fVar457 * fVar401;
                  fVar459 = fVar142 * pfVar309[3] + fVar471 * fVar403;
                  fVar461 = fVar143 * pfVar309[4] + fVar499 * fVar404;
                  fVar501 = fVar144 * pfVar309[5] + fVar462 * fVar405;
                  fVar382 = fVar145 * pfVar309[6] + fVar464 * fVar406;
                  fVar469 = pfVar282[7] + pfVar307[7];
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar469,CONCAT424(fVar382,CONCAT420(fVar501,CONCAT416
                                                  (fVar461,CONCAT412(fVar459,CONCAT48(fVar458,
                                                  CONCAT44(fVar456,fVar443))))))));
                  in_register_000014dc = fVar503 + pfVar282[7];
                  in_register_0000151c = in_register_0000155c + fVar503;
                  fVar469 = fVar469 + fVar409;
                  fVar437 = in_register_000014dc + fVar469;
                  in_register_0000135c = in_register_0000151c + fVar437;
                  auVar396._0_4_ =
                       fVar321 * fVar489 + fVar428 + fVar515 * fVar81 + fVar74 * fVar350 +
                       fVar108 * fVar425 + fVar114 * fVar419 + fVar440 * fVar433 +
                       fVar483 * fVar139 + fVar400 * fVar383 + fVar152 * fVar407;
                  auVar396._4_4_ =
                       fVar63 * fVar490 + fVar322 + fVar68 * fVar82 + fVar494 * fVar351 +
                       fVar330 * fVar426 + fVar115 * fVar421 + fVar467 * fVar468 +
                       fVar485 * fVar140 + fVar402 * fVar399 + fVar153 * fVar439;
                  auVar396._8_4_ =
                       fVar64 * fVar75 + fVar323 + fVar69 * fVar83 + fVar495 * fVar352 +
                       fVar109 * fVar504 + fVar116 * fVar423 + fVar127 * fVar96 +
                       fVar502 * fVar141 + fVar498 * fVar401 + fVar154 * fVar473;
                  auVar396._12_4_ =
                       fVar65 * fVar76 + fVar326 + fVar70 * fVar84 + fVar496 * fVar353 +
                       fVar110 * fVar505 + fVar117 * fVar380 + fVar128 * fVar97 +
                       fVar148 * fVar142 + fVar442 * fVar403 + fVar155 * fVar475;
                  auVar396._16_4_ =
                       fVar66 * fVar77 + fVar327 + fVar71 * fVar85 + fVar497 * fVar354 +
                       fVar111 * fVar509 + fVar118 * fVar430 + fVar129 * fVar98 +
                       fVar149 * fVar143 + fVar455 * fVar404 + fVar156 * fVar477;
                  auVar396._20_4_ =
                       fVar67 * fVar78 + fVar328 + fVar72 * fVar86 + fVar325 * fVar356 +
                       fVar112 * fVar420 + fVar119 * fVar410 + fVar130 * fVar99 +
                       fVar150 * fVar144 + fVar460 * fVar405 + fVar157 * fVar479;
                  auVar396._24_4_ =
                       fVar506 * fVar79 + fVar329 + fVar73 * fVar333 + fVar487 * fVar357 +
                       fVar113 * fVar422 + fVar120 * fVar429 + fVar131 * fVar100 +
                       fVar151 * fVar145 + fVar463 * fVar406 + fVar158 * fVar481;
                  auVar396._28_4_ = fVar493 + fVar408 + fVar436 + in_register_0000135c;
                  in_ZMM3 = ZEXT3264(auVar396);
                  pfVar307 = (float *)(lVar306 + 0xa0 + lVar286);
                  fVar408 = *pfVar307;
                  fVar493 = pfVar307[1];
                  fVar503 = pfVar307[2];
                  fVar331 = pfVar307[3];
                  fVar424 = pfVar307[4];
                  fVar147 = pfVar307[5];
                  fVar375 = pfVar307[6];
                  pfVar307 = (float *)((long)pvVar302 + lVar286);
                  *pfVar307 = fVar489 * *pfVar300 + fVar428 + fVar372 * fVar81 + fVar321 * fVar350 +
                              fVar425 * *pfVar304 + fVar101 * fVar419 + fVar108 * fVar433 +
                              fVar443 + fVar483 * fVar407;
                  pfVar307[1] = fVar490 * fVar87 + fVar322 + fVar373 * fVar82 + fVar63 * fVar351 +
                                fVar426 * fVar121 + fVar102 * fVar421 + fVar330 * fVar468 +
                                fVar456 + fVar485 * fVar439;
                  pfVar307[2] = fVar75 * fVar88 + fVar323 + fVar374 * fVar83 + fVar64 * fVar352 +
                                fVar504 * fVar122 + fVar103 * fVar423 + fVar109 * fVar96 +
                                fVar458 + fVar502 * fVar473;
                  pfVar307[3] = fVar76 * fVar89 + fVar326 + fVar59 * fVar84 + fVar65 * fVar353 +
                                fVar505 * fVar123 + fVar104 * fVar380 + fVar110 * fVar97 +
                                fVar459 + fVar148 * fVar475;
                  pfVar307[4] = fVar77 * fVar90 + fVar327 + fVar60 * fVar85 + fVar66 * fVar354 +
                                fVar509 * fVar124 + fVar105 * fVar430 + fVar111 * fVar98 +
                                fVar461 + fVar149 * fVar477;
                  pfVar307[5] = fVar78 * fVar91 + fVar328 + fVar61 * fVar86 + fVar67 * fVar356 +
                                fVar420 * fVar125 + fVar106 * fVar410 + fVar112 * fVar99 +
                                fVar501 + fVar150 * fVar479;
                  pfVar307[6] = fVar79 * fVar92 + fVar329 + fVar62 * fVar333 + fVar506 * fVar357 +
                                fVar422 * fVar126 + fVar107 * fVar429 + fVar113 * fVar100 +
                                fVar382 + fVar151 * fVar481;
                  pfVar307[7] = fVar398 + fVar311 + fVar510 + fVar434 + fVar469;
                  pfVar300 = (float *)((long)pvVar302 + lVar286 + 0x20);
                  *pfVar300 = fVar372 * fVar489 + fVar428 + fVar321 * fVar81 + fVar515 * fVar350 +
                              fVar101 * fVar425 + fVar108 * fVar419 + fVar114 * fVar433 +
                              fVar441 * fVar139 + fVar483 * fVar383 + fVar400 * fVar407;
                  pfVar300[1] = fVar373 * fVar490 + fVar322 + fVar63 * fVar82 + fVar68 * fVar351 +
                                fVar102 * fVar426 + fVar330 * fVar421 + fVar115 * fVar468 +
                                fVar444 * fVar140 + fVar485 * fVar399 + fVar402 * fVar439;
                  pfVar300[2] = fVar374 * fVar75 + fVar323 + fVar64 * fVar83 + fVar69 * fVar352 +
                                fVar103 * fVar504 + fVar109 * fVar423 + fVar116 * fVar96 +
                                fVar457 * fVar141 + fVar502 * fVar401 + fVar498 * fVar473;
                  pfVar300[3] = fVar59 * fVar76 + fVar326 + fVar65 * fVar84 + fVar70 * fVar353 +
                                fVar104 * fVar505 + fVar110 * fVar380 + fVar117 * fVar97 +
                                fVar471 * fVar142 + fVar148 * fVar403 + fVar442 * fVar475;
                  pfVar300[4] = fVar60 * fVar77 + fVar327 + fVar66 * fVar85 + fVar71 * fVar354 +
                                fVar105 * fVar509 + fVar111 * fVar430 + fVar118 * fVar98 +
                                fVar499 * fVar143 + fVar149 * fVar404 + fVar455 * fVar477;
                  pfVar300[5] = fVar61 * fVar78 + fVar328 + fVar67 * fVar86 + fVar72 * fVar356 +
                                fVar106 * fVar420 + fVar112 * fVar410 + fVar119 * fVar99 +
                                fVar462 * fVar144 + fVar150 * fVar405 + fVar460 * fVar479;
                  pfVar300[6] = fVar62 * fVar79 + fVar329 + fVar506 * fVar333 + fVar73 * fVar357 +
                                fVar107 * fVar422 + fVar113 * fVar429 + fVar120 * fVar100 +
                                fVar464 * fVar145 + fVar151 * fVar406 + fVar463 * fVar481;
                  pfVar300[7] = fVar358 + fVar332 + fVar376 + fVar435 + fVar437;
                  *(undefined1 (*) [32])((long)pvVar302 + lVar286 + 0x40) = auVar396;
                  pfVar300 = (float *)((long)pvVar302 + lVar286 + 0x60);
                  *pfVar300 = fVar428 + fVar515 * fVar489 + fVar74 * fVar81 + fVar350 * fVar93 +
                              fVar114 * fVar425 + fVar440 * fVar419 + fVar433 * fVar132 +
                              fVar400 * fVar139 + fVar152 * fVar383 + fVar407 * fVar408;
                  pfVar300[1] = fVar322 + fVar68 * fVar490 + fVar494 * fVar82 + fVar351 * fVar94 +
                                fVar115 * fVar426 + fVar467 * fVar421 + fVar468 * fVar133 +
                                fVar402 * fVar140 + fVar153 * fVar399 + fVar439 * fVar493;
                  pfVar300[2] = fVar323 + fVar69 * fVar75 + fVar495 * fVar83 + fVar352 * fVar355 +
                                fVar116 * fVar504 + fVar127 * fVar423 + fVar96 * fVar134 +
                                fVar498 * fVar141 + fVar154 * fVar401 + fVar473 * fVar503;
                  pfVar300[3] = fVar326 + fVar70 * fVar76 + fVar496 * fVar84 + fVar353 * fVar411 +
                                fVar117 * fVar505 + fVar128 * fVar380 + fVar97 * fVar135 +
                                fVar442 * fVar142 + fVar155 * fVar403 + fVar475 * fVar331;
                  pfVar300[4] = fVar327 + fVar71 * fVar77 + fVar497 * fVar85 + fVar354 * fVar416 +
                                fVar118 * fVar509 + fVar129 * fVar430 + fVar98 * fVar136 +
                                fVar455 * fVar143 + fVar156 * fVar404 + fVar477 * fVar424;
                  pfVar300[5] = fVar328 + fVar72 * fVar78 + fVar325 * fVar86 + fVar356 * fVar417 +
                                fVar119 * fVar420 + fVar130 * fVar410 + fVar99 * fVar137 +
                                fVar460 * fVar144 + fVar157 * fVar405 + fVar479 * fVar147;
                  pfVar300[6] = fVar329 + fVar73 * fVar79 + fVar487 * fVar333 + fVar357 * fVar418 +
                                fVar120 * fVar422 + fVar131 * fVar429 + fVar100 * fVar138 +
                                fVar463 * fVar145 + fVar158 * fVar406 + fVar481 * fVar375;
                  pfVar300[7] = fVar332 + fVar80 + fVar349 + fVar488 + fVar427 + fVar95 + fVar436 +
                                fVar146 + fVar409 + in_register_0000135c;
                  lVar286 = lVar286 + 0x80;
                }
                for (; iVar292 + 1 < iVar273; iVar292 = iVar292 + 2) {
                  pfVar300 = (float *)(lVar308 + 0x20 + lVar286);
                  fVar358 = *pfVar300;
                  fVar372 = pfVar300[1];
                  fVar373 = pfVar300[2];
                  fVar374 = pfVar300[3];
                  fVar59 = pfVar300[4];
                  fVar60 = pfVar300[5];
                  fVar61 = pfVar300[6];
                  fVar62 = pfVar300[7];
                  pfVar300 = (float *)(lVar308 + 0x40 + lVar286);
                  fVar311 = *pfVar300;
                  fVar321 = pfVar300[1];
                  fVar63 = pfVar300[2];
                  fVar64 = pfVar300[3];
                  fVar65 = pfVar300[4];
                  fVar66 = pfVar300[5];
                  fVar67 = pfVar300[6];
                  fVar506 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303);
                  fVar510 = *pfVar300;
                  fVar515 = pfVar300[1];
                  fVar68 = pfVar300[2];
                  fVar69 = pfVar300[3];
                  fVar70 = pfVar300[4];
                  fVar71 = pfVar300[5];
                  fVar72 = pfVar300[6];
                  fVar73 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x20);
                  fVar74 = *pfVar300;
                  fVar494 = pfVar300[1];
                  fVar495 = pfVar300[2];
                  fVar496 = pfVar300[3];
                  fVar497 = pfVar300[4];
                  fVar325 = pfVar300[5];
                  fVar487 = pfVar300[6];
                  fVar488 = pfVar300[7];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x40);
                  fVar489 = *pfVar300;
                  fVar490 = pfVar300[1];
                  fVar75 = pfVar300[2];
                  fVar76 = pfVar300[3];
                  fVar77 = pfVar300[4];
                  fVar78 = pfVar300[5];
                  fVar79 = pfVar300[6];
                  pfVar300 = (float *)((long)pvVar301 + lVar303 + 0x60);
                  fVar80 = *pfVar300;
                  fVar81 = pfVar300[1];
                  fVar82 = pfVar300[2];
                  fVar83 = pfVar300[3];
                  fVar84 = pfVar300[4];
                  fVar85 = pfVar300[5];
                  fVar86 = pfVar300[6];
                  fVar333 = pfVar300[7];
                  pfVar300 = (float *)(lVar308 + lVar286);
                  fVar349 = pfVar300[1];
                  fVar350 = pfVar300[2];
                  fVar351 = pfVar300[3];
                  fVar352 = pfVar300[4];
                  fVar353 = pfVar300[5];
                  fVar354 = pfVar300[6];
                  fVar441 = fVar332 + in_register_0000139c;
                  pfVar304 = (float *)(lVar308 + 0x60 + lVar286);
                  fVar356 = *pfVar304;
                  fVar357 = pfVar304[1];
                  fVar87 = pfVar304[2];
                  fVar88 = pfVar304[3];
                  fVar89 = pfVar304[4];
                  fVar90 = pfVar304[5];
                  fVar91 = pfVar304[6];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0x80);
                  fVar92 = *pfVar304;
                  fVar425 = pfVar304[1];
                  fVar426 = pfVar304[2];
                  fVar504 = pfVar304[3];
                  fVar505 = pfVar304[4];
                  fVar509 = pfVar304[5];
                  fVar420 = pfVar304[6];
                  fVar422 = pfVar304[7];
                  pfVar304 = (float *)((long)pvVar301 + lVar303 + 0xa0);
                  fVar427 = *pfVar304;
                  fVar93 = pfVar304[1];
                  fVar94 = pfVar304[2];
                  fVar355 = pfVar304[3];
                  fVar411 = pfVar304[4];
                  fVar416 = pfVar304[5];
                  fVar417 = pfVar304[6];
                  fVar418 = pfVar304[7];
                  pfVar304 = (float *)(lVar305 + 0x20 + lVar286);
                  fVar419 = *pfVar304;
                  fVar421 = pfVar304[1];
                  fVar423 = pfVar304[2];
                  fVar380 = pfVar304[3];
                  fVar430 = pfVar304[4];
                  fVar410 = pfVar304[5];
                  fVar429 = pfVar304[6];
                  fVar95 = pfVar304[7];
                  pfVar304 = (float *)(lVar305 + lVar286);
                  fVar433 = pfVar304[1];
                  fVar468 = pfVar304[2];
                  fVar96 = pfVar304[3];
                  fVar97 = pfVar304[4];
                  fVar98 = pfVar304[5];
                  fVar99 = pfVar304[6];
                  pfVar307 = (float *)(lVar305 + 0x40 + lVar286);
                  fVar100 = *pfVar307;
                  fVar101 = pfVar307[1];
                  fVar102 = pfVar307[2];
                  fVar103 = pfVar307[3];
                  fVar104 = pfVar307[4];
                  fVar105 = pfVar307[5];
                  fVar106 = pfVar307[6];
                  pfVar309 = (float *)(lVar305 + 0x60 + lVar286);
                  fVar107 = *pfVar309;
                  fVar108 = pfVar309[1];
                  fVar330 = pfVar309[2];
                  fVar109 = pfVar309[3];
                  fVar110 = pfVar309[4];
                  fVar111 = pfVar309[5];
                  fVar112 = pfVar309[6];
                  pfVar309 = (float *)((long)pvVar301 + lVar303 + 0xc0);
                  fVar113 = *pfVar309;
                  fVar114 = pfVar309[1];
                  fVar115 = pfVar309[2];
                  fVar116 = pfVar309[3];
                  fVar117 = pfVar309[4];
                  fVar118 = pfVar309[5];
                  fVar119 = pfVar309[6];
                  fVar120 = pfVar309[7];
                  pfVar309 = (float *)((long)pvVar301 + lVar303 + 0xe0);
                  fVar121 = *pfVar309;
                  fVar122 = pfVar309[1];
                  fVar123 = pfVar309[2];
                  fVar124 = pfVar309[3];
                  fVar125 = pfVar309[4];
                  fVar126 = pfVar309[5];
                  fVar440 = pfVar309[6];
                  fVar467 = pfVar309[7];
                  pfVar280 = (float *)((long)pvVar301 + lVar303 + 0x100);
                  fVar127 = pfVar280[1];
                  fVar128 = pfVar280[2];
                  fVar129 = pfVar280[3];
                  fVar130 = pfVar280[4];
                  fVar131 = pfVar280[5];
                  fVar132 = pfVar280[6];
                  pfVar309 = (float *)(lVar306 + 0x20 + lVar286);
                  fVar133 = *pfVar309;
                  fVar134 = pfVar309[1];
                  fVar135 = pfVar309[2];
                  fVar136 = pfVar309[3];
                  fVar137 = pfVar309[4];
                  fVar138 = pfVar309[5];
                  fVar139 = pfVar309[6];
                  pfVar282 = (float *)(lVar306 + 0x40 + lVar286);
                  fVar140 = *pfVar282;
                  fVar141 = pfVar282[1];
                  fVar142 = pfVar282[2];
                  fVar143 = pfVar282[3];
                  fVar144 = pfVar282[4];
                  fVar145 = pfVar282[5];
                  fVar146 = pfVar282[6];
                  in_register_0000139c = pfVar282[7];
                  pfVar282 = (float *)(lVar306 + lVar286);
                  fVar444 = fVar113 * *pfVar282;
                  fVar457 = fVar114 * pfVar282[1];
                  fVar471 = fVar115 * pfVar282[2];
                  fVar499 = fVar116 * pfVar282[3];
                  fVar462 = fVar117 * pfVar282[4];
                  fVar464 = fVar118 * pfVar282[5];
                  fVar408 = fVar119 * pfVar282[6];
                  in_ZMM7 = ZEXT3264(CONCAT428(pfVar307[7],
                                               CONCAT424(fVar408,CONCAT420(fVar464,CONCAT416(fVar462
                                                  ,CONCAT412(fVar499,CONCAT48(fVar471,CONCAT44(
                                                  fVar457,fVar444))))))));
                  in_register_0000135c = pfVar307[7] + pfVar309[7];
                  fVar409 = in_register_0000135c + fVar467;
                  pfVar307 = (float *)(lVar306 + 0x60 + lVar286);
                  fVar383 = *pfVar280 * *pfVar307;
                  fVar399 = fVar127 * pfVar307[1];
                  fVar401 = fVar128 * pfVar307[2];
                  fVar403 = fVar129 * pfVar307[3];
                  fVar404 = fVar130 * pfVar307[4];
                  fVar405 = fVar131 * pfVar307[5];
                  fVar406 = fVar132 * pfVar307[6];
                  in_ZMM3 = ZEXT3264(CONCAT428(fVar409,CONCAT424(fVar406,CONCAT420(fVar405,CONCAT416
                                                  (fVar404,CONCAT412(fVar403,CONCAT48(fVar401,
                                                  CONCAT44(fVar399,fVar383))))))));
                  pfVar307 = (float *)((long)pvVar302 + lVar286);
                  *pfVar307 = fVar428 + fVar510 * *pfVar300 + fVar358 * fVar74 + fVar311 * fVar489 +
                              fVar80 * *pfVar304 + fVar419 * fVar92 + fVar100 * fVar427 +
                              fVar444 + fVar133 * fVar121 + fVar140 * *pfVar280;
                  pfVar307[1] = fVar322 + fVar515 * fVar349 + fVar372 * fVar494 + fVar321 * fVar490
                                + fVar81 * fVar433 + fVar421 * fVar425 + fVar101 * fVar93 +
                                fVar457 + fVar134 * fVar122 + fVar141 * fVar127;
                  pfVar307[2] = fVar323 + fVar68 * fVar350 + fVar373 * fVar495 + fVar63 * fVar75 +
                                fVar82 * fVar468 + fVar423 * fVar426 + fVar102 * fVar94 +
                                fVar471 + fVar135 * fVar123 + fVar142 * fVar128;
                  pfVar307[3] = fVar326 + fVar69 * fVar351 + fVar374 * fVar496 + fVar64 * fVar76 +
                                fVar83 * fVar96 + fVar380 * fVar504 + fVar103 * fVar355 +
                                fVar499 + fVar136 * fVar124 + fVar143 * fVar129;
                  pfVar307[4] = fVar327 + fVar70 * fVar352 + fVar59 * fVar497 + fVar65 * fVar77 +
                                fVar84 * fVar97 + fVar430 * fVar505 + fVar104 * fVar411 +
                                fVar462 + fVar137 * fVar125 + fVar144 * fVar130;
                  pfVar307[5] = fVar328 + fVar71 * fVar353 + fVar60 * fVar325 + fVar66 * fVar78 +
                                fVar85 * fVar98 + fVar410 * fVar509 + fVar105 * fVar416 +
                                fVar464 + fVar138 * fVar126 + fVar145 * fVar131;
                  pfVar307[6] = fVar329 + fVar72 * fVar354 + fVar61 * fVar487 + fVar67 * fVar79 +
                                fVar86 * fVar99 + fVar429 * fVar420 + fVar106 * fVar417 +
                                fVar408 + fVar139 * fVar440 + fVar146 * fVar132;
                  pfVar307[7] = fVar441 + fVar62 + fVar506 + fVar441 + fVar95 + fVar333 + fVar409;
                  pfVar300 = (float *)((long)pvVar302 + lVar286 + 0x20);
                  *pfVar300 = fVar428 + fVar358 * fVar510 + fVar311 * fVar74 + fVar489 * fVar356 +
                              fVar419 * fVar80 + fVar100 * fVar92 + fVar427 * fVar107 +
                              fVar133 * fVar113 + fVar140 * fVar121 + fVar383;
                  pfVar300[1] = fVar322 + fVar372 * fVar515 + fVar321 * fVar494 + fVar490 * fVar357
                                + fVar421 * fVar81 + fVar101 * fVar425 + fVar93 * fVar108 +
                                fVar134 * fVar114 + fVar141 * fVar122 + fVar399;
                  pfVar300[2] = fVar323 + fVar373 * fVar68 + fVar63 * fVar495 + fVar75 * fVar87 +
                                fVar423 * fVar82 + fVar102 * fVar426 + fVar94 * fVar330 +
                                fVar135 * fVar115 + fVar142 * fVar123 + fVar401;
                  pfVar300[3] = fVar326 + fVar374 * fVar69 + fVar64 * fVar496 + fVar76 * fVar88 +
                                fVar380 * fVar83 + fVar103 * fVar504 + fVar355 * fVar109 +
                                fVar136 * fVar116 + fVar143 * fVar124 + fVar403;
                  pfVar300[4] = fVar327 + fVar59 * fVar70 + fVar65 * fVar497 + fVar77 * fVar89 +
                                fVar430 * fVar84 + fVar104 * fVar505 + fVar411 * fVar110 +
                                fVar137 * fVar117 + fVar144 * fVar125 + fVar404;
                  pfVar300[5] = fVar328 + fVar60 * fVar71 + fVar66 * fVar325 + fVar78 * fVar90 +
                                fVar410 * fVar85 + fVar105 * fVar509 + fVar416 * fVar111 +
                                fVar138 * fVar118 + fVar145 * fVar126 + fVar405;
                  pfVar300[6] = fVar329 + fVar61 * fVar72 + fVar67 * fVar487 + fVar79 * fVar91 +
                                fVar429 * fVar86 + fVar106 * fVar420 + fVar417 * fVar112 +
                                fVar139 * fVar119 + fVar146 * fVar440 + fVar406;
                  pfVar300[7] = fVar332 + fVar73 + fVar488 + fVar506 + fVar333 + fVar422 + fVar418 +
                                fVar120 + fVar467 + fVar409;
                  lVar286 = lVar286 + 0x40;
                }
                for (; iVar292 < iVar273; iVar292 = iVar292 + 1) {
                  pfVar300 = (float *)(lVar308 + lVar286);
                  fVar358 = pfVar300[1];
                  fVar372 = pfVar300[2];
                  fVar373 = pfVar300[3];
                  fVar374 = pfVar300[4];
                  fVar59 = pfVar300[5];
                  fVar60 = pfVar300[6];
                  fVar61 = pfVar300[7];
                  pfVar282 = (float *)(lVar308 + 0x20 + lVar286);
                  fVar62 = pfVar282[1];
                  fVar311 = pfVar282[2];
                  fVar321 = pfVar282[3];
                  fVar63 = pfVar282[4];
                  fVar64 = pfVar282[5];
                  fVar65 = pfVar282[6];
                  fVar66 = pfVar282[7];
                  pfVar280 = (float *)(lVar308 + 0x40 + lVar286);
                  fVar67 = pfVar280[1];
                  fVar506 = pfVar280[2];
                  fVar510 = pfVar280[3];
                  fVar515 = pfVar280[4];
                  fVar68 = pfVar280[5];
                  fVar69 = pfVar280[6];
                  fVar70 = pfVar280[7];
                  pfVar304 = (float *)((long)pvVar301 + lVar303);
                  fVar71 = pfVar304[1];
                  fVar72 = pfVar304[2];
                  fVar73 = pfVar304[3];
                  fVar74 = pfVar304[4];
                  fVar494 = pfVar304[5];
                  fVar495 = pfVar304[6];
                  pfVar2 = (float *)((long)pvVar301 + lVar303 + 0x20);
                  fVar496 = pfVar2[1];
                  fVar497 = pfVar2[2];
                  fVar325 = pfVar2[3];
                  fVar487 = pfVar2[4];
                  fVar488 = pfVar2[5];
                  fVar489 = pfVar2[6];
                  pfVar3 = (float *)((long)pvVar301 + lVar303 + 0x40);
                  fVar490 = pfVar3[1];
                  fVar75 = pfVar3[2];
                  fVar76 = pfVar3[3];
                  fVar77 = pfVar3[4];
                  fVar78 = pfVar3[5];
                  fVar79 = pfVar3[6];
                  pfVar307 = (float *)(lVar305 + lVar286);
                  fVar80 = pfVar307[1];
                  fVar81 = pfVar307[2];
                  fVar82 = pfVar307[3];
                  fVar83 = pfVar307[4];
                  fVar84 = pfVar307[5];
                  fVar85 = pfVar307[6];
                  fVar86 = pfVar307[7];
                  pfVar4 = (float *)(lVar305 + 0x20 + lVar286);
                  fVar333 = pfVar4[1];
                  fVar349 = pfVar4[2];
                  fVar350 = pfVar4[3];
                  fVar351 = pfVar4[4];
                  fVar352 = pfVar4[5];
                  fVar353 = pfVar4[6];
                  fVar354 = pfVar4[7];
                  pfVar5 = (float *)(lVar305 + 0x40 + lVar286);
                  fVar356 = pfVar5[1];
                  fVar357 = pfVar5[2];
                  fVar87 = pfVar5[3];
                  fVar88 = pfVar5[4];
                  fVar89 = pfVar5[5];
                  fVar90 = pfVar5[6];
                  pfVar13 = (float *)((long)pvVar301 + lVar303 + 0x60);
                  fVar91 = pfVar13[1];
                  fVar92 = pfVar13[2];
                  fVar425 = pfVar13[3];
                  fVar426 = pfVar13[4];
                  fVar504 = pfVar13[5];
                  fVar505 = pfVar13[6];
                  pfVar16 = (float *)((long)pvVar301 + lVar303 + 0x80);
                  fVar509 = pfVar16[1];
                  fVar420 = pfVar16[2];
                  fVar422 = pfVar16[3];
                  fVar427 = pfVar16[4];
                  fVar93 = pfVar16[5];
                  fVar94 = pfVar16[6];
                  pfVar17 = (float *)((long)pvVar301 + lVar303 + 0xa0);
                  fVar355 = pfVar17[1];
                  fVar411 = pfVar17[2];
                  fVar416 = pfVar17[3];
                  fVar417 = pfVar17[4];
                  fVar418 = pfVar17[5];
                  fVar419 = pfVar17[6];
                  pfVar15 = (float *)(lVar306 + lVar286);
                  fVar421 = pfVar15[1];
                  fVar423 = pfVar15[2];
                  fVar380 = pfVar15[3];
                  fVar430 = pfVar15[4];
                  fVar410 = pfVar15[5];
                  fVar429 = pfVar15[6];
                  fVar95 = pfVar15[7];
                  pfVar14 = (float *)(lVar306 + 0x20 + lVar286);
                  fVar433 = pfVar14[1];
                  fVar468 = pfVar14[2];
                  fVar96 = pfVar14[3];
                  fVar97 = pfVar14[4];
                  fVar98 = pfVar14[5];
                  fVar99 = pfVar14[6];
                  fVar100 = pfVar14[7];
                  auVar346 = *(undefined1 (*) [32])(lVar306 + 0x40 + lVar286);
                  in_ZMM3 = ZEXT3264(auVar346);
                  pfVar18 = (float *)((long)pvVar301 + lVar303 + 0xc0);
                  fVar101 = pfVar18[1];
                  fVar102 = pfVar18[2];
                  fVar103 = pfVar18[3];
                  fVar104 = pfVar18[4];
                  fVar105 = pfVar18[5];
                  fVar106 = pfVar18[6];
                  pfVar19 = (float *)((long)pvVar301 + lVar303 + 0xe0);
                  fVar107 = pfVar19[1];
                  fVar108 = pfVar19[2];
                  fVar330 = pfVar19[3];
                  fVar109 = pfVar19[4];
                  fVar110 = pfVar19[5];
                  fVar111 = pfVar19[6];
                  pfVar20 = (float *)((long)pvVar301 + lVar303 + 0x100);
                  fVar112 = pfVar20[1];
                  fVar113 = pfVar20[2];
                  fVar114 = pfVar20[3];
                  fVar115 = pfVar20[4];
                  fVar116 = pfVar20[5];
                  fVar117 = pfVar20[6];
                  pfVar309 = (float *)((long)pvVar302 + lVar286);
                  *pfVar309 = fVar428 + *pfVar300 * *pfVar304 +
                              *pfVar282 * *pfVar2 + *pfVar280 * *pfVar3 +
                              *pfVar307 * *pfVar13 + *pfVar4 * *pfVar16 + *pfVar5 * *pfVar17 +
                              *pfVar15 * *pfVar18 + *pfVar14 * *pfVar19 + auVar346._0_4_ * *pfVar20;
                  pfVar309[1] = fVar322 + fVar358 * fVar71 + fVar62 * fVar496 + fVar67 * fVar490 +
                                fVar80 * fVar91 + fVar333 * fVar509 + fVar356 * fVar355 +
                                fVar421 * fVar101 + fVar433 * fVar107 + auVar346._4_4_ * fVar112;
                  pfVar309[2] = fVar323 + fVar372 * fVar72 + fVar311 * fVar497 + fVar506 * fVar75 +
                                fVar81 * fVar92 + fVar349 * fVar420 + fVar357 * fVar411 +
                                fVar423 * fVar102 + fVar468 * fVar108 + auVar346._8_4_ * fVar113;
                  pfVar309[3] = fVar326 + fVar373 * fVar73 + fVar321 * fVar325 + fVar510 * fVar76 +
                                fVar82 * fVar425 + fVar350 * fVar422 + fVar87 * fVar416 +
                                fVar380 * fVar103 + fVar96 * fVar330 + auVar346._12_4_ * fVar114;
                  pfVar309[4] = fVar327 + fVar374 * fVar74 + fVar63 * fVar487 + fVar515 * fVar77 +
                                fVar83 * fVar426 + fVar351 * fVar427 + fVar88 * fVar417 +
                                fVar430 * fVar104 + fVar97 * fVar109 + auVar346._16_4_ * fVar115;
                  pfVar309[5] = fVar328 + fVar59 * fVar494 + fVar64 * fVar488 + fVar68 * fVar78 +
                                fVar84 * fVar504 + fVar352 * fVar93 + fVar89 * fVar418 +
                                fVar410 * fVar105 + fVar98 * fVar110 + auVar346._20_4_ * fVar116;
                  pfVar309[6] = fVar329 + fVar60 * fVar495 + fVar65 * fVar489 + fVar69 * fVar79 +
                                fVar85 * fVar505 + fVar353 * fVar94 + fVar90 * fVar419 +
                                fVar429 * fVar106 + fVar99 * fVar111 + auVar346._24_4_ * fVar117;
                  pfVar309[7] = fVar332 + fVar61 + fVar66 + fVar70 + fVar86 + fVar354 + fVar354 +
                                fVar95 + fVar100 + fVar100;
                  lVar286 = lVar286 + 0x20;
                }
                lVar308 = lVar308 + lVar286 + 0x40;
                lVar305 = lVar305 + lVar286 + 0x40;
                lVar306 = lVar306 + lVar286 + 0x40;
                pvVar302 = (void *)((long)pvVar302 + lVar286);
              }
            }
          }
          else {
            iVar292 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var281) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var281) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var281) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var281) != 2)) goto LAB_003a6352;
            iVar273 = top_blob->w;
            lVar290 = *(long *)(&this->field_0x1b0 + (long)p_Var281);
            uVar294 = 0;
            uVar296 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar296 = uVar294;
            }
            fVar322 = local_320;
            if ((int)local_320 < 1) {
              fVar322 = 0.0;
            }
            lVar305 = (long)((iStack_32c - iVar273) * 0x10) * 4;
            for (; local_258 = CONCAT44(local_258._4_4_,(float)local_258),
                local_308 = CONCAT44(local_308._4_4_,(float)local_308), uVar294 != (uint)fVar322;
                uVar294 = uVar294 + 1) {
              if (lVar290 == 0) {
                uVar324 = 0;
                uVar312 = 0;
                uVar491 = 0;
                uVar492 = 0;
              }
              else {
                puVar1 = (undefined8 *)(lVar290 + uVar294 * 0x20);
                uVar312 = *puVar1;
                uVar324 = puVar1[1];
                uVar491 = puVar1[2];
                uVar492 = puVar1[3];
              }
              pauVar299 = (undefined1 (*) [32])
                          (top_blob->cstep * uVar294 * top_blob->elemsize + (long)top_blob->data);
              pvVar301 = (this->weight_data_tm).data;
              lVar308 = (long)(this->weight_data_tm).w * uVar294 * (this->weight_data_tm).elemsize;
              lVar303 = local_318 * uVar294 * CONCAT44(uStack_344,local_348) +
                        CONCAT44(fStack_354,local_358);
              lVar286 = (long)iStack_32c * CONCAT44(uStack_344,local_348);
              lVar306 = lVar303 + lVar286;
              lVar286 = lVar303 + lVar286 * 2;
              puVar1 = (undefined8 *)((long)pvVar301 + lVar308);
              uVar253 = puVar1[2];
              uVar255 = puVar1[3];
              puVar9 = (undefined8 *)((long)pvVar301 + lVar308 + 0x20);
              uVar256 = *puVar9;
              uVar259 = puVar9[1];
              uVar260 = puVar9[2];
              uVar261 = puVar9[3];
              pfVar300 = (float *)((long)pvVar301 + lVar308 + 0x40);
              local_2f8 = *pfVar300;
              fStack_2f4 = pfVar300[1];
              fStack_2f0 = pfVar300[2];
              fStack_2ec = pfVar300[3];
              fStack_2e8 = pfVar300[4];
              fStack_2e4 = pfVar300[5];
              fStack_2e0 = pfVar300[6];
              fStack_2dc = pfVar300[7];
              puVar10 = (ulong *)((long)pvVar301 + lVar308 + 0x60);
              uVar275 = *puVar10;
              uVar254 = puVar10[1];
              fStack_2c8 = *(float *)(puVar10 + 2);
              fStack_2c4 = *(float *)((long)puVar10 + 0x14);
              fStack_2c0 = *(float *)(puVar10 + 3);
              fStack_2bc = *(float *)((long)puVar10 + 0x1c);
              pauVar298 = (undefined1 (*) [16])((long)pvVar301 + lVar308 + 0x80);
              _local_2b8 = *pauVar298;
              fStack_2a8 = *(float *)pauVar298[1];
              fStack_2a4 = *(float *)(pauVar298[1] + 4);
              fStack_2a0 = *(float *)(pauVar298[1] + 8);
              fStack_29c = *(float *)(pauVar298[1] + 0xc);
              puVar10 = (ulong *)((long)pvVar301 + lVar308 + 0xa0);
              uVar276 = *puVar10;
              uVar277 = puVar10[2];
              uStack_260 = puVar10[3];
              pfVar300 = (float *)((long)pvVar301 + lVar308 + 0xc0);
              fVar323 = *pfVar300;
              fVar326 = pfVar300[1];
              fVar327 = pfVar300[2];
              fVar328 = pfVar300[3];
              fVar329 = pfVar300[4];
              fVar332 = pfVar300[5];
              fVar358 = pfVar300[6];
              pfVar300 = (float *)((long)pvVar301 + lVar308 + 0xe0);
              fVar372 = *pfVar300;
              fVar373 = pfVar300[1];
              fVar374 = pfVar300[2];
              fVar59 = pfVar300[3];
              fVar60 = pfVar300[4];
              fVar61 = pfVar300[5];
              fVar62 = pfVar300[6];
              pfVar300 = (float *)((long)pvVar301 + lVar308 + 0x100);
              fVar311 = *pfVar300;
              fVar321 = pfVar300[1];
              fVar63 = pfVar300[2];
              fVar64 = pfVar300[3];
              fVar65 = pfVar300[4];
              fVar66 = pfVar300[5];
              fVar67 = pfVar300[6];
              local_398 = (float)*puVar1;
              fStack_394 = (float)((ulong)*puVar1 >> 0x20);
              fStack_390 = (float)puVar1[1];
              fStack_38c = (float)((ulong)puVar1[1] >> 0x20);
              local_278._0_4_ = (float)uVar276;
              local_278._4_4_ = (float)(uVar276 >> 0x20);
              fStack_270 = (float)puVar10[1];
              fStack_26c = (float)(puVar10[1] >> 0x20);
              for (iVar284 = 0; iVar284 != (int)uVar296; iVar284 = iVar284 + 1) {
                lVar308 = 0;
                iVar292 = 0;
                fVar506 = fStack_2dc;
                fVar510 = fStack_2bc;
                fVar515 = fStack_29c;
                while( true ) {
                  fStack_388 = (float)uVar253;
                  fStack_384 = (float)((ulong)uVar253 >> 0x20);
                  fStack_380 = (float)uVar255;
                  local_3c8 = (float)uVar312;
                  fStack_3c4 = (float)((ulong)uVar312 >> 0x20);
                  fStack_3c0 = (float)uVar324;
                  fStack_3bc = (float)((ulong)uVar324 >> 0x20);
                  fStack_3b8 = (float)uVar491;
                  fStack_3b4 = (float)((ulong)uVar491 >> 0x20);
                  fStack_3b0 = (float)uVar492;
                  fStack_3ac = (float)((ulong)uVar492 >> 0x20);
                  local_378 = (float)uVar256;
                  fStack_374 = (float)((ulong)uVar256 >> 0x20);
                  fStack_370 = (float)uVar259;
                  fStack_36c = (float)((ulong)uVar259 >> 0x20);
                  fStack_368 = (float)uVar260;
                  fStack_364 = (float)((ulong)uVar260 >> 0x20);
                  fStack_360 = (float)uVar261;
                  local_2d8._0_4_ = (float)uVar275;
                  local_2d8._4_4_ = (float)(uVar275 >> 0x20);
                  uStack_2d0._0_4_ = (float)uVar254;
                  uStack_2d0._4_4_ = (float)(uVar254 >> 0x20);
                  uStack_268._0_4_ = (float)uVar277;
                  uStack_268._4_4_ = (float)(uVar277 >> 0x20);
                  if (iVar273 <= iVar292 + 3) break;
                  pfVar309 = (float *)(lVar303 + 0x40 + lVar308);
                  fVar68 = pfVar309[7];
                  pfVar15 = (float *)(lVar303 + 0x80 + lVar308);
                  pfVar16 = (float *)(lVar303 + 0xc0 + lVar308);
                  fVar69 = *pfVar16;
                  fVar70 = pfVar16[1];
                  fVar71 = pfVar16[2];
                  fVar72 = pfVar16[3];
                  fVar73 = pfVar16[4];
                  fVar74 = pfVar16[5];
                  fVar494 = pfVar16[6];
                  fStack_37c = (float)((ulong)uVar255 >> 0x20);
                  pfVar300 = (float *)(lVar303 + lVar308);
                  fVar504 = fVar506 + fStack_3ac;
                  fVar509 = fVar510 + fStack_3ac;
                  fVar515 = fVar515 + fStack_3ac;
                  fStack_35c = (float)((ulong)uVar261 >> 0x20);
                  pfVar282 = (float *)(lVar303 + 0x20 + lVar308);
                  pfVar280 = (float *)(lVar303 + 0x60 + lVar308);
                  pfVar17 = (float *)(lVar303 + 0xa0 + lVar308);
                  pfVar304 = (float *)(lVar303 + 0xe0 + lVar308);
                  fVar495 = *pfVar304;
                  fVar496 = pfVar304[1];
                  fVar497 = pfVar304[2];
                  fVar325 = pfVar304[3];
                  fVar487 = pfVar304[4];
                  fVar488 = pfVar304[5];
                  fVar489 = pfVar304[6];
                  pfVar304 = (float *)(lVar303 + 0x100 + lVar308);
                  fVar490 = *pfVar304;
                  fVar75 = pfVar304[1];
                  fVar76 = pfVar304[2];
                  fVar77 = pfVar304[3];
                  fVar78 = pfVar304[4];
                  fVar79 = pfVar304[5];
                  fVar80 = pfVar304[6];
                  pfVar2 = (float *)(lVar306 + 0x40 + lVar308);
                  pfVar18 = (float *)(lVar306 + 0x80 + lVar308);
                  pfVar304 = (float *)(lVar306 + 0xc0 + lVar308);
                  fVar81 = *pfVar304;
                  fVar82 = pfVar304[1];
                  fVar83 = pfVar304[2];
                  fVar84 = pfVar304[3];
                  fVar85 = pfVar304[4];
                  fVar86 = pfVar304[5];
                  fVar333 = pfVar304[6];
                  pfVar304 = (float *)(lVar306 + lVar308);
                  pfVar3 = (float *)(lVar306 + 0x20 + lVar308);
                  pfVar4 = (float *)(lVar306 + 0x60 + lVar308);
                  fVar505 = fVar504 + fVar515;
                  pfVar19 = (float *)(lVar306 + 0xa0 + lVar308);
                  fVar510 = fVar509 + fVar515;
                  pfVar307 = (float *)(lVar306 + 0xe0 + lVar308);
                  fVar349 = *pfVar307;
                  fVar350 = pfVar307[1];
                  fVar351 = pfVar307[2];
                  fVar352 = pfVar307[3];
                  fVar353 = pfVar307[4];
                  fVar354 = pfVar307[5];
                  fVar356 = pfVar307[6];
                  fVar425 = pfVar16[7] + fVar515 + pfVar2[7];
                  fVar426 = fVar505 + fVar425;
                  fVar427 = fVar510 + fVar426;
                  pfVar307 = (float *)(lVar306 + 0x100 + lVar308);
                  fVar357 = *pfVar307;
                  fVar87 = pfVar307[1];
                  fVar88 = pfVar307[2];
                  fVar89 = pfVar307[3];
                  fVar90 = pfVar307[4];
                  fVar91 = pfVar307[5];
                  fVar92 = pfVar307[6];
                  pfVar5 = (float *)(lVar286 + 0x40 + lVar308);
                  pfVar20 = (float *)(lVar286 + 0x80 + lVar308);
                  in_register_0000135c = pfVar20[7];
                  pfVar307 = (float *)(lVar286 + lVar308);
                  pfVar47 = (float *)(lVar286 + 0xc0 + lVar308);
                  pfVar13 = (float *)(lVar286 + 0x20 + lVar308);
                  pfVar14 = (float *)(lVar286 + 0x60 + lVar308);
                  pfVar48 = (float *)(lVar286 + 0xa0 + lVar308);
                  fVar506 = fVar510 + fVar505;
                  pfVar49 = (float *)(lVar286 + 0xe0 + lVar308);
                  fVar510 = fVar515 + fVar510;
                  fVar428 = pfVar18[7] + fVar505 + pfVar5[7];
                  auVar347._0_4_ =
                       local_398 * *pfVar300 + local_3c8 +
                       *pfVar309 * local_2f8 + local_378 * *pfVar282 +
                       (float)local_2d8 * *pfVar304 + (float)local_2b8._0_4_ * *pfVar3 +
                       *pfVar2 * (float)local_278 +
                       fVar323 * *pfVar307 + fVar372 * *pfVar13 + fVar311 * *pfVar5;
                  auVar347._4_4_ =
                       fStack_394 * pfVar300[1] + fStack_3c4 +
                       pfVar309[1] * fStack_2f4 + fStack_374 * pfVar282[1] +
                       local_2d8._4_4_ * pfVar304[1] + (float)local_2b8._4_4_ * pfVar3[1] +
                       pfVar2[1] * local_278._4_4_ +
                       fVar326 * pfVar307[1] + fVar373 * pfVar13[1] + fVar321 * pfVar5[1];
                  auVar347._8_4_ =
                       fStack_390 * pfVar300[2] + fStack_3c0 +
                       pfVar309[2] * fStack_2f0 + fStack_370 * pfVar282[2] +
                       (float)uStack_2d0 * pfVar304[2] + fStack_2b0 * pfVar3[2] +
                       pfVar2[2] * fStack_270 +
                       fVar327 * pfVar307[2] + fVar374 * pfVar13[2] + fVar63 * pfVar5[2];
                  auVar347._12_4_ =
                       fStack_38c * pfVar300[3] + fStack_3bc +
                       pfVar309[3] * fStack_2ec + fStack_36c * pfVar282[3] +
                       uStack_2d0._4_4_ * pfVar304[3] + fStack_2ac * pfVar3[3] +
                       pfVar2[3] * fStack_26c +
                       fVar328 * pfVar307[3] + fVar59 * pfVar13[3] + fVar64 * pfVar5[3];
                  auVar347._16_4_ =
                       fStack_388 * pfVar300[4] + fStack_3b8 +
                       pfVar309[4] * fStack_2e8 + fStack_368 * pfVar282[4] +
                       fStack_2c8 * pfVar304[4] + fStack_2a8 * pfVar3[4] +
                       pfVar2[4] * (float)uStack_268 +
                       fVar329 * pfVar307[4] + fVar60 * pfVar13[4] + fVar65 * pfVar5[4];
                  auVar347._20_4_ =
                       fStack_384 * pfVar300[5] + fStack_3b4 +
                       pfVar309[5] * fStack_2e4 + fStack_364 * pfVar282[5] +
                       fStack_2c4 * pfVar304[5] + fStack_2a4 * pfVar3[5] +
                       pfVar2[5] * uStack_268._4_4_ +
                       fVar332 * pfVar307[5] + fVar61 * pfVar13[5] + fVar66 * pfVar5[5];
                  auVar347._24_4_ =
                       fStack_380 * pfVar300[6] + fStack_3b0 +
                       pfVar309[6] * fStack_2e0 + fStack_360 * pfVar282[6] +
                       fStack_2c0 * pfVar304[6] + fStack_2a0 * pfVar3[6] +
                       pfVar2[6] * (float)uStack_260 +
                       fVar358 * pfVar307[6] + fVar62 * pfVar13[6] + fVar67 * pfVar5[6];
                  auVar347._28_4_ = fVar504 + fVar68 + fStack_3ac + fVar425 + fVar428;
                  in_ZMM1 = ZEXT3264(auVar347);
                  fVar428 = pfVar16[7] + fVar515 + fVar505 + fVar428;
                  auVar371._0_4_ =
                       *pfVar309 * local_398 + local_3c8 +
                       *pfVar15 * local_2f8 + local_378 * *pfVar280 +
                       *pfVar2 * (float)local_2d8 + (float)local_2b8._0_4_ * *pfVar4 +
                       *pfVar18 * (float)local_278 +
                       *pfVar5 * fVar323 + fVar372 * *pfVar14 + fVar311 * *pfVar20;
                  auVar371._4_4_ =
                       pfVar309[1] * fStack_394 + fStack_3c4 +
                       pfVar15[1] * fStack_2f4 + fStack_374 * pfVar280[1] +
                       pfVar2[1] * local_2d8._4_4_ + (float)local_2b8._4_4_ * pfVar4[1] +
                       pfVar18[1] * local_278._4_4_ +
                       pfVar5[1] * fVar326 + fVar373 * pfVar14[1] + fVar321 * pfVar20[1];
                  auVar371._8_4_ =
                       pfVar309[2] * fStack_390 + fStack_3c0 +
                       pfVar15[2] * fStack_2f0 + fStack_370 * pfVar280[2] +
                       pfVar2[2] * (float)uStack_2d0 + fStack_2b0 * pfVar4[2] +
                       pfVar18[2] * fStack_270 +
                       pfVar5[2] * fVar327 + fVar374 * pfVar14[2] + fVar63 * pfVar20[2];
                  auVar371._12_4_ =
                       pfVar309[3] * fStack_38c + fStack_3bc +
                       pfVar15[3] * fStack_2ec + fStack_36c * pfVar280[3] +
                       pfVar2[3] * uStack_2d0._4_4_ + fStack_2ac * pfVar4[3] +
                       pfVar18[3] * fStack_26c +
                       pfVar5[3] * fVar328 + fVar59 * pfVar14[3] + fVar64 * pfVar20[3];
                  auVar371._16_4_ =
                       pfVar309[4] * fStack_388 + fStack_3b8 +
                       pfVar15[4] * fStack_2e8 + fStack_368 * pfVar280[4] +
                       pfVar2[4] * fStack_2c8 + fStack_2a8 * pfVar4[4] +
                       pfVar18[4] * (float)uStack_268 +
                       pfVar5[4] * fVar329 + fVar60 * pfVar14[4] + fVar65 * pfVar20[4];
                  auVar371._20_4_ =
                       pfVar309[5] * fStack_384 + fStack_3b4 +
                       pfVar15[5] * fStack_2e4 + fStack_364 * pfVar280[5] +
                       pfVar2[5] * fStack_2c4 + fStack_2a4 * pfVar4[5] +
                       pfVar18[5] * uStack_268._4_4_ +
                       pfVar5[5] * fVar332 + fVar61 * pfVar14[5] + fVar66 * pfVar20[5];
                  auVar371._24_4_ =
                       pfVar309[6] * fStack_380 + fStack_3b0 +
                       pfVar15[6] * fStack_2e0 + fStack_360 * pfVar280[6] +
                       pfVar2[6] * fStack_2c0 + fStack_2a0 * pfVar4[6] +
                       pfVar18[6] * (float)uStack_260 +
                       pfVar5[6] * fVar358 + fVar62 * pfVar14[6] + fVar67 * pfVar20[6];
                  auVar371._28_4_ = fVar509 + fVar68 + in_ZMM2._28_4_ + fVar426 + fVar428;
                  in_ZMM2 = ZEXT3264(auVar371);
                  fVar428 = fVar506 + fVar428;
                  auVar397._0_4_ =
                       *pfVar15 * local_398 + local_3c8 + fVar69 * local_2f8 + local_378 * *pfVar17
                       + *pfVar18 * (float)local_2d8 + (float)local_2b8._0_4_ * *pfVar19 +
                         fVar81 * (float)local_278 +
                       *pfVar20 * fVar323 + fVar372 * *pfVar48 + *pfVar47 * fVar311;
                  auVar397._4_4_ =
                       pfVar15[1] * fStack_394 + fStack_3c4 +
                       fVar70 * fStack_2f4 + fStack_374 * pfVar17[1] +
                       pfVar18[1] * local_2d8._4_4_ + (float)local_2b8._4_4_ * pfVar19[1] +
                       fVar82 * local_278._4_4_ +
                       pfVar20[1] * fVar326 + fVar373 * pfVar48[1] + pfVar47[1] * fVar321;
                  auVar397._8_4_ =
                       pfVar15[2] * fStack_390 + fStack_3c0 +
                       fVar71 * fStack_2f0 + fStack_370 * pfVar17[2] +
                       pfVar18[2] * (float)uStack_2d0 + fStack_2b0 * pfVar19[2] +
                       fVar83 * fStack_270 +
                       pfVar20[2] * fVar327 + fVar374 * pfVar48[2] + pfVar47[2] * fVar63;
                  auVar397._12_4_ =
                       pfVar15[3] * fStack_38c + fStack_3bc +
                       fVar72 * fStack_2ec + fStack_36c * pfVar17[3] +
                       pfVar18[3] * uStack_2d0._4_4_ + fStack_2ac * pfVar19[3] + fVar84 * fStack_26c
                       + pfVar20[3] * fVar328 + fVar59 * pfVar48[3] + pfVar47[3] * fVar64;
                  auVar397._16_4_ =
                       pfVar15[4] * fStack_388 + fStack_3b8 +
                       fVar73 * fStack_2e8 + fStack_368 * pfVar17[4] +
                       pfVar18[4] * fStack_2c8 + fStack_2a8 * pfVar19[4] +
                       fVar85 * (float)uStack_268 +
                       pfVar20[4] * fVar329 + fVar60 * pfVar48[4] + pfVar47[4] * fVar65;
                  auVar397._20_4_ =
                       pfVar15[5] * fStack_384 + fStack_3b4 +
                       fVar74 * fStack_2e4 + fStack_364 * pfVar17[5] +
                       pfVar18[5] * fStack_2c4 + fStack_2a4 * pfVar19[5] + fVar86 * uStack_268._4_4_
                       + pfVar20[5] * fVar332 + fVar61 * pfVar48[5] + pfVar47[5] * fVar66;
                  auVar397._24_4_ =
                       pfVar15[6] * fStack_380 + fStack_3b0 +
                       fVar494 * fStack_2e0 + fStack_360 * pfVar17[6] +
                       pfVar18[6] * fStack_2c0 + fStack_2a0 * pfVar19[6] +
                       fVar333 * (float)uStack_260 +
                       pfVar20[6] * fVar358 + fVar62 * pfVar48[6] + pfVar47[6] * fVar67;
                  auVar397._28_4_ = fVar515 + fVar68 + in_ZMM3._28_4_ + fVar427 + fVar428;
                  in_ZMM3 = ZEXT3264(auVar397);
                  pfVar300 = (float *)(lVar286 + 0x100 + lVar308);
                  fVar425 = *pfVar47 * fVar323 + fVar372 * *pfVar49 + fVar311 * *pfVar300;
                  fVar426 = pfVar47[1] * fVar326 + fVar373 * pfVar49[1] + fVar321 * pfVar300[1];
                  fVar504 = pfVar47[2] * fVar327 + fVar374 * pfVar49[2] + fVar63 * pfVar300[2];
                  fVar505 = pfVar47[3] * fVar328 + fVar59 * pfVar49[3] + fVar64 * pfVar300[3];
                  fVar509 = pfVar47[4] * fVar329 + fVar60 * pfVar49[4] + fVar65 * pfVar300[4];
                  fVar420 = pfVar47[5] * fVar332 + fVar61 * pfVar49[5] + fVar66 * pfVar300[5];
                  fVar422 = pfVar47[6] * fVar358 + fVar62 * pfVar49[6] + fVar67 * pfVar300[6];
                  fVar428 = fVar510 + fVar428;
                  in_ZMM4 = ZEXT3264(CONCAT428(fVar428,CONCAT424(fVar422,CONCAT420(fVar420,CONCAT416
                                                  (fVar509,CONCAT412(fVar505,CONCAT48(fVar504,
                                                  CONCAT44(fVar426,fVar425))))))));
                  fVar428 = fStack_37c + fStack_3ac + fVar68 + fStack_35c +
                            fVar515 + fStack_2bc + fVar427 + fVar428;
                  *pauVar299 = auVar347;
                  pauVar299[1] = auVar371;
                  pauVar299[2] = auVar397;
                  *(float *)pauVar299[3] =
                       fVar69 * local_398 + local_3c8 + local_2f8 * fVar490 + local_378 * fVar495 +
                       (float)local_2b8._0_4_ * fVar349 + fVar81 * (float)local_2d8 +
                       (float)local_278 * fVar357 + fVar425;
                  *(float *)(pauVar299[3] + 4) =
                       fVar70 * fStack_394 + fStack_3c4 + fStack_2f4 * fVar75 + fStack_374 * fVar496
                       + (float)local_2b8._4_4_ * fVar350 + fVar82 * local_2d8._4_4_ +
                         local_278._4_4_ * fVar87 + fVar426;
                  *(float *)(pauVar299[3] + 8) =
                       fVar71 * fStack_390 + fStack_3c0 + fStack_2f0 * fVar76 + fStack_370 * fVar497
                       + fStack_2b0 * fVar351 + fVar83 * (float)uStack_2d0 + fStack_270 * fVar88 +
                       fVar504;
                  *(float *)(pauVar299[3] + 0xc) =
                       fVar72 * fStack_38c + fStack_3bc + fStack_2ec * fVar77 + fStack_36c * fVar325
                       + fStack_2ac * fVar352 + fVar84 * uStack_2d0._4_4_ + fStack_26c * fVar89 +
                       fVar505;
                  *(float *)(pauVar299[3] + 0x10) =
                       fVar73 * fStack_388 + fStack_3b8 + fStack_2e8 * fVar78 + fStack_368 * fVar487
                       + fStack_2a8 * fVar353 + fVar85 * fStack_2c8 + (float)uStack_268 * fVar90 +
                       fVar509;
                  *(float *)(pauVar299[3] + 0x14) =
                       fVar74 * fStack_384 + fStack_3b4 + fStack_2e4 * fVar79 + fStack_364 * fVar488
                       + fStack_2a4 * fVar354 + fVar86 * fStack_2c4 + uStack_268._4_4_ * fVar91 +
                       fVar420;
                  *(float *)(pauVar299[3] + 0x18) =
                       fVar494 * fStack_380 + fStack_3b0 +
                       fStack_2e0 * fVar80 + fStack_360 * fVar489 +
                       fStack_2a0 * fVar356 + fVar333 * fStack_2c0 + (float)uStack_260 * fVar92 +
                       fVar422;
                  *(float *)(pauVar299[3] + 0x1c) = fVar428;
                  pauVar299 = pauVar299 + 4;
                  iVar292 = iVar292 + 4;
                  lVar308 = lVar308 + 0x100;
                }
                for (; iVar292 + 1 < iVar273; iVar292 = iVar292 + 2) {
                  pfVar309 = (float *)(lVar303 + 0x40 + lVar308);
                  fVar510 = pfVar309[1];
                  fVar515 = pfVar309[2];
                  fVar68 = pfVar309[3];
                  fVar69 = pfVar309[4];
                  fVar70 = pfVar309[5];
                  fVar71 = pfVar309[6];
                  pfVar300 = (float *)(lVar303 + lVar308);
                  fVar72 = pfVar300[1];
                  fVar73 = pfVar300[2];
                  fVar74 = pfVar300[3];
                  fVar494 = pfVar300[4];
                  fVar495 = pfVar300[5];
                  fVar496 = pfVar300[6];
                  fVar355 = fStack_3ac + in_ZMM1._28_4_;
                  fVar506 = in_ZMM2._28_4_;
                  pfVar282 = (float *)(lVar303 + 0x20 + lVar308);
                  fVar497 = pfVar282[1];
                  fVar325 = pfVar282[2];
                  fVar487 = pfVar282[3];
                  fVar488 = pfVar282[4];
                  fVar489 = pfVar282[5];
                  fVar490 = pfVar282[6];
                  pfVar280 = (float *)(lVar303 + 0x60 + lVar308);
                  fVar410 = in_ZMM3._28_4_;
                  pfVar15 = (float *)(lVar303 + 0x80 + lVar308);
                  fVar429 = in_ZMM4._28_4_;
                  pfVar2 = (float *)(lVar306 + 0x40 + lVar308);
                  fVar75 = pfVar2[1];
                  fVar76 = pfVar2[2];
                  fVar77 = pfVar2[3];
                  fVar78 = pfVar2[4];
                  fVar79 = pfVar2[5];
                  fVar80 = pfVar2[6];
                  pfVar304 = (float *)(lVar306 + lVar308);
                  fVar81 = pfVar304[1];
                  fVar82 = pfVar304[2];
                  fVar83 = pfVar304[3];
                  fVar84 = pfVar304[4];
                  fVar85 = pfVar304[5];
                  fVar86 = pfVar304[6];
                  pfVar3 = (float *)(lVar306 + 0x20 + lVar308);
                  fVar333 = pfVar3[1];
                  fVar349 = pfVar3[2];
                  fVar350 = pfVar3[3];
                  fVar351 = pfVar3[4];
                  fVar352 = pfVar3[5];
                  fVar353 = pfVar3[6];
                  pfVar4 = (float *)(lVar306 + 0x60 + lVar308);
                  fVar430 = fVar429 + in_register_0000135c;
                  fVar428 = fVar410 + in_register_0000135c + pfVar2[7];
                  pfVar16 = (float *)(lVar306 + 0x80 + lVar308);
                  fVar380 = fVar430 + fVar428;
                  pfVar307 = (float *)(lVar286 + lVar308);
                  fVar354 = pfVar307[1];
                  fVar356 = pfVar307[2];
                  fVar357 = pfVar307[3];
                  fVar87 = pfVar307[4];
                  fVar88 = pfVar307[5];
                  fVar89 = pfVar307[6];
                  pfVar5 = (float *)(lVar286 + 0x40 + lVar308);
                  fVar90 = pfVar5[1];
                  fVar91 = pfVar5[2];
                  fVar92 = pfVar5[3];
                  fVar425 = pfVar5[4];
                  fVar426 = pfVar5[5];
                  fVar504 = pfVar5[6];
                  fVar505 = pfVar5[7];
                  pfVar13 = (float *)(lVar286 + 0x20 + lVar308);
                  fVar509 = pfVar13[1];
                  fVar420 = pfVar13[2];
                  fVar422 = pfVar13[3];
                  fVar427 = pfVar13[4];
                  fVar93 = pfVar13[5];
                  fVar94 = pfVar13[6];
                  pfVar14 = (float *)(lVar286 + 0x60 + lVar308);
                  fVar411 = *pfVar5 * fVar323 + fVar372 * *pfVar14;
                  fVar416 = fVar90 * fVar326 + fVar373 * pfVar14[1];
                  fVar417 = fVar91 * fVar327 + fVar374 * pfVar14[2];
                  fVar418 = fVar92 * fVar328 + fVar59 * pfVar14[3];
                  fVar419 = fVar425 * fVar329 + fVar60 * pfVar14[4];
                  fVar421 = fVar426 * fVar332 + fVar61 * pfVar14[5];
                  fVar423 = fVar504 * fVar358 + fVar62 * pfVar14[6];
                  fVar430 = fVar430 + in_register_0000135c;
                  in_ZMM4 = ZEXT3264(CONCAT428(fVar430,CONCAT424(fVar423,CONCAT420(fVar421,CONCAT416
                                                  (fVar419,CONCAT412(fVar418,CONCAT48(fVar417,
                                                  CONCAT44(fVar416,fVar411))))))));
                  pfVar14 = (float *)(lVar286 + 0x80 + lVar308);
                  in_ZMM3 = ZEXT3264(CONCAT428(fVar505,CONCAT424(fVar67 * pfVar14[6],
                                                                 CONCAT420(fVar66 * pfVar14[5],
                                                                           CONCAT416(fVar65 * 
                                                  pfVar14[4],
                                                  CONCAT412(fVar64 * pfVar14[3],
                                                            CONCAT48(fVar63 * pfVar14[2],
                                                                     CONCAT44(fVar321 * pfVar14[1],
                                                                              fVar311 * *pfVar14))))
                                                  ))));
                  fVar428 = fVar355 + fVar410 + pfVar309[7] + fVar428 +
                            fVar380 + in_register_0000135c + fVar505;
                  fVar411 = fVar411 + fVar311 * *pfVar14;
                  fVar416 = fVar416 + fVar321 * pfVar14[1];
                  fVar417 = fVar417 + fVar63 * pfVar14[2];
                  fVar418 = fVar418 + fVar64 * pfVar14[3];
                  fVar419 = fVar419 + fVar65 * pfVar14[4];
                  fVar421 = fVar421 + fVar66 * pfVar14[5];
                  fVar423 = fVar423 + fVar67 * pfVar14[6];
                  fVar430 = fVar430 + fVar505;
                  in_ZMM2 = ZEXT3264(CONCAT428(fVar430,CONCAT424(fVar423,CONCAT420(fVar421,CONCAT416
                                                  (fVar419,CONCAT412(fVar418,CONCAT48(fVar417,
                                                  CONCAT44(fVar416,fVar411))))))));
                  auVar348._0_4_ =
                       local_3c8 + local_398 * *pfVar309 +
                       local_378 * *pfVar280 + local_2f8 * *pfVar15 +
                       (float)local_2d8 * *pfVar2 + (float)local_2b8._0_4_ * *pfVar4 +
                       (float)local_278 * *pfVar16 + fVar411;
                  auVar348._4_4_ =
                       fStack_3c4 + fStack_394 * fVar510 +
                       fStack_374 * pfVar280[1] + fStack_2f4 * pfVar15[1] +
                       local_2d8._4_4_ * fVar75 + (float)local_2b8._4_4_ * pfVar4[1] +
                       local_278._4_4_ * pfVar16[1] + fVar416;
                  auVar348._8_4_ =
                       fStack_3c0 + fStack_390 * fVar515 +
                       fStack_370 * pfVar280[2] + fStack_2f0 * pfVar15[2] +
                       (float)uStack_2d0 * fVar76 + fStack_2b0 * pfVar4[2] + fStack_270 * pfVar16[2]
                       + fVar417;
                  auVar348._12_4_ =
                       fStack_3bc + fStack_38c * fVar68 +
                       fStack_36c * pfVar280[3] + fStack_2ec * pfVar15[3] +
                       uStack_2d0._4_4_ * fVar77 + fStack_2ac * pfVar4[3] + fStack_26c * pfVar16[3]
                       + fVar418;
                  auVar348._16_4_ =
                       fStack_3b8 + fStack_388 * fVar69 +
                       fStack_368 * pfVar280[4] + fStack_2e8 * pfVar15[4] +
                       fStack_2c8 * fVar78 + fStack_2a8 * pfVar4[4] + (float)uStack_268 * pfVar16[4]
                       + fVar419;
                  auVar348._20_4_ =
                       fStack_3b4 + fStack_384 * fVar70 +
                       fStack_364 * pfVar280[5] + fStack_2e4 * pfVar15[5] +
                       fStack_2c4 * fVar79 + fStack_2a4 * pfVar4[5] + uStack_268._4_4_ * pfVar16[5]
                       + fVar421;
                  auVar348._24_4_ =
                       fStack_3b0 + fStack_380 * fVar71 +
                       fStack_360 * pfVar280[6] + fStack_2e0 * pfVar15[6] +
                       fStack_2c0 * fVar80 + fStack_2a0 * pfVar4[6] + (float)uStack_260 * pfVar16[6]
                       + fVar423;
                  auVar348._28_4_ = fStack_3ac + fVar506 + fVar429 + fVar355 + fVar380 + fVar430;
                  in_ZMM1 = ZEXT3264(auVar348);
                  *(float *)*pauVar299 =
                       local_3c8 + local_398 * *pfVar300 +
                       local_378 * *pfVar282 + local_2f8 * *pfVar309 +
                       (float)local_2d8 * *pfVar304 + (float)local_2b8._0_4_ * *pfVar3 +
                       *pfVar2 * (float)local_278 +
                       fVar323 * *pfVar307 + fVar372 * *pfVar13 + fVar311 * *pfVar5;
                  *(float *)((long)*pauVar299 + 4) =
                       fStack_3c4 + fStack_394 * fVar72 +
                       fStack_374 * fVar497 + fStack_2f4 * fVar510 +
                       local_2d8._4_4_ * fVar81 + (float)local_2b8._4_4_ * fVar333 +
                       fVar75 * local_278._4_4_ +
                       fVar326 * fVar354 + fVar373 * fVar509 + fVar321 * fVar90;
                  *(float *)((long)*pauVar299 + 8) =
                       fStack_3c0 + fStack_390 * fVar73 +
                       fStack_370 * fVar325 + fStack_2f0 * fVar515 +
                       (float)uStack_2d0 * fVar82 + fStack_2b0 * fVar349 + fVar76 * fStack_270 +
                       fVar327 * fVar356 + fVar374 * fVar420 + fVar63 * fVar91;
                  *(float *)((long)*pauVar299 + 0xc) =
                       fStack_3bc + fStack_38c * fVar74 + fStack_36c * fVar487 + fStack_2ec * fVar68
                       + uStack_2d0._4_4_ * fVar83 + fStack_2ac * fVar350 + fVar77 * fStack_26c +
                       fVar328 * fVar357 + fVar59 * fVar422 + fVar64 * fVar92;
                  *(float *)((long)*pauVar299 + 0x10) =
                       fStack_3b8 + fStack_388 * fVar494 +
                       fStack_368 * fVar488 + fStack_2e8 * fVar69 +
                       fStack_2c8 * fVar84 + fStack_2a8 * fVar351 + fVar78 * (float)uStack_268 +
                       fVar329 * fVar87 + fVar60 * fVar427 + fVar65 * fVar425;
                  *(float *)((long)*pauVar299 + 0x14) =
                       fStack_3b4 + fStack_384 * fVar495 +
                       fStack_364 * fVar489 + fStack_2e4 * fVar70 +
                       fStack_2c4 * fVar85 + fStack_2a4 * fVar352 + fVar79 * uStack_268._4_4_ +
                       fVar332 * fVar88 + fVar61 * fVar93 + fVar66 * fVar426;
                  *(float *)((long)*pauVar299 + 0x18) =
                       fStack_3b0 + fStack_380 * fVar496 +
                       fStack_360 * fVar490 + fStack_2e0 * fVar71 +
                       fStack_2c0 * fVar86 + fStack_2a0 * fVar353 + fVar80 * (float)uStack_260 +
                       fVar358 * fVar89 + fVar62 * fVar94 + fVar67 * fVar504;
                  *(float *)((long)*pauVar299 + 0x1c) = fVar428;
                  pauVar299[1] = auVar348;
                  pauVar299 = pauVar299 + 2;
                  lVar308 = lVar308 + 0x80;
                }
                for (; iVar292 < iVar273; iVar292 = iVar292 + 1) {
                  pfVar300 = (float *)(lVar303 + lVar308);
                  fVar510 = pfVar300[1];
                  fVar515 = pfVar300[2];
                  fVar68 = pfVar300[3];
                  fVar69 = pfVar300[4];
                  fVar70 = pfVar300[5];
                  fVar71 = pfVar300[6];
                  pfVar309 = (float *)(lVar303 + 0x20 + lVar308);
                  fVar72 = pfVar309[1];
                  fVar73 = pfVar309[2];
                  fVar74 = pfVar309[3];
                  fVar494 = pfVar309[4];
                  fVar495 = pfVar309[5];
                  fVar496 = pfVar309[6];
                  pfVar282 = (float *)(lVar303 + 0x40 + lVar308);
                  fVar497 = pfVar282[1];
                  fVar325 = pfVar282[2];
                  fVar487 = pfVar282[3];
                  fVar488 = pfVar282[4];
                  fVar489 = pfVar282[5];
                  fVar490 = pfVar282[6];
                  fVar506 = in_ZMM2._28_4_;
                  fVar356 = in_ZMM1._28_4_ + fVar506;
                  pfVar304 = (float *)(lVar306 + lVar308);
                  fVar75 = pfVar304[1];
                  fVar76 = pfVar304[2];
                  fVar77 = pfVar304[3];
                  fVar78 = pfVar304[4];
                  fVar79 = pfVar304[5];
                  fVar80 = pfVar304[6];
                  pfVar280 = (float *)(lVar306 + 0x20 + lVar308);
                  fVar81 = pfVar280[1];
                  fVar82 = pfVar280[2];
                  fVar83 = pfVar280[3];
                  fVar84 = pfVar280[4];
                  fVar85 = pfVar280[5];
                  fVar86 = pfVar280[6];
                  pfVar307 = (float *)(lVar306 + 0x40 + lVar308);
                  auVar320._0_4_ = (float)local_278 * *pfVar307;
                  auVar320._4_4_ = local_278._4_4_ * pfVar307[1];
                  auVar320._8_4_ = fStack_270 * pfVar307[2];
                  auVar320._12_4_ = fStack_26c * pfVar307[3];
                  auVar320._16_4_ = (float)uStack_268 * pfVar307[4];
                  auVar320._20_4_ = uStack_268._4_4_ * pfVar307[5];
                  auVar320._28_36_ = in_ZMM3._28_36_;
                  auVar320._24_4_ = (float)uStack_260 * pfVar307[6];
                  fVar357 = fVar356 + fVar506 + in_ZMM3._28_4_;
                  pfVar307 = (float *)(lVar286 + lVar308);
                  pfVar2 = (float *)(lVar286 + 0x20 + lVar308);
                  pfVar3 = (float *)(lVar286 + 0x40 + lVar308);
                  in_ZMM2 = ZEXT3264(CONCAT428(fVar506,CONCAT424(fVar67 * pfVar3[6],
                                                                 CONCAT420(fVar66 * pfVar3[5],
                                                                           CONCAT416(fVar65 * pfVar3
                                                  [4],CONCAT412(fVar64 * pfVar3[3],
                                                                CONCAT48(fVar63 * pfVar3[2],
                                                                         CONCAT44(fVar321 * pfVar3[1
                                                  ],fVar311 * *pfVar3))))))));
                  fVar333 = fVar323 * *pfVar307 + fVar372 * *pfVar2 + fVar311 * *pfVar3;
                  fVar349 = fVar326 * pfVar307[1] + fVar373 * pfVar2[1] + fVar321 * pfVar3[1];
                  fVar350 = fVar327 * pfVar307[2] + fVar374 * pfVar2[2] + fVar63 * pfVar3[2];
                  fVar351 = fVar328 * pfVar307[3] + fVar59 * pfVar2[3] + fVar64 * pfVar3[3];
                  fVar352 = fVar329 * pfVar307[4] + fVar60 * pfVar2[4] + fVar65 * pfVar3[4];
                  fVar353 = fVar332 * pfVar307[5] + fVar61 * pfVar2[5] + fVar66 * pfVar3[5];
                  fVar354 = fVar358 * pfVar307[6] + fVar62 * pfVar2[6] + fVar67 * pfVar3[6];
                  fVar506 = fVar506 + fVar357 + fVar506;
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar506,CONCAT424(fVar354,CONCAT420(fVar353,CONCAT416
                                                  (fVar352,CONCAT412(fVar351,CONCAT48(fVar350,
                                                  CONCAT44(fVar349,fVar333))))))));
                  fVar428 = fStack_3ac + fVar428 + fVar356 + fVar357 + fVar506;
                  *(float *)*pauVar299 =
                       local_3c8 + local_398 * *pfVar300 +
                       local_378 * *pfVar309 + local_2f8 * *pfVar282 +
                       (float)local_2d8 * *pfVar304 + (float)local_2b8._0_4_ * *pfVar280 +
                       auVar320._0_4_ + fVar333;
                  *(float *)((long)*pauVar299 + 4) =
                       fStack_3c4 + fStack_394 * fVar510 +
                       fStack_374 * fVar72 + fStack_2f4 * fVar497 +
                       local_2d8._4_4_ * fVar75 + (float)local_2b8._4_4_ * fVar81 + auVar320._4_4_ +
                       fVar349;
                  *(float *)((long)*pauVar299 + 8) =
                       fStack_3c0 + fStack_390 * fVar515 +
                       fStack_370 * fVar73 + fStack_2f0 * fVar325 +
                       (float)uStack_2d0 * fVar76 + fStack_2b0 * fVar82 + auVar320._8_4_ + fVar350;
                  *(float *)((long)*pauVar299 + 0xc) =
                       fStack_3bc + fStack_38c * fVar68 + fStack_36c * fVar74 + fStack_2ec * fVar487
                       + uStack_2d0._4_4_ * fVar77 + fStack_2ac * fVar83 + auVar320._12_4_ + fVar351
                  ;
                  *(float *)((long)*pauVar299 + 0x10) =
                       fStack_3b8 + fStack_388 * fVar69 +
                       fStack_368 * fVar494 + fStack_2e8 * fVar488 +
                       fStack_2c8 * fVar78 + fStack_2a8 * fVar84 + auVar320._16_4_ + fVar352;
                  *(float *)((long)*pauVar299 + 0x14) =
                       fStack_3b4 + fStack_384 * fVar70 +
                       fStack_364 * fVar495 + fStack_2e4 * fVar489 +
                       fStack_2c4 * fVar79 + fStack_2a4 * fVar85 + auVar320._20_4_ + fVar353;
                  *(float *)((long)*pauVar299 + 0x18) =
                       fStack_3b0 + fStack_380 * fVar71 +
                       fStack_360 * fVar496 + fStack_2e0 * fVar490 +
                       fStack_2c0 * fVar80 + fStack_2a0 * fVar86 + auVar320._24_4_ + fVar354;
                  *(float *)((long)*pauVar299 + 0x1c) = fVar428;
                  pauVar299 = pauVar299 + 1;
                  lVar308 = lVar308 + 0x40;
                  in_ZMM3 = ZEXT3264(auVar320._0_32_);
                }
                lVar303 = lVar303 + lVar305 + lVar308;
                lVar306 = lVar306 + lVar305 + lVar308;
                lVar286 = lVar286 + lVar305 + lVar308;
              }
              local_2d8 = uVar275;
              uStack_2d0 = uVar254;
              uStack_268 = uVar277;
              local_278 = uVar276;
            }
          }
          goto LAB_003a66c5;
        }
LAB_003a6352:
        uVar283 = iVar292 * iVar273;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar283,(allocator_type *)&opt_p);
        pp_Var56 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var281 = pp_Var56[-3];
        iVar273 = *(int *)(&this->field_0xe0 + (long)p_Var281);
        iVar292 = *(int *)(&this->field_0xdc + (long)p_Var281);
        iVar278 = *(int *)(&this->field_0xd4 + (long)p_Var281);
        iVar289 = 0;
        lVar290 = 0;
        for (iVar285 = 0; iVar285 < *(int *)(&this->field_0xd8 + (long)p_Var281);
            iVar285 = iVar285 + 1) {
          for (lVar305 = 0; (int)lVar305 < *(int *)(&this->field_0xd4 + (long)p_Var281);
              lVar305 = lVar305 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar290 + lVar305] = iVar289;
            p_Var281 = pp_Var56[-3];
            iVar289 = iVar289 + *(int *)(&this->field_0xdc + (long)p_Var281);
          }
          iVar289 = iVar289 + (iVar271 * iVar273 - iVar292 * iVar278);
          lVar290 = (int)lVar290 + lVar305;
        }
        local_2b8._0_4_ = uVar283 * 8;
        iVar273 = (int)(float)local_2d8 << 3;
        uVar294 = 0;
        uVar296 = (ulong)uVar283;
        if ((int)uVar283 < 1) {
          uVar296 = uVar294;
        }
        uVar276 = (ulong)(uint)local_2f8;
        if ((int)local_2f8 < 1) {
          uVar276 = uVar294;
        }
        local_2f8 = (float)uVar276;
        fStack_2f4 = 0.0;
        uVar277 = 0;
        while (uVar275 = uVar277, uVar275 != uVar276) {
          pvVar301 = (void *)(top_blob->cstep * uVar275 * top_blob->elemsize + (long)top_blob->data)
          ;
          pvVar279 = (this->weight_data_tm).data;
          for (iVar292 = 0; iVar292 <= (int)local_398; iVar292 = iVar292 + 1) {
            pp_Var56 = this->_vptr_ConvolutionDepthWise_x86_avx;
            for (lVar290 = 0; lVar290 <= iVar284; lVar290 = lVar290 + 1) {
              p_Var281 = pp_Var56[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var281) == 0) {
                fVar428 = 0.0;
                fVar322 = 0.0;
                fVar323 = 0.0;
                fVar326 = 0.0;
                fVar327 = 0.0;
                fVar328 = 0.0;
                fVar329 = 0.0;
                fVar332 = 0.0;
              }
              else {
                pfVar300 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var281) + uVar275 * 0x20
                                    );
                fVar428 = *pfVar300;
                fVar322 = pfVar300[1];
                fVar323 = pfVar300[2];
                fVar326 = pfVar300[3];
                fVar327 = pfVar300[4];
                fVar328 = pfVar300[5];
                fVar329 = pfVar300[6];
                fVar332 = pfVar300[7];
              }
              for (lVar305 = 0; uVar296 * 4 != lVar305; lVar305 = lVar305 + 4) {
                pfVar300 = (float *)((long)pvVar279 + lVar305 * 8 + (long)(int)uVar294 * 4);
                pfVar304 = (float *)((long)iVar292 *
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var281) *
                                     (long)iStack_32c * CONCAT44(uStack_344,local_348) +
                                     local_318 * uVar275 * CONCAT44(uStack_344,local_348) +
                                     CONCAT44(fStack_354,local_358) +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var281) *
                                            (int)lVar290 * 8) * 4 +
                                    (long)*(int *)((long)_space_ofs.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar305
                                                  ) * 0x20);
                fVar428 = *pfVar300 * *pfVar304 + fVar428;
                fVar322 = pfVar300[1] * pfVar304[1] + fVar322;
                fVar323 = pfVar300[2] * pfVar304[2] + fVar323;
                fVar326 = pfVar300[3] * pfVar304[3] + fVar326;
                fVar327 = pfVar300[4] * pfVar304[4] + fVar327;
                fVar328 = pfVar300[5] * pfVar304[5] + fVar328;
                fVar329 = pfVar300[6] * pfVar304[6] + fVar329;
                fVar332 = pfVar300[7] + fVar332;
              }
              pfVar300 = (float *)((long)pvVar301 + lVar290 * 0x20);
              *pfVar300 = fVar428;
              pfVar300[1] = fVar322;
              pfVar300[2] = fVar323;
              pfVar300[3] = fVar326;
              pfVar300[4] = fVar327;
              pfVar300[5] = fVar328;
              pfVar300[6] = fVar329;
              pfVar300[7] = fVar332;
            }
            pvVar301 = (void *)((long)pvVar301 + (long)iVar273 * 4);
          }
          uVar294 = (ulong)((int)uVar294 + uVar283 * 8);
          local_2d8 = uVar275;
          uVar277 = uVar275 + 1;
        }
        pLVar57 = this->activation;
        if (pLVar57 != (Layer *)0x0) {
          (*pLVar57->_vptr_Layer[9])(pLVar57,top_blob,opt);
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    iVar289 = 0;
    goto LAB_003a6670;
  }
LAB_003a459b:
  uVar296 = (long)iVar274 / (long)iVar52;
  uVar276 = (long)iVar289 / (long)iVar52;
  if (opt->use_packing_layout == true) {
    uVar283 = (uint)((uVar296 & 3) == 0) * 3 + 1;
    if ((uVar296 & 7) == 0) {
      uVar283 = 8;
    }
    _elempack = (uint)((uVar276 & 3) == 0) * 3 + 1;
    if ((uVar276 & 7) == 0) {
      _elempack = 8;
    }
  }
  else {
    uVar283 = 1;
    _elempack = uVar283;
  }
  piVar55 = (int *)CONCAT44(uStack_34c,uStack_350);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT44(fStack_354,local_358);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)CONCAT44(uStack_34c,uStack_350);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(uStack_344,local_348);
  pAVar262 = (Allocator *)CONCAT44(uStack_334,local_338);
  uVar312._4_4_ = iStack_32c;
  uVar312._0_4_ = iStack_330;
  uVar324._4_4_ = iStack_324;
  uVar324._0_4_ = local_328;
  if (piVar55 != (int *)0x0) {
    LOCK();
    *piVar55 = *piVar55 + 1;
    UNLOCK();
  }
  if ((int)uVar283 < iVar273) {
    opt_p.lightmode = opt->lightmode;
    opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_p.num_threads = opt->num_threads;
    opt_p.workspace_allocator = opt->workspace_allocator;
    opt_p.openmp_blocktime = opt->openmp_blocktime;
    opt_p.use_winograd_convolution = opt->use_winograd_convolution;
    opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_p.use_int8_inference = opt->use_int8_inference;
    opt_p.use_vulkan_compute = opt->use_vulkan_compute;
    opt_p.use_bf16_storage = opt->use_bf16_storage;
    opt_p.use_fp16_packed = opt->use_fp16_packed;
    opt_p.use_fp16_storage = opt->use_fp16_storage;
    opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_p.use_int8_packed = opt->use_int8_packed;
    opt_p.use_int8_storage = opt->use_int8_storage;
    opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_p.use_packing_layout = opt->use_packing_layout;
    opt_p.use_shader_pack8 = opt->use_shader_pack8;
    opt_p.use_subgroup_basic = opt->use_subgroup_basic;
    opt_p.use_subgroup_vote = opt->use_subgroup_vote;
    opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_p.use_image_storage = opt->use_image_storage;
    opt_p.use_tensor_storage = opt->use_tensor_storage;
    opt_p.use_reserved_0 = opt->use_reserved_0;
    opt_p.flush_denormals = opt->flush_denormals;
    opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_p.use_shader_local_memory = opt->use_shader_local_memory;
    opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_p.use_reserved_7 = opt->use_reserved_7;
    opt_p.use_reserved_8 = opt->use_reserved_8;
    opt_p.use_reserved_9 = opt->use_reserved_9;
    opt_p.use_reserved_10 = opt->use_reserved_10;
    opt_p.use_reserved_11 = opt->use_reserved_11;
    opt_p.blob_allocator = opt->workspace_allocator;
    convert_packing((Mat *)&local_358,(Mat *)&_space_ofs,uVar283,&opt_p);
  }
  piVar55 = top_blob->refcount;
  opt_p._0_8_ = top_blob->data;
  opt_p.blob_allocator = (Allocator *)top_blob->refcount;
  opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
  opt_p.openmp_blocktime = top_blob->elempack;
  opt_p._32_8_ = top_blob->allocator;
  opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
  opt_p._48_8_ = *(undefined8 *)&top_blob->h;
  opt_p._56_4_ = top_blob->c;
  sVar53 = top_blob->cstep;
  if (piVar55 != (int *)0x0) {
    LOCK();
    *piVar55 = *piVar55 + 1;
    UNLOCK();
  }
  if (_elempack < _elempack_00) {
    Mat::create((Mat *)&opt_p,(int)(float)local_2d8,local_2b8._0_4_,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
                (int)_elempack,(ulong)_elempack * (local_278 / uVar294),_elempack,
                opt->workspace_allocator);
    iVar289 = -100;
    if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar53 != 0)) goto LAB_003a47c1;
  }
  else {
LAB_003a47c1:
    iVar284 = 0;
    iVar273 = 0;
    for (lVar290 = 0;
        lVar290 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
        lVar290 = lVar290 + 1) {
      m.c = (int)uVar296 / (int)uVar283;
      m.data = (void *)((long)(iVar284 / (int)uVar283) * sVar54 *
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                       (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      m.refcount = (int *)0x0;
      m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      m.elempack = iVar292;
      m.cstep = ((long)iVar272 *
                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * (long)iVar285 * (long)iVar278 +
                 0xfU & 0xfffffffffffffff0) /
                (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      m_1.c = (int)uVar276 / (int)_elempack;
      m_1.data = (void *)((long)(iVar273 / (int)_elempack) * sVar53 *
                          (long)opt_p.workspace_allocator + opt_p._0_8_);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)opt_p.workspace_allocator;
      m_1.elempack = opt_p.openmp_blocktime;
      m_1.allocator = (Allocator *)opt_p._32_8_;
      m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                   (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_p.workspace_allocator;
      m_1._40_8_ = opt_p._40_8_;
      m_1._48_8_ = opt_p._48_8_;
      pLVar57 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar290];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
      m.allocator = pAVar262;
      m._40_8_ = uVar312;
      m._48_8_ = uVar324;
      (*pLVar57->_vptr_Layer[7])(pLVar57,&m,&m_1,&opt_g);
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar273 = iVar273 + (int)uVar276;
      iVar284 = iVar284 + (int)uVar296;
    }
    if (_elempack < _elempack_00) {
      iVar289 = 0;
      convert_packing((Mat *)&opt_p,top_blob,_elempack_00,opt);
    }
    else {
      iVar289 = 0;
      if ((Mat *)&opt_p != top_blob) {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar55 = top_blob->refcount;
        if (piVar55 != (int *)0x0) {
          LOCK();
          *piVar55 = *piVar55 + -1;
          UNLOCK();
          if (*piVar55 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = (void *)opt_p._0_8_;
        top_blob->refcount = (int *)opt_p.blob_allocator;
        top_blob->elemsize = (size_t)opt_p.workspace_allocator;
        top_blob->elempack = opt_p.openmp_blocktime;
        top_blob->allocator = (Allocator *)opt_p._32_8_;
        *(undefined8 *)&top_blob->dims = opt_p._40_8_;
        *(undefined8 *)&top_blob->h = opt_p._48_8_;
        top_blob->c = opt_p._56_4_;
        top_blob->cstep = sVar53;
      }
    }
  }
  if (opt_p.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_p._32_8_ == 0) {
        free((void *)opt_p._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
      }
    }
  }
  local_308 = CONCAT44(local_308._4_4_,(float)local_308);
  local_258 = CONCAT44(local_258._4_4_,(float)local_258);
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    LOCK();
    *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    local_308 = CONCAT44(local_308._4_4_,(float)local_308);
    local_258 = CONCAT44(local_258._4_4_,(float)local_258);
    if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish == 0) {
      if (pAVar262 == (Allocator *)0x0) {
        free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      else {
        (*pAVar262->_vptr_Allocator[3])();
      }
    }
  }
LAB_003a6670:
  piVar55 = (int *)CONCAT44(uStack_34c,uStack_350);
  if (piVar55 != (int *)0x0) {
    LOCK();
    *piVar55 = *piVar55 + -1;
    UNLOCK();
    if (*piVar55 == 0) {
      if ((long *)CONCAT44(uStack_334,local_338) == (long *)0x0) {
        free((void *)CONCAT44(fStack_354,local_358));
      }
      else {
        (**(code **)(*(long *)CONCAT44(uStack_334,local_338) + 0x18))();
      }
    }
  }
  return iVar289;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}